

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm.h
# Opt level: O3

int ncnn::convolution_im2col_gemm
              (Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int kernel_w,int kernel_h,
              int dilation_w,int dilation_h,int stride_w,int stride_h,int nT,Option *opt)

{
  size_t sVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  byte bVar34;
  byte bVar35;
  int *piVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  undefined1 (*pauVar40) [64];
  undefined1 (*pauVar41) [32];
  undefined1 (*pauVar42) [16];
  long lVar43;
  int iVar44;
  Mat *B;
  ulong uVar45;
  ulong uVar46;
  undefined1 (*pauVar47) [16];
  uint uVar48;
  int iVar49;
  undefined1 (*pauVar50) [16];
  int iVar51;
  undefined4 *puVar52;
  undefined1 (*pauVar53) [64];
  int iVar54;
  int iVar55;
  int iVar56;
  bool bVar57;
  bool bVar58;
  int iVar59;
  long lVar60;
  int iVar61;
  int iVar62;
  uint uVar63;
  uint uVar64;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  ulong uVar65;
  long lVar66;
  long lVar67;
  ulong uVar68;
  undefined1 (*pauVar69) [64];
  undefined1 (*pauVar70) [64];
  undefined1 (*pauVar71) [16];
  int iVar72;
  int iVar73;
  int iVar74;
  uint uVar75;
  ulong uVar76;
  long lVar77;
  undefined1 (*pauVar78) [64];
  uint uVar79;
  uint uVar80;
  bool bVar81;
  int K;
  uint uVar82;
  long lVar83;
  long lVar84;
  long lVar85;
  bool bVar86;
  bool bVar87;
  bool bVar88;
  bool bVar89;
  ushort uVar90;
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar112 [32];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  float sum1 [4];
  undefined4 uVar168;
  float sum0 [4];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined4 uVar181;
  undefined4 uVar182;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined4 uVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  int TILE_N;
  int local_254;
  int TILE_K;
  int TILE_M;
  Mat *local_248;
  Mat *local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  uint local_1f4;
  long local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  undefined1 (*local_1d8) [64];
  ulong local_1d0;
  long local_1c8;
  long local_1c0;
  ulong local_1b8;
  long local_1b0;
  int local_1a8;
  int local_1a4;
  long local_1a0;
  Mat local_198;
  ulong local_150;
  Mat *local_148;
  ulong local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  Mat local_78;
  
  uVar48 = top_blob->elempack * top_blob->c;
  uVar79 = top_blob->h * top_blob->w;
  K = kernel_h * kernel_w * bottom_blob->c * bottom_blob->elempack;
  local_248 = top_blob;
  local_240 = bias;
  local_148 = AT;
  convolution_im2col_gemm_get_optimal_tile_mnk(uVar48,uVar79,K,&TILE_M,&TILE_N,&TILE_K,nT);
  iVar44 = TILE_N;
  local_1f4 = (int)(uVar48 + TILE_M + -1) / TILE_M;
  iVar72 = (int)(uVar79 + TILE_N + -1) / TILE_N;
  uVar65 = (ulong)(uint)TILE_K;
  iVar37 = (K + TILE_K + -1) / TILE_K;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  local_150 = (ulong)uVar48;
  Mat::create(&local_78,TILE_K * TILE_N,iVar37,iVar72,4,opt->workspace_allocator);
  iVar59 = -100;
  if ((local_78.data == (void *)0x0) || ((long)local_78.c * local_78.cstep == 0)) goto LAB_00195f0e;
  iVar72 = iVar72 * iVar37;
  local_1e0 = (ulong)uVar79;
  if (0 < iVar72) {
    bVar86 = dilation_w == 1;
    bVar87 = dilation_h == 1;
    bVar88 = stride_w == 2;
    bVar89 = stride_h == 2;
    bVar57 = ((kernel_h == 3 && kernel_w == 3) && bVar86) && bVar87;
    bVar81 = stride_w == 1 && stride_h == 1;
    bVar58 = ((kernel_h == 5 && kernel_w == 5) && bVar86) && bVar87;
    iVar59 = 0;
    local_1d0 = uVar65;
    do {
      iVar73 = iVar44 * (iVar59 / iVar37);
      iVar61 = (int)local_1d0 * (int)((long)iVar59 % (long)iVar37);
      uVar48 = (int)local_1e0 - iVar73;
      if (iVar44 < (int)uVar48) {
        uVar48 = iVar44;
      }
      uVar65 = (ulong)(uint)(K - iVar61);
      if ((int)local_1d0 < K - iVar61) {
        uVar65 = local_1d0 & 0xffffffff;
      }
      B = (Mat *)((long)local_78.data +
                 ((long)iVar59 % (long)iVar37 & 0xffffffffU) * (long)local_78.w *
                 CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) +
                 (long)(iVar59 / iVar37) * local_78.cstep *
                 CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
      iVar38 = (int)uVar65;
      if (((!bVar87 || stride_w != 1) || ((kernel_h != 1 || kernel_w != 1) || !bVar86)) ||
          stride_h != 1) {
        if (((kernel_h != 1 || kernel_w != 1) || !bVar88) || !bVar89) {
          if (bVar57 && bVar81) {
            iVar62 = 1;
            iVar56 = 1;
LAB_00191b64:
            iVar49 = 3;
            goto LAB_00191b6b;
          }
          if (bVar57 && (bVar88 && bVar89)) {
            iVar62 = 2;
            iVar56 = 2;
            goto LAB_00191b64;
          }
          if (bVar81 && bVar58) {
            iVar62 = 1;
            iVar56 = 1;
LAB_00191bdd:
            iVar49 = 5;
            goto LAB_00191b6b;
          }
          if (bVar58 && (bVar88 && bVar89)) {
            iVar62 = 2;
            iVar56 = 2;
            goto LAB_00191bdd;
          }
          iVar49 = kernel_w;
          iVar54 = kernel_h;
          iVar74 = dilation_w;
          iVar51 = dilation_h;
          iVar56 = stride_w;
          iVar62 = stride_h;
          if (((bVar87 && bVar88) && ((kernel_h == 7 && kernel_w == 7) && bVar86)) && bVar89) {
            iVar62 = 2;
            iVar56 = 2;
            iVar49 = 7;
            goto LAB_00191b6b;
          }
        }
        else {
          iVar62 = 2;
          iVar56 = 2;
          iVar49 = 1;
LAB_00191b6b:
          iVar54 = iVar49;
          iVar74 = 1;
          iVar51 = 1;
        }
        convolution_im2col_input_tile_impl
                  (bottom_blob,B,iVar73,uVar48,iVar61,iVar38,iVar49,iVar54,iVar74,iVar51,iVar56,
                   iVar62);
      }
      else {
        iVar56 = bottom_blob->elempack;
        lVar85 = 0;
        lVar39 = (long)iVar61;
        lVar60 = (long)iVar73;
        if (0xb < (int)uVar48) {
          iVar73 = iVar38 + 3;
          if (-1 < iVar38) {
            iVar73 = iVar38;
          }
          iVar62 = iVar38 + 7;
          if (-1 < iVar38) {
            iVar62 = iVar38;
          }
          iVar49 = iVar38 + 0xf;
          if (-1 < iVar38) {
            iVar49 = iVar38;
          }
          iVar54 = iVar61 + 3;
          if (-1 < iVar61) {
            iVar54 = iVar61;
          }
          iVar74 = iVar61 + 7;
          if (-1 < iVar61) {
            iVar74 = iVar61;
          }
          iVar51 = iVar61 + 0xf;
          if (-1 < iVar61) {
            iVar51 = iVar61;
          }
          lVar77 = 0;
          do {
            if (iVar56 == 0x10) {
              if (0xf < iVar38) {
                pauVar40 = (undefined1 (*) [64])
                           ((long)bottom_blob->data +
                           (lVar77 + lVar60) * 0x40 +
                           bottom_blob->cstep * (long)(iVar51 >> 4) * bottom_blob->elemsize);
                iVar55 = iVar49 >> 4;
                do {
                  auVar126 = vunpcklps_avx512f(*pauVar40,pauVar40[1]);
                  auVar127 = vunpckhps_avx512f(*pauVar40,pauVar40[1]);
                  auVar128 = vunpcklps_avx512f(pauVar40[2],pauVar40[3]);
                  auVar129 = vunpckhps_avx512f(pauVar40[2],pauVar40[3]);
                  auVar130 = vunpcklps_avx512f(pauVar40[4],pauVar40[5]);
                  auVar131 = vunpckhps_avx512f(pauVar40[4],pauVar40[5]);
                  auVar132 = vunpcklps_avx512f(pauVar40[6],pauVar40[7]);
                  auVar133 = vunpckhps_avx512f(pauVar40[6],pauVar40[7]);
                  auVar134 = vunpcklps_avx512f(pauVar40[8],pauVar40[9]);
                  auVar135 = vunpckhps_avx512f(pauVar40[8],pauVar40[9]);
                  auVar136 = vunpcklps_avx512f(pauVar40[10],pauVar40[0xb]);
                  auVar137 = vunpckhps_avx512f(pauVar40[10],pauVar40[0xb]);
                  auVar138 = vunpcklpd_avx512f(auVar126,auVar128);
                  auVar126 = vunpckhpd_avx512f(auVar126,auVar128);
                  auVar128 = vunpcklpd_avx512f(auVar127,auVar129);
                  auVar127 = vunpckhpd_avx512f(auVar127,auVar129);
                  auVar129 = vunpcklpd_avx512f(auVar130,auVar132);
                  auVar130 = vunpckhpd_avx512f(auVar130,auVar132);
                  auVar132 = vunpcklpd_avx512f(auVar131,auVar133);
                  auVar131 = vunpckhpd_avx512f(auVar131,auVar133);
                  auVar133 = vunpcklpd_avx512f(auVar134,auVar136);
                  auVar134 = vunpckhpd_avx512f(auVar134,auVar136);
                  auVar136 = vunpcklpd_avx512f(auVar135,auVar137);
                  auVar135 = vunpckhpd_avx512f(auVar135,auVar137);
                  auVar137 = vshuff64x2_avx512f(auVar138,auVar129,0x88);
                  auVar139 = vshuff64x2_avx512f(auVar133,auVar126,0x88);
                  auVar140 = vshuff64x2_avx512f(auVar130,auVar134,0x88);
                  auVar141 = vshuff64x2_avx512f(auVar128,auVar132,0x88);
                  auVar142 = vshuff64x2_avx512f(auVar136,auVar127,0x88);
                  auVar143 = vshuff64x2_avx512f(auVar131,auVar135,0x88);
                  auVar129 = vshuff64x2_avx512f(auVar138,auVar129,0xdd);
                  auVar126 = vshuff64x2_avx512f(auVar133,auVar126,0xdd);
                  auVar130 = vshuff64x2_avx512f(auVar130,auVar134,0xdd);
                  auVar128 = vshuff64x2_avx512f(auVar128,auVar132,0xdd);
                  auVar127 = vshuff64x2_avx512f(auVar136,auVar127,0xdd);
                  auVar131 = vshuff64x2_avx512f(auVar131,auVar135,0xdd);
                  auVar132 = vshuff64x2_avx512f(auVar137,auVar139,0x88);
                  auVar133 = vshuff64x2_avx512f(auVar140,auVar141,0x88);
                  auVar134 = vshuff64x2_avx512f(auVar142,auVar143,0x88);
                  auVar135 = vshuff64x2_avx512f(auVar129,auVar126,0x88);
                  auVar136 = vshuff64x2_avx512f(auVar130,auVar128,0x88);
                  auVar138 = vshuff64x2_avx512f(auVar127,auVar131,0x88);
                  auVar137 = vshuff64x2_avx512f(auVar137,auVar139,0xdd);
                  auVar139 = vshuff64x2_avx512f(auVar140,auVar141,0xdd);
                  auVar140 = vshuff64x2_avx512f(auVar142,auVar143,0xdd);
                  auVar126 = vshuff64x2_avx512f(auVar129,auVar126,0xdd);
                  auVar128 = vshuff64x2_avx512f(auVar130,auVar128,0xdd);
                  auVar127 = vshuff64x2_avx512f(auVar127,auVar131,0xdd);
                  B->data = (void *)auVar132._0_8_;
                  B->refcount = (int *)auVar132._8_8_;
                  B->elemsize = auVar132._16_8_;
                  B->elempack = auVar132._24_4_;
                  *(int *)&B->field_0x1c = auVar132._28_4_;
                  B->allocator = (Allocator *)auVar132._32_8_;
                  B->dims = auVar132._40_4_;
                  B->w = auVar132._44_4_;
                  B->h = auVar132._48_4_;
                  B->d = auVar132._52_4_;
                  B->c = auVar132._56_4_;
                  *(int *)&B->field_0x3c = auVar132._60_4_;
                  *(undefined1 (*) [64])&B->cstep = auVar133;
                  *(undefined1 (*) [64])&B[1].c = auVar134;
                  *(undefined1 (*) [64])&B[2].h = auVar135;
                  *(undefined1 (*) [64])&B[3].dims = auVar136;
                  *(undefined1 (*) [64])&B[4].allocator = auVar138;
                  *(undefined1 (*) [64])&B[5].elempack = auVar137;
                  *(undefined1 (*) [64])&B[6].elemsize = auVar139;
                  B[7].refcount = (int *)auVar140._0_8_;
                  B[7].elemsize = auVar140._8_8_;
                  B[7].elempack = auVar140._16_4_;
                  *(int *)&B[7].field_0x1c = auVar140._20_4_;
                  B[7].allocator = (Allocator *)auVar140._24_8_;
                  B[7].dims = auVar140._32_4_;
                  B[7].w = auVar140._36_4_;
                  B[7].h = auVar140._40_4_;
                  B[7].d = auVar140._44_4_;
                  B[7].c = auVar140._48_4_;
                  *(int *)&B[7].field_0x3c = auVar140._52_4_;
                  B[7].cstep = auVar140._56_8_;
                  B[8].data = (void *)auVar126._0_8_;
                  B[8].refcount = (int *)auVar126._8_8_;
                  B[8].elemsize = auVar126._16_8_;
                  B[8].elempack = auVar126._24_4_;
                  *(int *)&B[8].field_0x1c = auVar126._28_4_;
                  B[8].allocator = (Allocator *)auVar126._32_8_;
                  B[8].dims = auVar126._40_4_;
                  B[8].w = auVar126._44_4_;
                  B[8].h = auVar126._48_4_;
                  B[8].d = auVar126._52_4_;
                  B[8].c = auVar126._56_4_;
                  *(int *)&B[8].field_0x3c = auVar126._60_4_;
                  *(undefined1 (*) [64])&B[8].cstep = auVar128;
                  *(undefined1 (*) [64])&B[9].c = auVar127;
                  B = (Mat *)&B[10].h;
                  pauVar40 = pauVar40 + bottom_blob->cstep;
                  iVar55 = iVar55 + -1;
                } while (iVar55 != 0);
                goto LAB_00190bf0;
              }
            }
            else {
LAB_00190bf0:
              if (iVar56 == 8) {
                if (iVar38 < 8) goto LAB_00190f2b;
                pauVar41 = (undefined1 (*) [32])
                           ((long)bottom_blob->data +
                           (lVar77 + lVar60) * 0x20 +
                           bottom_blob->cstep * (long)(iVar74 >> 3) * bottom_blob->elemsize);
                iVar55 = iVar62 >> 3;
                do {
                  auVar113 = vunpcklps_avx(*pauVar41,pauVar41[1]);
                  auVar114 = vunpckhps_avx(*pauVar41,pauVar41[1]);
                  auVar121 = vunpcklps_avx(pauVar41[2],pauVar41[3]);
                  auVar115 = vunpckhps_avx(pauVar41[2],pauVar41[3]);
                  auVar123 = vunpcklps_avx(pauVar41[4],pauVar41[5]);
                  auVar116 = vunpckhps_avx(pauVar41[4],pauVar41[5]);
                  auVar124 = vunpcklps_avx(pauVar41[6],pauVar41[7]);
                  auVar117 = vunpckhps_avx(pauVar41[6],pauVar41[7]);
                  auVar125 = vunpcklps_avx(pauVar41[8],pauVar41[9]);
                  auVar118 = vunpckhps_avx(pauVar41[8],pauVar41[9]);
                  auVar111 = vunpcklps_avx(pauVar41[10],pauVar41[0xb]);
                  auVar119 = vunpckhps_avx(pauVar41[10],pauVar41[0xb]);
                  auVar120 = vunpcklpd_avx(auVar113,auVar121);
                  auVar113 = vunpckhpd_avx(auVar113,auVar121);
                  auVar121 = vunpcklpd_avx(auVar114,auVar115);
                  auVar114 = vunpckhpd_avx(auVar114,auVar115);
                  auVar122 = vunpcklpd_avx(auVar123,auVar124);
                  auVar115 = vunpckhpd_avx(auVar123,auVar124);
                  auVar123 = vunpcklpd_avx(auVar116,auVar117);
                  auVar116 = vunpckhpd_avx(auVar116,auVar117);
                  auVar124 = vunpcklpd_avx(auVar125,auVar111);
                  auVar117 = vunpckhpd_avx(auVar125,auVar111);
                  auVar125 = vunpcklpd_avx(auVar118,auVar119);
                  auVar118 = vunpckhpd_avx(auVar118,auVar119);
                  auVar100 = auVar122._0_16_;
                  auVar102 = auVar124._0_16_;
                  auVar99 = auVar113._0_16_;
                  auVar217._16_16_ = auVar117._0_16_;
                  auVar217._0_16_ = auVar115._0_16_;
                  auVar103 = auVar121._0_16_;
                  auVar101 = auVar123._0_16_;
                  auVar111 = vinsertf32x4_avx512vl(auVar125,auVar114._0_16_,1);
                  auVar112 = vinsertf32x4_avx512vl(auVar116,auVar118._0_16_,1);
                  auVar119 = vperm2f128_avx(auVar120,auVar122,0x31);
                  auVar113 = vperm2f128_avx(auVar124,auVar113,0x31);
                  auVar115 = vperm2f128_avx(auVar115,auVar117,0x31);
                  auVar117 = vperm2f128_avx(auVar121,auVar123,0x31);
                  auVar114 = vperm2f128_avx(auVar125,auVar114,0x31);
                  auVar116 = vperm2f128_avx(auVar116,auVar118,0x31);
                  B->data = (void *)SUB168(auVar120._0_16_,0);
                  B->refcount = (int *)SUB168(auVar120._0_16_,8);
                  B->elemsize = auVar100._0_8_;
                  B->elempack = auVar100._8_4_;
                  *(int *)&B->field_0x1c = auVar100._12_4_;
                  B->allocator = (Allocator *)auVar102._0_8_;
                  B->dims = auVar102._8_4_;
                  B->w = auVar102._12_4_;
                  B->h = auVar99._0_4_;
                  B->d = auVar99._4_4_;
                  B->c = auVar99._8_4_;
                  *(int *)&B->field_0x3c = auVar99._12_4_;
                  *(undefined1 (*) [32])&B->cstep = auVar217;
                  B[1].elempack = auVar103._0_4_;
                  *(int *)&B[1].field_0x1c = auVar103._4_4_;
                  B[1].allocator = (Allocator *)auVar103._8_8_;
                  B[1].dims = auVar101._0_4_;
                  B[1].w = auVar101._4_4_;
                  B[1].h = auVar101._8_4_;
                  B[1].d = auVar101._12_4_;
                  *(undefined1 (*) [32])&B[1].c = auVar111;
                  B[2].elemsize = auVar112._0_8_;
                  B[2].elempack = auVar112._8_4_;
                  *(int *)&B[2].field_0x1c = auVar112._12_4_;
                  B[2].allocator = (Allocator *)auVar112._16_8_;
                  B[2].dims = auVar112._24_4_;
                  B[2].w = auVar112._28_4_;
                  *(undefined1 (*) [32])&B[2].h = auVar119;
                  B[3].refcount = (int *)auVar113._0_8_;
                  B[3].elemsize = auVar113._8_8_;
                  B[3].elempack = auVar113._16_4_;
                  *(int *)&B[3].field_0x1c = auVar113._20_4_;
                  B[3].allocator = (Allocator *)auVar113._24_8_;
                  B[3].dims = auVar115._0_4_;
                  B[3].w = auVar115._4_4_;
                  B[3].h = auVar115._8_4_;
                  B[3].d = auVar115._12_4_;
                  B[3].c = auVar115._16_4_;
                  *(int *)&B[3].field_0x3c = auVar115._20_4_;
                  B[3].cstep = auVar115._24_8_;
                  B[4].data = (void *)auVar117._0_8_;
                  B[4].refcount = (int *)auVar117._8_8_;
                  B[4].elemsize = auVar117._16_8_;
                  B[4].elempack = auVar117._24_4_;
                  *(int *)&B[4].field_0x1c = auVar117._28_4_;
                  B[4].allocator = (Allocator *)auVar114._0_8_;
                  B[4].dims = auVar114._8_4_;
                  B[4].w = auVar114._12_4_;
                  B[4].h = auVar114._16_4_;
                  B[4].d = auVar114._20_4_;
                  B[4].c = auVar114._24_4_;
                  *(int *)&B[4].field_0x3c = auVar114._28_4_;
                  *(undefined1 (*) [32])&B[4].cstep = auVar116;
                  B = (Mat *)&B[5].elempack;
                  pauVar41 = pauVar41 + bottom_blob->cstep;
                  iVar55 = iVar55 + -1;
                } while (iVar55 != 0);
              }
              if (iVar56 == 4) {
                if (iVar38 < 4) goto LAB_00190f2b;
                pauVar42 = (undefined1 (*) [16])
                           ((long)bottom_blob->data +
                           (lVar77 + lVar60) * 0x10 +
                           bottom_blob->cstep * (long)(iVar54 >> 2) * bottom_blob->elemsize);
                iVar55 = iVar73 >> 2;
                do {
                  auVar99 = vunpcklps_avx(*pauVar42,pauVar42[1]);
                  auVar102 = vunpcklps_avx(pauVar42[2],pauVar42[3]);
                  auVar100 = vunpckhps_avx(*pauVar42,pauVar42[1]);
                  auVar101 = vunpckhps_avx(pauVar42[2],pauVar42[3]);
                  auVar106 = vunpcklpd_avx(auVar99,auVar102);
                  auVar99 = vunpckhpd_avx(auVar99,auVar102);
                  auVar107 = vunpcklpd_avx(auVar100,auVar101);
                  auVar100 = vunpckhpd_avx(auVar100,auVar101);
                  auVar101 = vunpcklps_avx(pauVar42[4],pauVar42[5]);
                  auVar104 = vunpcklps_avx(pauVar42[6],pauVar42[7]);
                  auVar102 = vunpckhps_avx(pauVar42[4],pauVar42[5]);
                  auVar103 = vunpckhps_avx(pauVar42[6],pauVar42[7]);
                  auVar108 = vunpcklpd_avx(auVar101,auVar104);
                  auVar101 = vunpckhpd_avx(auVar101,auVar104);
                  auVar109 = vunpcklpd_avx(auVar102,auVar103);
                  auVar102 = vunpckhpd_avx(auVar102,auVar103);
                  auVar103 = vunpcklps_avx(pauVar42[8],pauVar42[9]);
                  auVar91 = vunpcklps_avx(pauVar42[10],pauVar42[0xb]);
                  auVar104 = vunpckhps_avx(pauVar42[8],pauVar42[9]);
                  auVar105 = vunpckhps_avx(pauVar42[10],pauVar42[0xb]);
                  auVar110 = vunpcklpd_avx(auVar103,auVar91);
                  auVar103 = vunpckhpd_avx(auVar103,auVar91);
                  auVar91 = vunpcklpd_avx(auVar104,auVar105);
                  auVar104 = vunpckhpd_avx(auVar104,auVar105);
                  B->data = (void *)auVar106._0_8_;
                  B->refcount = (int *)auVar106._8_8_;
                  B->elemsize = auVar108._0_8_;
                  B->elempack = auVar108._8_4_;
                  *(int *)&B->field_0x1c = auVar108._12_4_;
                  B->allocator = (Allocator *)auVar110._0_8_;
                  B->dims = auVar110._8_4_;
                  B->w = auVar110._12_4_;
                  B->h = auVar99._0_4_;
                  B->d = auVar99._4_4_;
                  B->c = auVar99._8_4_;
                  *(int *)&B->field_0x3c = auVar99._12_4_;
                  *(undefined1 (*) [16])&B->cstep = auVar101;
                  B[1].refcount = (int *)auVar103._0_8_;
                  B[1].elemsize = auVar103._8_8_;
                  B[1].elempack = auVar107._0_4_;
                  *(int *)&B[1].field_0x1c = auVar107._4_4_;
                  B[1].allocator = (Allocator *)auVar107._8_8_;
                  B[1].dims = auVar109._0_4_;
                  B[1].w = auVar109._4_4_;
                  B[1].h = auVar109._8_4_;
                  B[1].d = auVar109._12_4_;
                  B[1].c = auVar91._0_4_;
                  *(int *)&B[1].field_0x3c = auVar91._4_4_;
                  B[1].cstep = auVar91._8_8_;
                  B[2].data = (void *)auVar100._0_8_;
                  B[2].refcount = (int *)auVar100._8_8_;
                  B[2].elemsize = auVar102._0_8_;
                  B[2].elempack = auVar102._8_4_;
                  *(int *)&B[2].field_0x1c = auVar102._12_4_;
                  B[2].allocator = (Allocator *)auVar104._0_8_;
                  B[2].dims = auVar104._8_4_;
                  B[2].w = auVar104._12_4_;
                  B = (Mat *)&B[2].h;
                  pauVar42 = pauVar42 + bottom_blob->cstep;
                  iVar55 = iVar55 + -1;
                } while (iVar55 != 0);
              }
              if (iVar56 == 1 && 0 < iVar38) {
                pauVar41 = (undefined1 (*) [32])
                           ((long)bottom_blob->data +
                           lVar60 * 4 +
                           lVar77 * 4 + bottom_blob->cstep * lVar39 * bottom_blob->elemsize);
                uVar76 = uVar65;
                do {
                  uVar3 = *(undefined8 *)((long)(pauVar41 + 1) + 0);
                  uVar168 = *(undefined4 *)((long)(pauVar41 + 1) + 8);
                  uVar182 = *(undefined4 *)((long)(pauVar41 + 1) + 0xc);
                  *(undefined1 (*) [32])B = *pauVar41;
                  B->allocator = (Allocator *)uVar3;
                  B->dims = uVar168;
                  B->w = uVar182;
                  B = (Mat *)&B->h;
                  pauVar41 = (undefined1 (*) [32])(*pauVar41 + bottom_blob->cstep * 4);
                  uVar79 = (int)uVar76 - 1;
                  uVar76 = (ulong)uVar79;
                } while (uVar79 != 0);
              }
            }
LAB_00190f2b:
            lVar85 = lVar77 + 0xc;
            uVar76 = lVar77 + 0x17;
            lVar77 = lVar85;
          } while (uVar76 < uVar48);
        }
        lVar77 = (long)(int)uVar48;
        if ((int)lVar85 + 7 < (int)uVar48) {
          iVar73 = iVar38 + 3;
          if (-1 < iVar38) {
            iVar73 = iVar38;
          }
          iVar62 = iVar38 + 7;
          if (-1 < iVar38) {
            iVar62 = iVar38;
          }
          iVar49 = iVar38 + 0xf;
          if (-1 < iVar38) {
            iVar49 = iVar38;
          }
          iVar54 = iVar61 + 3;
          if (-1 < iVar61) {
            iVar54 = iVar61;
          }
          iVar74 = iVar61 + 7;
          if (-1 < iVar61) {
            iVar74 = iVar61;
          }
          iVar51 = iVar61 + 0xf;
          if (-1 < iVar61) {
            iVar51 = iVar61;
          }
          lVar84 = (long)(int)lVar85;
          do {
            if (iVar56 == 0x10) {
              if (0xf < iVar38) {
                pauVar40 = (undefined1 (*) [64])
                           ((long)bottom_blob->data +
                           (lVar84 + lVar60) * 0x40 +
                           bottom_blob->cstep * (long)(iVar51 >> 4) * bottom_blob->elemsize);
                iVar55 = iVar49 >> 4;
                do {
                  auVar126 = vunpcklps_avx512f(*pauVar40,pauVar40[1]);
                  auVar127 = vunpckhps_avx512f(*pauVar40,pauVar40[1]);
                  auVar128 = vunpcklps_avx512f(pauVar40[2],pauVar40[3]);
                  auVar129 = vunpckhps_avx512f(pauVar40[2],pauVar40[3]);
                  auVar130 = vunpcklps_avx512f(pauVar40[4],pauVar40[5]);
                  auVar131 = vunpckhps_avx512f(pauVar40[4],pauVar40[5]);
                  auVar132 = vunpcklps_avx512f(pauVar40[6],pauVar40[7]);
                  auVar133 = vunpckhps_avx512f(pauVar40[6],pauVar40[7]);
                  auVar134 = vunpcklpd_avx512f(auVar126,auVar128);
                  auVar126 = vunpckhpd_avx512f(auVar126,auVar128);
                  auVar128 = vunpcklpd_avx512f(auVar127,auVar129);
                  auVar127 = vunpckhpd_avx512f(auVar127,auVar129);
                  auVar129 = vunpcklpd_avx512f(auVar130,auVar132);
                  auVar130 = vunpckhpd_avx512f(auVar130,auVar132);
                  auVar132 = vunpcklpd_avx512f(auVar131,auVar133);
                  auVar131 = vunpckhpd_avx512f(auVar131,auVar133);
                  auVar133 = vshuff64x2_avx512f(auVar134,auVar129,0x88);
                  auVar135 = vshuff64x2_avx512f(auVar126,auVar130,0x88);
                  auVar136 = vshuff64x2_avx512f(auVar128,auVar132,0x88);
                  auVar137 = vshuff64x2_avx512f(auVar127,auVar131,0x88);
                  auVar129 = vshuff64x2_avx512f(auVar134,auVar129,0xdd);
                  auVar126 = vshuff64x2_avx512f(auVar126,auVar130,0xdd);
                  auVar128 = vshuff64x2_avx512f(auVar128,auVar132,0xdd);
                  auVar127 = vshuff64x2_avx512f(auVar127,auVar131,0xdd);
                  auVar130 = vshuff64x2_avx512f(auVar133,auVar135,0x88);
                  auVar131 = vshuff64x2_avx512f(auVar136,auVar137,0x88);
                  auVar132 = vshuff64x2_avx512f(auVar129,auVar126,0x88);
                  auVar134 = vshuff64x2_avx512f(auVar128,auVar127,0x88);
                  auVar133 = vshuff64x2_avx512f(auVar133,auVar135,0xdd);
                  auVar135 = vshuff64x2_avx512f(auVar136,auVar137,0xdd);
                  auVar126 = vshuff64x2_avx512f(auVar129,auVar126,0xdd);
                  auVar127 = vshuff64x2_avx512f(auVar128,auVar127,0xdd);
                  B->data = (void *)auVar130._0_8_;
                  B->refcount = (int *)auVar130._8_8_;
                  B->elemsize = auVar130._16_8_;
                  B->elempack = auVar130._24_4_;
                  *(int *)&B->field_0x1c = auVar130._28_4_;
                  B->allocator = (Allocator *)auVar130._32_8_;
                  B->dims = auVar130._40_4_;
                  B->w = auVar130._44_4_;
                  B->h = auVar130._48_4_;
                  B->d = auVar130._52_4_;
                  B->c = auVar130._56_4_;
                  *(int *)&B->field_0x3c = auVar130._60_4_;
                  *(undefined1 (*) [64])&B->cstep = auVar131;
                  *(undefined1 (*) [64])&B[1].c = auVar132;
                  *(undefined1 (*) [64])&B[2].h = auVar134;
                  *(undefined1 (*) [64])&B[3].dims = auVar133;
                  *(undefined1 (*) [64])&B[4].allocator = auVar135;
                  *(undefined1 (*) [64])&B[5].elempack = auVar126;
                  *(undefined1 (*) [64])&B[6].elemsize = auVar127;
                  B = (Mat *)&B[7].refcount;
                  pauVar40 = pauVar40 + bottom_blob->cstep;
                  iVar55 = iVar55 + -1;
                } while (iVar55 != 0);
                goto LAB_0019116e;
              }
            }
            else {
LAB_0019116e:
              if (iVar56 == 8) {
                if (iVar38 < 8) goto LAB_001913b4;
                pauVar41 = (undefined1 (*) [32])
                           ((long)bottom_blob->data +
                           (lVar84 + lVar60) * 0x20 +
                           bottom_blob->cstep * (long)(iVar74 >> 3) * bottom_blob->elemsize);
                iVar55 = iVar62 >> 3;
                do {
                  auVar113 = vunpcklps_avx(*pauVar41,pauVar41[1]);
                  auVar114 = vunpckhps_avx(*pauVar41,pauVar41[1]);
                  auVar119 = vunpcklps_avx(pauVar41[2],pauVar41[3]);
                  auVar115 = vunpckhps_avx(pauVar41[2],pauVar41[3]);
                  auVar121 = vunpcklps_avx(pauVar41[4],pauVar41[5]);
                  auVar116 = vunpckhps_avx(pauVar41[4],pauVar41[5]);
                  auVar122 = vunpcklps_avx(pauVar41[6],pauVar41[7]);
                  auVar117 = vunpckhps_avx(pauVar41[6],pauVar41[7]);
                  auVar118 = vunpcklpd_avx(auVar113,auVar119);
                  auVar113 = vunpckhpd_avx(auVar113,auVar119);
                  auVar119 = vunpcklpd_avx(auVar114,auVar115);
                  auVar114 = vunpckhpd_avx(auVar114,auVar115);
                  auVar120 = vunpcklpd_avx(auVar121,auVar122);
                  auVar115 = vunpckhpd_avx(auVar121,auVar122);
                  auVar121 = vunpcklpd_avx(auVar116,auVar117);
                  auVar116 = vunpckhpd_avx(auVar116,auVar117);
                  auVar101 = auVar120._0_16_;
                  auVar100 = auVar113._0_16_;
                  auVar102 = auVar115._0_16_;
                  auVar122._16_16_ = auVar121._0_16_;
                  auVar122._0_16_ = auVar119._0_16_;
                  auVar99 = auVar114._0_16_;
                  auVar103 = auVar116._0_16_;
                  auVar117 = vperm2f128_avx(auVar118,auVar120,0x31);
                  auVar113 = vperm2f128_avx(auVar113,auVar115,0x31);
                  auVar115 = vperm2f128_avx(auVar119,auVar121,0x31);
                  auVar114 = vperm2f128_avx(auVar114,auVar116,0x31);
                  B->data = (void *)SUB168(auVar118._0_16_,0);
                  B->refcount = (int *)SUB168(auVar118._0_16_,8);
                  B->elemsize = auVar101._0_8_;
                  B->elempack = auVar101._8_4_;
                  *(int *)&B->field_0x1c = auVar101._12_4_;
                  B->allocator = (Allocator *)auVar100._0_8_;
                  B->dims = auVar100._8_4_;
                  B->w = auVar100._12_4_;
                  B->h = auVar102._0_4_;
                  B->d = auVar102._4_4_;
                  B->c = auVar102._8_4_;
                  *(int *)&B->field_0x3c = auVar102._12_4_;
                  *(undefined1 (*) [32])&B->cstep = auVar122;
                  B[1].elempack = auVar99._0_4_;
                  *(int *)&B[1].field_0x1c = auVar99._4_4_;
                  B[1].allocator = (Allocator *)auVar99._8_8_;
                  B[1].dims = auVar103._0_4_;
                  B[1].w = auVar103._4_4_;
                  B[1].h = auVar103._8_4_;
                  B[1].d = auVar103._12_4_;
                  *(undefined1 (*) [32])&B[1].c = auVar117;
                  B[2].elemsize = auVar113._0_8_;
                  B[2].elempack = auVar113._8_4_;
                  *(int *)&B[2].field_0x1c = auVar113._12_4_;
                  B[2].allocator = (Allocator *)auVar113._16_8_;
                  B[2].dims = auVar113._24_4_;
                  B[2].w = auVar113._28_4_;
                  *(undefined1 (*) [32])&B[2].h = auVar115;
                  B[3].refcount = (int *)auVar114._0_8_;
                  B[3].elemsize = auVar114._8_8_;
                  B[3].elempack = auVar114._16_4_;
                  *(int *)&B[3].field_0x1c = auVar114._20_4_;
                  B[3].allocator = (Allocator *)auVar114._24_8_;
                  B = (Mat *)&B[3].dims;
                  pauVar41 = pauVar41 + bottom_blob->cstep;
                  iVar55 = iVar55 + -1;
                } while (iVar55 != 0);
              }
              if (iVar56 == 4) {
                if (iVar38 < 4) goto LAB_001913b4;
                pauVar42 = (undefined1 (*) [16])
                           ((long)bottom_blob->data +
                           (lVar84 + lVar60) * 0x10 +
                           bottom_blob->cstep * (long)(iVar54 >> 2) * bottom_blob->elemsize);
                iVar55 = iVar73 >> 2;
                do {
                  auVar99 = vunpcklps_avx(*pauVar42,pauVar42[1]);
                  auVar102 = vunpcklps_avx(pauVar42[2],pauVar42[3]);
                  auVar100 = vunpckhps_avx(*pauVar42,pauVar42[1]);
                  auVar101 = vunpckhps_avx(pauVar42[2],pauVar42[3]);
                  auVar104 = vunpcklpd_avx(auVar99,auVar102);
                  auVar99 = vunpckhpd_avx(auVar99,auVar102);
                  auVar105 = vunpcklpd_avx(auVar100,auVar101);
                  auVar100 = vunpckhpd_avx(auVar100,auVar101);
                  auVar101 = vunpcklps_avx(pauVar42[4],pauVar42[5]);
                  auVar107 = vunpcklps_avx(pauVar42[6],pauVar42[7]);
                  auVar102 = vunpckhps_avx(pauVar42[4],pauVar42[5]);
                  auVar103 = vunpckhps_avx(pauVar42[6],pauVar42[7]);
                  auVar106 = vunpcklpd_avx(auVar101,auVar107);
                  auVar101 = vunpckhpd_avx(auVar101,auVar107);
                  auVar107 = vunpcklpd_avx(auVar102,auVar103);
                  auVar102 = vunpckhpd_avx(auVar102,auVar103);
                  B->data = (void *)auVar104._0_8_;
                  B->refcount = (int *)auVar104._8_8_;
                  B->elemsize = auVar106._0_8_;
                  B->elempack = auVar106._8_4_;
                  *(int *)&B->field_0x1c = auVar106._12_4_;
                  B->allocator = (Allocator *)auVar99._0_8_;
                  B->dims = auVar99._8_4_;
                  B->w = auVar99._12_4_;
                  B->h = auVar101._0_4_;
                  B->d = auVar101._4_4_;
                  B->c = auVar101._8_4_;
                  *(int *)&B->field_0x3c = auVar101._12_4_;
                  *(undefined1 (*) [16])&B->cstep = auVar105;
                  B[1].refcount = (int *)auVar107._0_8_;
                  B[1].elemsize = auVar107._8_8_;
                  B[1].elempack = auVar100._0_4_;
                  *(int *)&B[1].field_0x1c = auVar100._4_4_;
                  B[1].allocator = (Allocator *)auVar100._8_8_;
                  B[1].dims = auVar102._0_4_;
                  B[1].w = auVar102._4_4_;
                  B[1].h = auVar102._8_4_;
                  B[1].d = auVar102._12_4_;
                  B = (Mat *)&B[1].c;
                  pauVar42 = pauVar42 + bottom_blob->cstep;
                  iVar55 = iVar55 + -1;
                } while (iVar55 != 0);
              }
              if (iVar56 == 1 && 0 < iVar38) {
                pauVar41 = (undefined1 (*) [32])
                           ((long)bottom_blob->data +
                           lVar60 * 4 +
                           lVar84 * 4 + bottom_blob->cstep * lVar39 * bottom_blob->elemsize);
                uVar76 = uVar65;
                do {
                  *(undefined1 (*) [32])B = *pauVar41;
                  B = (Mat *)&B->allocator;
                  pauVar41 = (undefined1 (*) [32])(*pauVar41 + bottom_blob->cstep * 4);
                  uVar79 = (int)uVar76 - 1;
                  uVar76 = (ulong)uVar79;
                } while (uVar79 != 0);
              }
            }
LAB_001913b4:
            lVar85 = lVar84 + 8;
            bVar2 = lVar84 < lVar77 + -0xf;
            lVar84 = lVar85;
          } while (bVar2);
        }
        if ((int)((uint)lVar85 | 3) < (int)uVar48) {
          iVar73 = iVar38 + 3;
          if (-1 < iVar38) {
            iVar73 = iVar38;
          }
          iVar62 = iVar38 + 7;
          if (-1 < iVar38) {
            iVar62 = iVar38;
          }
          iVar49 = iVar38 + 0xf;
          if (-1 < iVar38) {
            iVar49 = iVar38;
          }
          iVar54 = iVar61 + 3;
          if (-1 < iVar61) {
            iVar54 = iVar61;
          }
          iVar74 = iVar61 + 7;
          if (-1 < iVar61) {
            iVar74 = iVar61;
          }
          iVar51 = iVar61 + 0xf;
          if (-1 < iVar61) {
            iVar51 = iVar61;
          }
          lVar84 = (long)(int)(uint)lVar85;
          do {
            if (iVar56 == 0x10) {
              if (0xf < iVar38) {
                pauVar40 = (undefined1 (*) [64])
                           ((long)bottom_blob->data +
                           (lVar84 + lVar60) * 0x40 +
                           bottom_blob->cstep * (long)(iVar51 >> 4) * bottom_blob->elemsize);
                iVar55 = iVar49 >> 4;
                do {
                  auVar126 = vunpcklps_avx512f(*pauVar40,pauVar40[1]);
                  auVar127 = vunpckhps_avx512f(*pauVar40,pauVar40[1]);
                  auVar128 = vunpcklps_avx512f(pauVar40[2],pauVar40[3]);
                  auVar129 = vunpckhps_avx512f(pauVar40[2],pauVar40[3]);
                  auVar130 = vunpcklpd_avx512f(auVar126,auVar128);
                  auVar126 = vunpckhpd_avx512f(auVar126,auVar128);
                  auVar128 = vunpcklpd_avx512f(auVar127,auVar129);
                  auVar127 = vunpckhpd_avx512f(auVar127,auVar129);
                  auVar129 = vshuff64x2_avx512f(auVar130,auVar126,0x88);
                  auVar131 = vshuff64x2_avx512f(auVar128,auVar127,0x88);
                  auVar126 = vshuff64x2_avx512f(auVar130,auVar126,0xdd);
                  auVar127 = vshuff64x2_avx512f(auVar128,auVar127,0xdd);
                  auVar128 = vshuff64x2_avx512f(auVar129,auVar131,0x88);
                  auVar130 = vshuff64x2_avx512f(auVar126,auVar127,0x88);
                  auVar129 = vshuff64x2_avx512f(auVar129,auVar131,0xdd);
                  auVar126 = vshuff64x2_avx512f(auVar126,auVar127,0xdd);
                  B->data = (void *)auVar128._0_8_;
                  B->refcount = (int *)auVar128._8_8_;
                  B->elemsize = auVar128._16_8_;
                  B->elempack = auVar128._24_4_;
                  *(int *)&B->field_0x1c = auVar128._28_4_;
                  B->allocator = (Allocator *)auVar128._32_8_;
                  B->dims = auVar128._40_4_;
                  B->w = auVar128._44_4_;
                  B->h = auVar128._48_4_;
                  B->d = auVar128._52_4_;
                  B->c = auVar128._56_4_;
                  *(int *)&B->field_0x3c = auVar128._60_4_;
                  *(undefined1 (*) [64])&B->cstep = auVar130;
                  *(undefined1 (*) [64])&B[1].c = auVar129;
                  *(undefined1 (*) [64])&B[2].h = auVar126;
                  B = (Mat *)&B[3].dims;
                  pauVar40 = pauVar40 + bottom_blob->cstep;
                  iVar55 = iVar55 + -1;
                } while (iVar55 != 0);
                goto LAB_00191546;
              }
            }
            else {
LAB_00191546:
              if (iVar56 == 8) {
                if (iVar38 < 8) goto LAB_001916bd;
                pauVar41 = (undefined1 (*) [32])
                           ((long)bottom_blob->data +
                           (lVar84 + lVar60) * 0x20 +
                           bottom_blob->cstep * (long)(iVar74 >> 3) * bottom_blob->elemsize);
                iVar55 = iVar62 >> 3;
                do {
                  auVar113 = vunpcklps_avx(*pauVar41,pauVar41[1]);
                  auVar114 = vunpckhps_avx(*pauVar41,pauVar41[1]);
                  auVar117 = vunpcklps_avx(pauVar41[2],pauVar41[3]);
                  auVar115 = vunpckhps_avx(pauVar41[2],pauVar41[3]);
                  auVar116 = vunpcklpd_avx(auVar113,auVar117);
                  auVar113 = vunpckhpd_avx(auVar113,auVar117);
                  auVar117 = vunpcklpd_avx(auVar114,auVar115);
                  auVar114 = vunpckhpd_avx(auVar114,auVar115);
                  auVar100 = auVar113._0_16_;
                  auVar101 = auVar117._0_16_;
                  auVar99 = auVar114._0_16_;
                  auVar113 = vperm2f128_avx(auVar116,auVar113,0x31);
                  auVar114 = vperm2f128_avx(auVar117,auVar114,0x31);
                  B->data = (void *)SUB168(auVar116._0_16_,0);
                  B->refcount = (int *)SUB168(auVar116._0_16_,8);
                  B->elemsize = auVar100._0_8_;
                  B->elempack = auVar100._8_4_;
                  *(int *)&B->field_0x1c = auVar100._12_4_;
                  B->allocator = (Allocator *)auVar101._0_8_;
                  B->dims = auVar101._8_4_;
                  B->w = auVar101._12_4_;
                  B->h = auVar99._0_4_;
                  B->d = auVar99._4_4_;
                  B->c = auVar99._8_4_;
                  *(int *)&B->field_0x3c = auVar99._12_4_;
                  *(undefined1 (*) [32])&B->cstep = auVar113;
                  B[1].elempack = auVar114._0_4_;
                  *(int *)&B[1].field_0x1c = auVar114._4_4_;
                  B[1].allocator = (Allocator *)auVar114._8_8_;
                  B[1].dims = auVar114._16_4_;
                  B[1].w = auVar114._20_4_;
                  B[1].h = auVar114._24_4_;
                  B[1].d = auVar114._28_4_;
                  B = (Mat *)&B[1].c;
                  pauVar41 = pauVar41 + bottom_blob->cstep;
                  iVar55 = iVar55 + -1;
                } while (iVar55 != 0);
              }
              if (iVar56 == 4) {
                if (iVar38 < 4) goto LAB_001916bd;
                pauVar42 = (undefined1 (*) [16])
                           ((long)bottom_blob->data +
                           (lVar84 + lVar60) * 0x10 +
                           bottom_blob->cstep * (long)(iVar54 >> 2) * bottom_blob->elemsize);
                iVar55 = iVar73 >> 2;
                do {
                  auVar99 = vunpcklps_avx(*pauVar42,pauVar42[1]);
                  auVar103 = vunpcklps_avx(pauVar42[2],pauVar42[3]);
                  auVar100 = vunpckhps_avx(*pauVar42,pauVar42[1]);
                  auVar101 = vunpckhps_avx(pauVar42[2],pauVar42[3]);
                  auVar102 = vunpcklpd_avx(auVar99,auVar103);
                  auVar99 = vunpckhpd_avx(auVar99,auVar103);
                  auVar103 = vunpcklpd_avx(auVar100,auVar101);
                  auVar100 = vunpckhpd_avx(auVar100,auVar101);
                  B->data = (void *)auVar102._0_8_;
                  B->refcount = (int *)auVar102._8_8_;
                  B->elemsize = auVar99._0_8_;
                  B->elempack = auVar99._8_4_;
                  *(int *)&B->field_0x1c = auVar99._12_4_;
                  B->allocator = (Allocator *)auVar103._0_8_;
                  B->dims = auVar103._8_4_;
                  B->w = auVar103._12_4_;
                  B->h = auVar100._0_4_;
                  B->d = auVar100._4_4_;
                  B->c = auVar100._8_4_;
                  *(int *)&B->field_0x3c = auVar100._12_4_;
                  B = (Mat *)&B->cstep;
                  pauVar42 = pauVar42 + bottom_blob->cstep;
                  iVar55 = iVar55 + -1;
                } while (iVar55 != 0);
              }
              if (iVar56 == 1 && 0 < iVar38) {
                pauVar42 = (undefined1 (*) [16])
                           ((long)bottom_blob->data +
                           lVar60 * 4 +
                           lVar84 * 4 + bottom_blob->cstep * lVar39 * bottom_blob->elemsize);
                uVar76 = uVar65;
                do {
                  *(undefined1 (*) [16])B = *pauVar42;
                  B = (Mat *)&B->elemsize;
                  pauVar42 = (undefined1 (*) [16])(*pauVar42 + bottom_blob->cstep * 4);
                  uVar79 = (int)uVar76 - 1;
                  uVar76 = (ulong)uVar79;
                } while (uVar79 != 0);
              }
            }
LAB_001916bd:
            lVar85 = lVar84 + 4;
            lVar83 = lVar84 + 7;
            lVar84 = lVar85;
          } while (lVar83 < lVar77);
        }
        uVar79 = (uint)lVar85;
        if ((int)(uVar79 | 1) < (int)uVar48) {
          iVar73 = iVar38 + 3;
          if (-1 < iVar38) {
            iVar73 = iVar38;
          }
          iVar62 = iVar38 + 7;
          if (-1 < iVar38) {
            iVar62 = iVar38;
          }
          iVar49 = iVar38 + 0xf;
          if (-1 < iVar38) {
            iVar49 = iVar38;
          }
          iVar54 = iVar61 + 3;
          if (-1 < iVar61) {
            iVar54 = iVar61;
          }
          iVar74 = iVar61 + 7;
          if (-1 < iVar61) {
            iVar74 = iVar61;
          }
          iVar51 = iVar61 + 0xf;
          if (-1 < iVar61) {
            iVar51 = iVar61;
          }
          lVar84 = lVar60 * 4 + (long)(int)uVar79 * 4;
          lVar83 = (long)(int)uVar79;
          do {
            if (iVar56 == 0x10) {
              if (0xf < iVar38) {
                pauVar40 = (undefined1 (*) [64])
                           ((long)bottom_blob->data +
                           (lVar83 + lVar60) * 0x40 +
                           bottom_blob->cstep * (long)(iVar51 >> 4) * bottom_blob->elemsize);
                iVar55 = iVar49 >> 4;
                do {
                  auVar126 = vunpcklps_avx512f(*pauVar40,pauVar40[1]);
                  auVar127 = vunpckhps_avx512f(*pauVar40,pauVar40[1]);
                  auVar128 = vshuff64x2_avx512f(auVar126,auVar127,0x88);
                  auVar126 = vshuff64x2_avx512f(auVar126,auVar127,0xdd);
                  auVar127 = vshuff64x2_avx512f(auVar128,auVar126,0x88);
                  auVar126 = vshuff64x2_avx512f(auVar128,auVar126,0xdd);
                  B->data = (void *)auVar127._0_8_;
                  B->refcount = (int *)auVar127._8_8_;
                  B->elemsize = auVar127._16_8_;
                  B->elempack = auVar127._24_4_;
                  *(int *)&B->field_0x1c = auVar127._28_4_;
                  B->allocator = (Allocator *)auVar127._32_8_;
                  B->dims = auVar127._40_4_;
                  B->w = auVar127._44_4_;
                  B->h = auVar127._48_4_;
                  B->d = auVar127._52_4_;
                  B->c = auVar127._56_4_;
                  *(int *)&B->field_0x3c = auVar127._60_4_;
                  *(undefined1 (*) [64])&B->cstep = auVar126;
                  B = (Mat *)&B[1].c;
                  pauVar40 = pauVar40 + bottom_blob->cstep;
                  iVar55 = iVar55 + -1;
                } while (iVar55 != 0);
                goto LAB_00191803;
              }
            }
            else {
LAB_00191803:
              if (iVar56 == 8) {
                if (iVar38 < 8) goto LAB_00191916;
                pauVar41 = (undefined1 (*) [32])
                           ((long)bottom_blob->data +
                           (lVar83 + lVar60) * 0x20 +
                           bottom_blob->cstep * (long)(iVar74 >> 3) * bottom_blob->elemsize);
                iVar55 = iVar62 >> 3;
                do {
                  auVar114 = vunpcklps_avx(*pauVar41,pauVar41[1]);
                  auVar113 = vunpckhps_avx(*pauVar41,pauVar41[1]);
                  auVar99 = auVar113._0_16_;
                  auVar113 = vperm2f128_avx(auVar114,auVar113,0x31);
                  B->data = (void *)SUB168(auVar114._0_16_,0);
                  B->refcount = (int *)SUB168(auVar114._0_16_,8);
                  B->elemsize = auVar99._0_8_;
                  B->elempack = auVar99._8_4_;
                  *(int *)&B->field_0x1c = auVar99._12_4_;
                  B->allocator = (Allocator *)auVar113._0_8_;
                  B->dims = auVar113._8_4_;
                  B->w = auVar113._12_4_;
                  B->h = auVar113._16_4_;
                  B->d = auVar113._20_4_;
                  B->c = auVar113._24_4_;
                  *(int *)&B->field_0x3c = auVar113._28_4_;
                  B = (Mat *)&B->cstep;
                  pauVar41 = pauVar41 + bottom_blob->cstep;
                  iVar55 = iVar55 + -1;
                } while (iVar55 != 0);
              }
              if (iVar56 == 4) {
                if (iVar38 < 4) goto LAB_00191916;
                pauVar42 = (undefined1 (*) [16])
                           ((long)bottom_blob->data +
                           (lVar83 + lVar60) * 0x10 +
                           bottom_blob->cstep * (long)(iVar54 >> 2) * bottom_blob->elemsize);
                iVar55 = iVar73 >> 2;
                do {
                  auVar100 = vunpcklps_avx(*pauVar42,pauVar42[1]);
                  auVar99 = vunpckhps_avx(*pauVar42,pauVar42[1]);
                  B->data = (void *)auVar100._0_8_;
                  B->refcount = (int *)auVar100._8_8_;
                  B->elemsize = auVar99._0_8_;
                  B->elempack = auVar99._8_4_;
                  *(int *)&B->field_0x1c = auVar99._12_4_;
                  B = (Mat *)&B->allocator;
                  pauVar42 = pauVar42 + bottom_blob->cstep;
                  iVar55 = iVar55 + -1;
                } while (iVar55 != 0);
              }
              if (iVar56 == 1 && 0 < iVar38) {
                sVar1 = bottom_blob->cstep;
                puVar52 = (undefined4 *)
                          (sVar1 * lVar39 * bottom_blob->elemsize + lVar84 + (long)bottom_blob->data
                          );
                uVar76 = uVar65;
                do {
                  *(undefined4 *)&B->data = *puVar52;
                  *(undefined4 *)((long)&B->data + 4) = puVar52[1];
                  B = (Mat *)&B->refcount;
                  puVar52 = puVar52 + sVar1;
                  uVar79 = (int)uVar76 - 1;
                  uVar76 = (ulong)uVar79;
                } while (uVar79 != 0);
              }
            }
LAB_00191916:
            lVar85 = lVar83 + 2;
            lVar43 = lVar83 + 3;
            lVar84 = lVar84 + 8;
            lVar83 = lVar85;
          } while (lVar43 < lVar77);
        }
        if ((int)lVar85 < (int)uVar48) {
          iVar73 = iVar38 + 3;
          if (-1 < iVar38) {
            iVar73 = iVar38;
          }
          iVar62 = iVar38 + 7;
          if (-1 < iVar38) {
            iVar62 = iVar38;
          }
          iVar49 = iVar38 + 0xf;
          if (-1 < iVar38) {
            iVar49 = iVar38;
          }
          iVar54 = iVar61 + 3;
          if (-1 < iVar61) {
            iVar54 = iVar61;
          }
          iVar74 = iVar61 + 7;
          if (-1 < iVar61) {
            iVar74 = iVar61;
          }
          iVar51 = iVar61 + 0xf;
          if (-1 < iVar61) {
            iVar51 = iVar61;
          }
          lVar84 = (long)(int)lVar85;
          lVar85 = lVar60 * 4 + lVar84 * 4;
          do {
            if (iVar56 == 0x10) {
              if (0xf < iVar38) {
                pauVar40 = (undefined1 (*) [64])
                           ((long)bottom_blob->data +
                           (lVar84 + lVar60) * 0x40 +
                           bottom_blob->cstep * (long)(iVar51 >> 4) * bottom_blob->elemsize);
                iVar61 = iVar49 >> 4;
                do {
                  *(undefined1 (*) [64])B = *pauVar40;
                  B = (Mat *)&B->cstep;
                  pauVar40 = pauVar40 + bottom_blob->cstep;
                  iVar61 = iVar61 + -1;
                } while (iVar61 != 0);
                goto LAB_00191a18;
              }
            }
            else {
LAB_00191a18:
              if (iVar56 == 8) {
                if (iVar38 < 8) goto LAB_00191aee;
                pauVar41 = (undefined1 (*) [32])
                           ((long)bottom_blob->data +
                           (lVar84 + lVar60) * 0x20 +
                           bottom_blob->cstep * (long)(iVar74 >> 3) * bottom_blob->elemsize);
                iVar61 = iVar62 >> 3;
                do {
                  *(undefined1 (*) [32])B = *pauVar41;
                  B = (Mat *)&B->allocator;
                  pauVar41 = pauVar41 + bottom_blob->cstep;
                  iVar61 = iVar61 + -1;
                } while (iVar61 != 0);
              }
              if (iVar56 == 4) {
                if (iVar38 < 4) goto LAB_00191aee;
                pauVar42 = (undefined1 (*) [16])
                           ((long)bottom_blob->data +
                           (lVar84 + lVar60) * 0x10 +
                           bottom_blob->cstep * (long)(iVar54 >> 2) * bottom_blob->elemsize);
                iVar61 = iVar73 >> 2;
                do {
                  *(undefined1 (*) [16])B = *pauVar42;
                  B = (Mat *)&B->elemsize;
                  pauVar42 = pauVar42 + bottom_blob->cstep;
                  iVar61 = iVar61 + -1;
                } while (iVar61 != 0);
              }
              if (iVar56 == 1 && 0 < iVar38) {
                sVar1 = bottom_blob->cstep;
                puVar52 = (undefined4 *)
                          (sVar1 * lVar39 * bottom_blob->elemsize + lVar85 + (long)bottom_blob->data
                          );
                uVar76 = uVar65;
                do {
                  *(undefined4 *)&B->data = *puVar52;
                  B = (Mat *)((long)&B->data + 4);
                  puVar52 = puVar52 + sVar1;
                  uVar48 = (int)uVar76 - 1;
                  uVar76 = (ulong)uVar48;
                } while (uVar48 != 0);
              }
            }
LAB_00191aee:
            lVar84 = lVar84 + 1;
            lVar85 = lVar85 + 4;
          } while (lVar84 != lVar77);
        }
      }
      iVar59 = iVar59 + 1;
    } while (iVar59 != iVar72);
    uVar65 = (ulong)(uint)TILE_K;
  }
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize._0_4_ = 0;
  local_198.elemsize._4_4_ = 0;
  local_198.elempack = 0;
  local_198.allocator = (Allocator *)0x0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  if ((int)uVar65 < K) {
    Mat::create(&local_198,TILE_M * TILE_N,1,nT,4,opt->workspace_allocator);
    iVar59 = -100;
    if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0))
    goto LAB_00191cfe;
  }
  else {
LAB_00191cfe:
    if (0 < (int)local_1f4) {
      local_1e8 = 0;
      do {
        iVar44 = TILE_M;
        if ((int)uVar65 < K) {
          iVar37 = get_omp_thread_num();
          local_1d8 = (undefined1 (*) [64])
                      ((long)iVar37 * local_198.cstep *
                       CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize) +
                      (long)local_198.data);
        }
        else {
          local_1d8 = (undefined1 (*) [64])0x0;
        }
        iVar37 = iVar44 * (int)local_1e8;
        uVar48 = (int)local_150 - iVar37;
        if (iVar44 < (int)uVar48) {
          uVar48 = iVar44;
        }
        iVar44 = (int)local_1e0;
        if (0 < iVar44) {
          local_200 = (long)iVar37;
          local_1f0 = (long)(int)uVar48;
          iVar72 = 0;
          do {
            uVar79 = iVar44 - iVar72;
            if (TILE_N < iVar44 - iVar72) {
              uVar79 = TILE_N;
            }
            if (0 < K) {
              local_1a0 = (long)iVar72;
              iVar59 = 0;
              do {
                local_1d0 = uVar65;
                uVar80 = K - iVar59;
                uVar82 = (uint)local_1d0;
                uVar65 = (ulong)uVar80;
                if ((int)uVar82 < (int)uVar80) {
                  uVar65 = local_1d0;
                }
                pauVar53 = (undefined1 (*) [64])
                           ((long)local_148->data +
                           (long)local_148->w * local_148->elemsize * (long)(iVar59 / (int)uVar82) +
                           (long)(iVar37 / TILE_M) * local_148->cstep * local_148->elemsize);
                pauVar42 = (undefined1 (*) [16])
                           ((long)local_78.data +
                           (long)local_78.w *
                           CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                           (long)(iVar59 / (int)uVar82) +
                           (long)(iVar72 / TILE_N) * local_78.cstep *
                           CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
                iVar38 = uVar82 + iVar59;
                iVar61 = local_248->elempack;
                sVar1 = local_248->cstep;
                pauVar40 = (undefined1 (*) [64])local_240->data;
                iVar56 = (int)uVar65;
                iVar73 = (int)sVar1;
                pauVar78 = local_1d8;
                if ((int)uVar48 < 0x10) {
                  uVar76 = 0;
                }
                else {
                  lVar83 = (long)(iVar73 * 2);
                  lVar39 = (long)(sVar1 * 0x300000000) >> 0x20;
                  lVar60 = (long)(sVar1 * 0x500000000) >> 0x20;
                  lVar77 = (long)(sVar1 * 0x600000000) >> 0x20;
                  local_208 = (long)(sVar1 * 0x700000000) >> 0x20;
                  lVar84 = (long)(iVar73 * 8);
                  local_210 = (long)((sVar1 << 0x20) * 9) >> 0x20;
                  local_218 = (long)((sVar1 << 0x21) * 5) >> 0x20;
                  local_220 = (long)(sVar1 * 0xb00000000) >> 0x20;
                  lVar85 = (long)((sVar1 << 0x22) * 3) >> 0x20;
                  local_228 = (long)(sVar1 * 0xd00000000) >> 0x20;
                  local_230 = (long)(sVar1 * 0xe00000000) >> 0x20;
                  local_238 = (long)(sVar1 * 0xf00000000) >> 0x20;
                  local_1b8 = (ulong)(iVar73 * 0xe);
                  local_1b0 = (long)((sVar1 << 0x20) + 0x100000000) >> 0x20;
                  uVar45 = (ulong)(iVar56 - 1);
                  local_130 = (long)(iVar56 << 4) * 4;
                  uVar64 = uVar80;
                  if ((int)uVar82 < (int)uVar80) {
                    uVar64 = uVar82;
                  }
                  local_138 = (long)(iVar61 * iVar72);
                  lVar66 = (long)(iVar73 * 4);
                  local_1c0 = (long)(iVar73 * 3);
                  local_1c8 = (long)(iVar73 * 5);
                  local_80 = (long)(iVar73 * 6);
                  local_88 = (long)(iVar73 * 7);
                  local_90 = (long)(iVar73 * 9);
                  local_98 = (long)(iVar73 * 10);
                  local_a0 = (long)(iVar73 * 0xb);
                  local_a8 = (long)(iVar73 * 0xc);
                  local_b0 = (long)(iVar73 * 0xd);
                  local_b8 = (long)(iVar73 * 0xf);
                  local_c0 = (long)(iVar73 * 2 + 1);
                  local_c8 = (long)(iVar73 * 3 + 1);
                  local_d0 = (long)(iVar73 * 4 + 1);
                  local_d8 = (long)(iVar73 * 5 + 1);
                  local_e0 = (long)(iVar73 * 6 + 1);
                  local_e8 = (long)(iVar73 * 7 + 1);
                  local_f0 = (long)(iVar73 * 8 + 1);
                  local_f8 = (long)(iVar73 * 9 + 1);
                  local_100 = (long)(iVar73 * 10 + 1);
                  local_108 = (long)(iVar73 * 0xb + 1);
                  local_110 = (long)(iVar73 * 0xc + 1);
                  local_118 = (long)(iVar73 * 0xd + 1);
                  local_120 = (long)(int)(iVar73 * 0xe | 1);
                  local_128 = (long)(iVar73 * 0xf + 1);
                  lVar43 = (long)iVar73;
                  uVar46 = 0;
                  do {
                    pauVar69 = (undefined1 (*) [64])
                               ((long)local_240->data + uVar46 * 4 + local_200 * 4);
                    if (pauVar40 == (undefined1 (*) [64])0x0) {
                      pauVar69 = pauVar40;
                    }
                    pauVar40 = pauVar69;
                    uVar75 = 0;
                    pauVar69 = (undefined1 (*) [64])
                               ((long)local_248->data +
                               local_138 * 4 + (uVar46 + local_200) * lVar43 * 4);
                    pauVar47 = pauVar42;
                    if (0xb < (int)uVar79) {
                      uVar63 = 0;
                      do {
                        if (iVar59 == 0) {
                          if (pauVar40 == (undefined1 (*) [64])0x0) {
                            auVar126 = ZEXT864(0) << 0x40;
                            auVar127 = ZEXT864(0) << 0x40;
                            auVar128 = ZEXT864(0) << 0x40;
                            auVar129 = ZEXT864(0) << 0x40;
                            auVar130 = ZEXT864(0) << 0x40;
                            auVar131 = ZEXT864(0) << 0x40;
                            auVar132 = ZEXT864(0) << 0x40;
                            auVar133 = ZEXT864(0) << 0x40;
                            auVar134 = ZEXT864(0) << 0x40;
                            auVar135 = ZEXT864(0) << 0x40;
                            auVar136 = ZEXT864(0) << 0x40;
                            auVar137 = ZEXT864(0) << 0x40;
                          }
                          else {
                            auVar126 = *pauVar40;
                            auVar127 = auVar126;
                            auVar128 = auVar126;
                            auVar129 = auVar126;
                            auVar130 = auVar126;
                            auVar131 = auVar126;
                            auVar132 = auVar126;
                            auVar133 = auVar126;
                            auVar134 = auVar126;
                            auVar135 = auVar126;
                            auVar136 = auVar126;
                            auVar137 = auVar126;
                          }
                        }
                        else {
                          auVar126 = pauVar78[0xb];
                          auVar127 = pauVar78[10];
                          auVar128 = pauVar78[9];
                          auVar129 = pauVar78[8];
                          auVar130 = pauVar78[7];
                          auVar131 = pauVar78[6];
                          auVar132 = pauVar78[5];
                          auVar133 = pauVar78[4];
                          auVar134 = pauVar78[3];
                          auVar135 = pauVar78[2];
                          auVar136 = pauVar78[1];
                          auVar137 = *pauVar78;
                        }
                        pauVar70 = pauVar53;
                        uVar76 = uVar65;
                        pauVar50 = pauVar47;
                        if (0 < iVar56) {
                          do {
                            auVar138 = *pauVar70;
                            uVar168 = *(undefined4 *)*pauVar50;
                            auVar139._4_4_ = uVar168;
                            auVar139._0_4_ = uVar168;
                            auVar139._8_4_ = uVar168;
                            auVar139._12_4_ = uVar168;
                            auVar139._16_4_ = uVar168;
                            auVar139._20_4_ = uVar168;
                            auVar139._24_4_ = uVar168;
                            auVar139._28_4_ = uVar168;
                            auVar139._32_4_ = uVar168;
                            auVar139._36_4_ = uVar168;
                            auVar139._40_4_ = uVar168;
                            auVar139._44_4_ = uVar168;
                            auVar139._48_4_ = uVar168;
                            auVar139._52_4_ = uVar168;
                            auVar139._56_4_ = uVar168;
                            auVar139._60_4_ = uVar168;
                            auVar137 = vfmadd231ps_avx512f(auVar137,auVar138,auVar139);
                            uVar168 = *(undefined4 *)(*pauVar50 + 4);
                            auVar140._4_4_ = uVar168;
                            auVar140._0_4_ = uVar168;
                            auVar140._8_4_ = uVar168;
                            auVar140._12_4_ = uVar168;
                            auVar140._16_4_ = uVar168;
                            auVar140._20_4_ = uVar168;
                            auVar140._24_4_ = uVar168;
                            auVar140._28_4_ = uVar168;
                            auVar140._32_4_ = uVar168;
                            auVar140._36_4_ = uVar168;
                            auVar140._40_4_ = uVar168;
                            auVar140._44_4_ = uVar168;
                            auVar140._48_4_ = uVar168;
                            auVar140._52_4_ = uVar168;
                            auVar140._56_4_ = uVar168;
                            auVar140._60_4_ = uVar168;
                            auVar136 = vfmadd231ps_avx512f(auVar136,auVar138,auVar140);
                            uVar168 = *(undefined4 *)(*pauVar50 + 8);
                            auVar141._4_4_ = uVar168;
                            auVar141._0_4_ = uVar168;
                            auVar141._8_4_ = uVar168;
                            auVar141._12_4_ = uVar168;
                            auVar141._16_4_ = uVar168;
                            auVar141._20_4_ = uVar168;
                            auVar141._24_4_ = uVar168;
                            auVar141._28_4_ = uVar168;
                            auVar141._32_4_ = uVar168;
                            auVar141._36_4_ = uVar168;
                            auVar141._40_4_ = uVar168;
                            auVar141._44_4_ = uVar168;
                            auVar141._48_4_ = uVar168;
                            auVar141._52_4_ = uVar168;
                            auVar141._56_4_ = uVar168;
                            auVar141._60_4_ = uVar168;
                            auVar135 = vfmadd231ps_avx512f(auVar135,auVar138,auVar141);
                            uVar168 = *(undefined4 *)(*pauVar50 + 0xc);
                            auVar142._4_4_ = uVar168;
                            auVar142._0_4_ = uVar168;
                            auVar142._8_4_ = uVar168;
                            auVar142._12_4_ = uVar168;
                            auVar142._16_4_ = uVar168;
                            auVar142._20_4_ = uVar168;
                            auVar142._24_4_ = uVar168;
                            auVar142._28_4_ = uVar168;
                            auVar142._32_4_ = uVar168;
                            auVar142._36_4_ = uVar168;
                            auVar142._40_4_ = uVar168;
                            auVar142._44_4_ = uVar168;
                            auVar142._48_4_ = uVar168;
                            auVar142._52_4_ = uVar168;
                            auVar142._56_4_ = uVar168;
                            auVar142._60_4_ = uVar168;
                            auVar134 = vfmadd231ps_avx512f(auVar134,auVar138,auVar142);
                            uVar168 = *(undefined4 *)pauVar50[1];
                            auVar143._4_4_ = uVar168;
                            auVar143._0_4_ = uVar168;
                            auVar143._8_4_ = uVar168;
                            auVar143._12_4_ = uVar168;
                            auVar143._16_4_ = uVar168;
                            auVar143._20_4_ = uVar168;
                            auVar143._24_4_ = uVar168;
                            auVar143._28_4_ = uVar168;
                            auVar143._32_4_ = uVar168;
                            auVar143._36_4_ = uVar168;
                            auVar143._40_4_ = uVar168;
                            auVar143._44_4_ = uVar168;
                            auVar143._48_4_ = uVar168;
                            auVar143._52_4_ = uVar168;
                            auVar143._56_4_ = uVar168;
                            auVar143._60_4_ = uVar168;
                            auVar133 = vfmadd231ps_avx512f(auVar133,auVar138,auVar143);
                            uVar168 = *(undefined4 *)(pauVar50[1] + 4);
                            auVar144._4_4_ = uVar168;
                            auVar144._0_4_ = uVar168;
                            auVar144._8_4_ = uVar168;
                            auVar144._12_4_ = uVar168;
                            auVar144._16_4_ = uVar168;
                            auVar144._20_4_ = uVar168;
                            auVar144._24_4_ = uVar168;
                            auVar144._28_4_ = uVar168;
                            auVar144._32_4_ = uVar168;
                            auVar144._36_4_ = uVar168;
                            auVar144._40_4_ = uVar168;
                            auVar144._44_4_ = uVar168;
                            auVar144._48_4_ = uVar168;
                            auVar144._52_4_ = uVar168;
                            auVar144._56_4_ = uVar168;
                            auVar144._60_4_ = uVar168;
                            auVar132 = vfmadd231ps_avx512f(auVar132,auVar138,auVar144);
                            uVar168 = *(undefined4 *)(pauVar50[1] + 8);
                            auVar145._4_4_ = uVar168;
                            auVar145._0_4_ = uVar168;
                            auVar145._8_4_ = uVar168;
                            auVar145._12_4_ = uVar168;
                            auVar145._16_4_ = uVar168;
                            auVar145._20_4_ = uVar168;
                            auVar145._24_4_ = uVar168;
                            auVar145._28_4_ = uVar168;
                            auVar145._32_4_ = uVar168;
                            auVar145._36_4_ = uVar168;
                            auVar145._40_4_ = uVar168;
                            auVar145._44_4_ = uVar168;
                            auVar145._48_4_ = uVar168;
                            auVar145._52_4_ = uVar168;
                            auVar145._56_4_ = uVar168;
                            auVar145._60_4_ = uVar168;
                            auVar131 = vfmadd231ps_avx512f(auVar131,auVar138,auVar145);
                            uVar168 = *(undefined4 *)(pauVar50[1] + 0xc);
                            auVar146._4_4_ = uVar168;
                            auVar146._0_4_ = uVar168;
                            auVar146._8_4_ = uVar168;
                            auVar146._12_4_ = uVar168;
                            auVar146._16_4_ = uVar168;
                            auVar146._20_4_ = uVar168;
                            auVar146._24_4_ = uVar168;
                            auVar146._28_4_ = uVar168;
                            auVar146._32_4_ = uVar168;
                            auVar146._36_4_ = uVar168;
                            auVar146._40_4_ = uVar168;
                            auVar146._44_4_ = uVar168;
                            auVar146._48_4_ = uVar168;
                            auVar146._52_4_ = uVar168;
                            auVar146._56_4_ = uVar168;
                            auVar146._60_4_ = uVar168;
                            auVar130 = vfmadd231ps_avx512f(auVar130,auVar138,auVar146);
                            uVar168 = *(undefined4 *)pauVar50[2];
                            auVar147._4_4_ = uVar168;
                            auVar147._0_4_ = uVar168;
                            auVar147._8_4_ = uVar168;
                            auVar147._12_4_ = uVar168;
                            auVar147._16_4_ = uVar168;
                            auVar147._20_4_ = uVar168;
                            auVar147._24_4_ = uVar168;
                            auVar147._28_4_ = uVar168;
                            auVar147._32_4_ = uVar168;
                            auVar147._36_4_ = uVar168;
                            auVar147._40_4_ = uVar168;
                            auVar147._44_4_ = uVar168;
                            auVar147._48_4_ = uVar168;
                            auVar147._52_4_ = uVar168;
                            auVar147._56_4_ = uVar168;
                            auVar147._60_4_ = uVar168;
                            auVar129 = vfmadd231ps_avx512f(auVar129,auVar138,auVar147);
                            uVar168 = *(undefined4 *)(pauVar50[2] + 4);
                            auVar27._4_4_ = uVar168;
                            auVar27._0_4_ = uVar168;
                            auVar27._8_4_ = uVar168;
                            auVar27._12_4_ = uVar168;
                            auVar27._16_4_ = uVar168;
                            auVar27._20_4_ = uVar168;
                            auVar27._24_4_ = uVar168;
                            auVar27._28_4_ = uVar168;
                            auVar27._32_4_ = uVar168;
                            auVar27._36_4_ = uVar168;
                            auVar27._40_4_ = uVar168;
                            auVar27._44_4_ = uVar168;
                            auVar27._48_4_ = uVar168;
                            auVar27._52_4_ = uVar168;
                            auVar27._56_4_ = uVar168;
                            auVar27._60_4_ = uVar168;
                            auVar128 = vfmadd231ps_avx512f(auVar128,auVar138,auVar27);
                            uVar168 = *(undefined4 *)(pauVar50[2] + 8);
                            auVar28._4_4_ = uVar168;
                            auVar28._0_4_ = uVar168;
                            auVar28._8_4_ = uVar168;
                            auVar28._12_4_ = uVar168;
                            auVar28._16_4_ = uVar168;
                            auVar28._20_4_ = uVar168;
                            auVar28._24_4_ = uVar168;
                            auVar28._28_4_ = uVar168;
                            auVar28._32_4_ = uVar168;
                            auVar28._36_4_ = uVar168;
                            auVar28._40_4_ = uVar168;
                            auVar28._44_4_ = uVar168;
                            auVar28._48_4_ = uVar168;
                            auVar28._52_4_ = uVar168;
                            auVar28._56_4_ = uVar168;
                            auVar28._60_4_ = uVar168;
                            auVar127 = vfmadd231ps_avx512f(auVar127,auVar138,auVar28);
                            uVar168 = *(undefined4 *)(pauVar50[2] + 0xc);
                            auVar29._4_4_ = uVar168;
                            auVar29._0_4_ = uVar168;
                            auVar29._8_4_ = uVar168;
                            auVar29._12_4_ = uVar168;
                            auVar29._16_4_ = uVar168;
                            auVar29._20_4_ = uVar168;
                            auVar29._24_4_ = uVar168;
                            auVar29._28_4_ = uVar168;
                            auVar29._32_4_ = uVar168;
                            auVar29._36_4_ = uVar168;
                            auVar29._40_4_ = uVar168;
                            auVar29._44_4_ = uVar168;
                            auVar29._48_4_ = uVar168;
                            auVar29._52_4_ = uVar168;
                            auVar29._56_4_ = uVar168;
                            auVar29._60_4_ = uVar168;
                            auVar126 = vfmadd231ps_avx512f(auVar126,auVar138,auVar29);
                            uVar75 = (int)uVar76 - 1;
                            pauVar70 = pauVar70 + 1;
                            uVar76 = (ulong)uVar75;
                            pauVar50 = pauVar50 + 3;
                          } while (uVar75 != 0);
                          pauVar47 = pauVar47 + uVar45 * 3 + 3;
                        }
                        if (iVar38 < K) {
                          *pauVar78 = auVar137;
                          pauVar78[1] = auVar136;
                          pauVar78[2] = auVar135;
                          pauVar78[3] = auVar134;
                          pauVar78[4] = auVar133;
                          pauVar78[5] = auVar132;
                          pauVar78[6] = auVar131;
                          pauVar78[7] = auVar130;
                          pauVar78[8] = auVar129;
                          pauVar78[9] = auVar128;
                          pauVar78[10] = auVar127;
                          pauVar78[0xb] = auVar126;
                        }
                        else if (iVar61 < 8) {
                          if (iVar61 == 1) {
                            auVar138 = vunpcklps_avx512f(auVar137,auVar136);
                            auVar136 = vunpckhps_avx512f(auVar137,auVar136);
                            auVar137 = vunpcklps_avx512f(auVar135,auVar134);
                            auVar134 = vunpckhps_avx512f(auVar135,auVar134);
                            auVar135 = vunpcklps_avx512f(auVar133,auVar132);
                            auVar132 = vunpckhps_avx512f(auVar133,auVar132);
                            auVar133 = vunpcklps_avx512f(auVar131,auVar130);
                            auVar130 = vunpckhps_avx512f(auVar131,auVar130);
                            auVar131 = vunpcklps_avx512f(auVar129,auVar128);
                            auVar128 = vunpckhps_avx512f(auVar129,auVar128);
                            auVar129 = vunpcklps_avx512f(auVar127,auVar126);
                            auVar126 = vunpckhps_avx512f(auVar127,auVar126);
                            auVar127 = vunpcklpd_avx512f(auVar138,auVar137);
                            auVar137 = vunpckhpd_avx512f(auVar138,auVar137);
                            auVar138 = vunpcklpd_avx512f(auVar136,auVar134);
                            auVar134 = vunpckhpd_avx512f(auVar136,auVar134);
                            auVar136 = vunpcklpd_avx512f(auVar135,auVar133);
                            auVar133 = vunpckhpd_avx512f(auVar135,auVar133);
                            auVar135 = vunpcklpd_avx512f(auVar132,auVar130);
                            auVar130 = vunpckhpd_avx512f(auVar132,auVar130);
                            auVar132 = vunpcklpd_avx512f(auVar131,auVar129);
                            auVar129 = vunpckhpd_avx512f(auVar131,auVar129);
                            auVar131 = vunpcklpd_avx512f(auVar128,auVar126);
                            auVar126 = vunpckhpd_avx512f(auVar128,auVar126);
                            auVar128 = vshuff64x2_avx512f(auVar127,auVar136,0x88);
                            auVar139 = vshuff64x2_avx512f(auVar132,auVar137,0x88);
                            auVar140 = vshuff64x2_avx512f(auVar133,auVar129,0x88);
                            auVar141 = vshuff64x2_avx512f(auVar138,auVar135,0x88);
                            auVar142 = vshuff64x2_avx512f(auVar131,auVar134,0x88);
                            auVar143 = vshuff64x2_avx512f(auVar130,auVar126,0x88);
                            auVar127 = vshuff64x2_avx512f(auVar127,auVar136,0xdd);
                            auVar136 = vshuff64x2_avx512f(auVar132,auVar137,0xdd);
                            auVar129 = vshuff64x2_avx512f(auVar133,auVar129,0xdd);
                            auVar133 = vshuff64x2_avx512f(auVar138,auVar135,0xdd);
                            auVar135 = vshuff64x2_avx512f(auVar131,auVar134,0xdd);
                            auVar126 = vshuff64x2_avx512f(auVar130,auVar126,0xdd);
                            auVar130 = vshuff64x2_avx512f(auVar128,auVar139,0x88);
                            auVar138 = vshuff64x2_avx512f(auVar140,auVar141,0x88);
                            auVar144 = vshuff64x2_avx512f(auVar142,auVar143,0x88);
                            auVar145 = vshuff64x2_avx512f(auVar127,auVar136,0x88);
                            auVar146 = vshuff64x2_avx512f(auVar129,auVar133,0x88);
                            auVar147 = vshuff64x2_avx512f(auVar135,auVar126,0x88);
                            auVar128 = vshuff64x2_avx512f(auVar128,auVar139,0xdd);
                            auVar139 = vshuff64x2_avx512f(auVar140,auVar141,0xdd);
                            auVar140 = vshuff64x2_avx512f(auVar142,auVar143,0xdd);
                            auVar127 = vshuff64x2_avx512f(auVar127,auVar136,0xdd);
                            auVar129 = vshuff64x2_avx512f(auVar129,auVar133,0xdd);
                            auVar126 = vshuff64x2_avx512f(auVar135,auVar126,0xdd);
                            *(undefined1 (*) [32])*pauVar69 = auVar130._0_32_;
                            *(undefined1 (*) [16])(*pauVar69 + 0x20) = auVar132._0_16_;
                            *(undefined1 (*) [16])(*pauVar69 + lVar43 * 4) = auVar137._0_16_;
                            *(undefined1 (*) [32])(*pauVar69 + lVar43 * 4 + 0x10) = auVar138._0_32_;
                            auVar113 = vextractf64x4_avx512f(auVar138,1);
                            *(undefined1 (*) [32])(*pauVar69 + lVar83 * 4) = auVar113;
                            *(undefined1 (*) [16])(*pauVar69 + lVar83 * 4 + 0x20) = auVar131._0_16_;
                            *(undefined1 (*) [16])(*pauVar69 + lVar39 * 4) = auVar134._0_16_;
                            auVar113 = vextractf64x4_avx512f(auVar144,1);
                            *(undefined1 (*) [32])(*pauVar69 + lVar39 * 4 + 0x10) = auVar113;
                            *(undefined1 (*) [32])(*pauVar69 + lVar66 * 4) = auVar145._0_32_;
                            auVar99 = vextractf32x4_avx512f(auVar132,1);
                            *(undefined1 (*) [16])(*pauVar69 + lVar66 * 4 + 0x10) = auVar99;
                            auVar99 = vextractf32x4_avx512f(auVar137,1);
                            *(undefined1 (*) [16])(*pauVar69 + lVar60 * 4) = auVar99;
                            *(undefined1 (*) [32])(*pauVar69 + lVar60 * 4 + 0x10) = auVar146._0_32_;
                            auVar113 = vextractf64x4_avx512f(auVar146,1);
                            *(undefined1 (*) [32])(*pauVar69 + lVar77 * 4) = auVar113;
                            auVar99 = vextractf32x4_avx512f(auVar131,1);
                            *(undefined1 (*) [16])(*pauVar69 + lVar77 * 4 + 0x10) = auVar99;
                            auVar99 = vextractf32x4_avx512f(auVar134,1);
                            *(undefined1 (*) [16])(*pauVar69 + local_208 * 4) = auVar99;
                            auVar113 = vextractf64x4_avx512f(auVar147,1);
                            *(undefined1 (*) [32])(*pauVar69 + local_208 * 4 + 0x10) = auVar113;
                            *(undefined1 (*) [32])(*pauVar69 + lVar84 * 4) = auVar128._0_32_;
                            auVar99 = vextractf32x4_avx512f(auVar132,2);
                            *(undefined1 (*) [16])(*pauVar69 + lVar84 * 4 + 0x10) = auVar99;
                            auVar99 = vextractf32x4_avx512f(auVar137,2);
                            *(undefined1 (*) [16])(*pauVar69 + local_210 * 4) = auVar99;
                            *(undefined1 (*) [32])(*pauVar69 + local_210 * 4 + 0x10) =
                                 auVar139._0_32_;
                            auVar113 = vextractf64x4_avx512f(auVar139,1);
                            *(undefined1 (*) [32])(*pauVar69 + local_218 * 4) = auVar113;
                            auVar99 = vextractf32x4_avx512f(auVar131,2);
                            *(undefined1 (*) [16])(*pauVar69 + local_218 * 4 + 0x10) = auVar99;
                            auVar99 = vextractf32x4_avx512f(auVar134,2);
                            *(undefined1 (*) [16])(*pauVar69 + local_220 * 4) = auVar99;
                            auVar113 = vextractf64x4_avx512f(auVar140,1);
                            *(undefined1 (*) [32])(*pauVar69 + local_220 * 4 + 0x10) = auVar113;
                            *(undefined1 (*) [32])(*pauVar69 + lVar85 * 4) = auVar127._0_32_;
                            auVar99 = vextractf32x4_avx512f(auVar132,3);
                            *(undefined1 (*) [16])(*pauVar69 + lVar85 * 4 + 0x10) = auVar99;
                            auVar99 = vextractf32x4_avx512f(auVar137,3);
                            *(undefined1 (*) [16])(*pauVar69 + local_228 * 4) = auVar99;
                            *(undefined1 (*) [32])(*pauVar69 + local_228 * 4 + 0x10) =
                                 auVar129._0_32_;
                            auVar113 = vextractf64x4_avx512f(auVar129,1);
                            *(undefined1 (*) [32])(*pauVar69 + local_230 * 4) = auVar113;
                            auVar99 = vextractf32x4_avx512f(auVar131,3);
                            *(undefined1 (*) [16])(*pauVar69 + local_230 * 4 + 0x10) = auVar99;
                            auVar99 = vextractf32x4_avx512f(auVar134,3);
                            *(undefined1 (*) [16])(*pauVar69 + local_238 * 4) = auVar99;
                            auVar113 = vextractf64x4_avx512f(auVar126,1);
                            *(undefined1 (*) [32])(*pauVar69 + local_238 * 4 + 0x10) = auVar113;
                            pauVar69 = (undefined1 (*) [64])(*pauVar69 + 0x30);
                          }
                          else if (iVar61 == 4) {
                            auVar138 = vinsertf64x4_avx512f(auVar137,auVar136._0_32_,1);
                            auVar139 = vinsertf64x4_avx512f(auVar135,auVar134._0_32_,1);
                            auVar136 = vshuff64x2_avx512f(auVar137,auVar136,0xee);
                            auVar134 = vshuff64x2_avx512f(auVar135,auVar134,0xee);
                            auVar135 = vinsertf64x4_avx512f(auVar133,auVar132._0_32_,1);
                            auVar137 = vinsertf64x4_avx512f(auVar131,auVar130._0_32_,1);
                            auVar132 = vshuff64x2_avx512f(auVar133,auVar132,0xee);
                            auVar130 = vshuff64x2_avx512f(auVar131,auVar130,0xee);
                            auVar131 = vinsertf64x4_avx512f(auVar129,auVar128._0_32_,1);
                            auVar133 = vinsertf64x4_avx512f(auVar127,auVar126._0_32_,1);
                            auVar128 = vshuff64x2_avx512f(auVar129,auVar128,0xee);
                            auVar126 = vshuff64x2_avx512f(auVar127,auVar126,0xee);
                            auVar127 = vshuff64x2_avx512f(auVar138,auVar139,0x88);
                            auVar129 = vshuff64x2_avx512f(auVar138,auVar139,0xdd);
                            auVar138 = vshuff64x2_avx512f(auVar136,auVar134,0x88);
                            auVar134 = vshuff64x2_avx512f(auVar136,auVar134,0xdd);
                            auVar136 = vshuff64x2_avx512f(auVar135,auVar137,0x88);
                            auVar135 = vshuff64x2_avx512f(auVar135,auVar137,0xdd);
                            auVar137 = vshuff64x2_avx512f(auVar132,auVar130,0x88);
                            auVar130 = vshuff64x2_avx512f(auVar132,auVar130,0xdd);
                            auVar132 = vshuff64x2_avx512f(auVar131,auVar133,0x88);
                            auVar131 = vshuff64x2_avx512f(auVar131,auVar133,0xdd);
                            auVar133 = vshuff64x2_avx512f(auVar128,auVar126,0x88);
                            auVar126 = vshuff64x2_avx512f(auVar128,auVar126,0xdd);
                            *pauVar69 = auVar127;
                            pauVar69[1] = auVar136;
                            pauVar69[2] = auVar132;
                            *(undefined1 (*) [64])(*pauVar69 + lVar66 * 4) = auVar129;
                            *(undefined1 (*) [64])(pauVar69[1] + lVar66 * 4) = auVar135;
                            *(undefined1 (*) [64])(pauVar69[2] + lVar66 * 4) = auVar131;
                            *(undefined1 (*) [64])(*pauVar69 + lVar84 * 4) = auVar138;
                            *(undefined1 (*) [64])(pauVar69[1] + lVar84 * 4) = auVar137;
                            *(undefined1 (*) [64])(pauVar69[2] + lVar84 * 4) = auVar133;
                            *(undefined1 (*) [64])(*pauVar69 + lVar85 * 4) = auVar134;
                            *(undefined1 (*) [64])(pauVar69[1] + lVar85 * 4) = auVar130;
                            *(undefined1 (*) [64])(pauVar69[2] + lVar85 * 4) = auVar126;
                            pauVar69 = pauVar69 + 3;
                          }
                        }
                        else if (iVar61 == 8) {
                          auVar138 = vinsertf64x4_avx512f(auVar137,auVar136._0_32_,1);
                          auVar139 = vinsertf64x4_avx512f(auVar135,auVar134._0_32_,1);
                          auVar140 = vinsertf64x4_avx512f(auVar133,auVar132._0_32_,1);
                          auVar141 = vinsertf64x4_avx512f(auVar131,auVar130._0_32_,1);
                          auVar142 = vinsertf64x4_avx512f(auVar129,auVar128._0_32_,1);
                          auVar143 = vinsertf64x4_avx512f(auVar127,auVar126._0_32_,1);
                          auVar136 = vshuff64x2_avx512f(auVar137,auVar136,0xee);
                          auVar134 = vshuff64x2_avx512f(auVar135,auVar134,0xee);
                          auVar132 = vshuff64x2_avx512f(auVar133,auVar132,0xee);
                          auVar130 = vshuff64x2_avx512f(auVar131,auVar130,0xee);
                          auVar128 = vshuff64x2_avx512f(auVar129,auVar128,0xee);
                          auVar126 = vshuff64x2_avx512f(auVar127,auVar126,0xee);
                          *pauVar69 = auVar138;
                          pauVar69[1] = auVar139;
                          pauVar69[2] = auVar140;
                          pauVar69[3] = auVar141;
                          pauVar69[4] = auVar142;
                          pauVar69[5] = auVar143;
                          *(undefined1 (*) [64])(*pauVar69 + lVar84 * 4) = auVar136;
                          *(undefined1 (*) [64])(pauVar69[1] + lVar84 * 4) = auVar134;
                          *(undefined1 (*) [64])(pauVar69[2] + lVar84 * 4) = auVar132;
                          *(undefined1 (*) [64])(pauVar69[3] + lVar84 * 4) = auVar130;
                          *(undefined1 (*) [64])(pauVar69[4] + lVar84 * 4) = auVar128;
                          *(undefined1 (*) [64])(pauVar69[5] + lVar84 * 4) = auVar126;
                          pauVar69 = pauVar69 + 6;
                        }
                        else if (iVar61 == 0x10) {
                          *pauVar69 = auVar137;
                          pauVar69[1] = auVar136;
                          pauVar69[2] = auVar135;
                          pauVar69[3] = auVar134;
                          pauVar69[4] = auVar133;
                          pauVar69[5] = auVar132;
                          pauVar69[6] = auVar131;
                          pauVar69[7] = auVar130;
                          pauVar69[8] = auVar129;
                          pauVar69[9] = auVar128;
                          pauVar69[10] = auVar127;
                          pauVar69[0xb] = auVar126;
                          pauVar69 = pauVar69 + 0xc;
                        }
                        pauVar78 = pauVar78 + 0xc;
                        uVar75 = uVar63 + 0xc;
                        iVar62 = uVar63 + 0x17;
                        uVar63 = uVar75;
                      } while (iVar62 < (int)uVar79);
                    }
                    iVar62 = uVar75 + 7;
                    while (iVar62 < (int)uVar79) {
                      if (iVar59 == 0) {
                        if (pauVar40 == (undefined1 (*) [64])0x0) {
                          auVar126 = ZEXT864(0) << 0x40;
                          auVar127 = ZEXT864(0) << 0x40;
                          auVar128 = ZEXT864(0) << 0x40;
                          auVar129 = ZEXT864(0) << 0x40;
                          auVar130 = ZEXT864(0) << 0x40;
                          auVar131 = ZEXT864(0) << 0x40;
                          auVar132 = ZEXT864(0) << 0x40;
                          auVar133 = ZEXT864(0) << 0x40;
                        }
                        else {
                          auVar126 = *pauVar40;
                          auVar127 = auVar126;
                          auVar128 = auVar126;
                          auVar129 = auVar126;
                          auVar130 = auVar126;
                          auVar131 = auVar126;
                          auVar132 = auVar126;
                          auVar133 = auVar126;
                        }
                      }
                      else {
                        auVar126 = pauVar78[7];
                        auVar127 = pauVar78[6];
                        auVar128 = pauVar78[5];
                        auVar129 = pauVar78[4];
                        auVar130 = pauVar78[3];
                        auVar131 = pauVar78[2];
                        auVar132 = pauVar78[1];
                        auVar133 = *pauVar78;
                      }
                      if (0 < iVar56) {
                        lVar67 = 0;
                        uVar76 = uVar65;
                        do {
                          auVar134 = *(undefined1 (*) [64])(*pauVar53 + lVar67 * 2);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar67);
                          auVar135._4_4_ = uVar168;
                          auVar135._0_4_ = uVar168;
                          auVar135._8_4_ = uVar168;
                          auVar135._12_4_ = uVar168;
                          auVar135._16_4_ = uVar168;
                          auVar135._20_4_ = uVar168;
                          auVar135._24_4_ = uVar168;
                          auVar135._28_4_ = uVar168;
                          auVar135._32_4_ = uVar168;
                          auVar135._36_4_ = uVar168;
                          auVar135._40_4_ = uVar168;
                          auVar135._44_4_ = uVar168;
                          auVar135._48_4_ = uVar168;
                          auVar135._52_4_ = uVar168;
                          auVar135._56_4_ = uVar168;
                          auVar135._60_4_ = uVar168;
                          auVar133 = vfmadd231ps_avx512f(auVar133,auVar134,auVar135);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar67 + 4);
                          auVar136._4_4_ = uVar168;
                          auVar136._0_4_ = uVar168;
                          auVar136._8_4_ = uVar168;
                          auVar136._12_4_ = uVar168;
                          auVar136._16_4_ = uVar168;
                          auVar136._20_4_ = uVar168;
                          auVar136._24_4_ = uVar168;
                          auVar136._28_4_ = uVar168;
                          auVar136._32_4_ = uVar168;
                          auVar136._36_4_ = uVar168;
                          auVar136._40_4_ = uVar168;
                          auVar136._44_4_ = uVar168;
                          auVar136._48_4_ = uVar168;
                          auVar136._52_4_ = uVar168;
                          auVar136._56_4_ = uVar168;
                          auVar136._60_4_ = uVar168;
                          auVar132 = vfmadd231ps_avx512f(auVar132,auVar134,auVar136);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar67 + 8);
                          auVar137._4_4_ = uVar168;
                          auVar137._0_4_ = uVar168;
                          auVar137._8_4_ = uVar168;
                          auVar137._12_4_ = uVar168;
                          auVar137._16_4_ = uVar168;
                          auVar137._20_4_ = uVar168;
                          auVar137._24_4_ = uVar168;
                          auVar137._28_4_ = uVar168;
                          auVar137._32_4_ = uVar168;
                          auVar137._36_4_ = uVar168;
                          auVar137._40_4_ = uVar168;
                          auVar137._44_4_ = uVar168;
                          auVar137._48_4_ = uVar168;
                          auVar137._52_4_ = uVar168;
                          auVar137._56_4_ = uVar168;
                          auVar137._60_4_ = uVar168;
                          auVar131 = vfmadd231ps_avx512f(auVar131,auVar134,auVar137);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar67 + 0xc);
                          auVar138._4_4_ = uVar168;
                          auVar138._0_4_ = uVar168;
                          auVar138._8_4_ = uVar168;
                          auVar138._12_4_ = uVar168;
                          auVar138._16_4_ = uVar168;
                          auVar138._20_4_ = uVar168;
                          auVar138._24_4_ = uVar168;
                          auVar138._28_4_ = uVar168;
                          auVar138._32_4_ = uVar168;
                          auVar138._36_4_ = uVar168;
                          auVar138._40_4_ = uVar168;
                          auVar138._44_4_ = uVar168;
                          auVar138._48_4_ = uVar168;
                          auVar138._52_4_ = uVar168;
                          auVar138._56_4_ = uVar168;
                          auVar138._60_4_ = uVar168;
                          auVar130 = vfmadd231ps_avx512f(auVar130,auVar134,auVar138);
                          uVar168 = *(undefined4 *)(pauVar47[1] + lVar67);
                          auVar30._4_4_ = uVar168;
                          auVar30._0_4_ = uVar168;
                          auVar30._8_4_ = uVar168;
                          auVar30._12_4_ = uVar168;
                          auVar30._16_4_ = uVar168;
                          auVar30._20_4_ = uVar168;
                          auVar30._24_4_ = uVar168;
                          auVar30._28_4_ = uVar168;
                          auVar30._32_4_ = uVar168;
                          auVar30._36_4_ = uVar168;
                          auVar30._40_4_ = uVar168;
                          auVar30._44_4_ = uVar168;
                          auVar30._48_4_ = uVar168;
                          auVar30._52_4_ = uVar168;
                          auVar30._56_4_ = uVar168;
                          auVar30._60_4_ = uVar168;
                          auVar129 = vfmadd231ps_avx512f(auVar129,auVar134,auVar30);
                          uVar168 = *(undefined4 *)(pauVar47[1] + lVar67 + 4);
                          auVar31._4_4_ = uVar168;
                          auVar31._0_4_ = uVar168;
                          auVar31._8_4_ = uVar168;
                          auVar31._12_4_ = uVar168;
                          auVar31._16_4_ = uVar168;
                          auVar31._20_4_ = uVar168;
                          auVar31._24_4_ = uVar168;
                          auVar31._28_4_ = uVar168;
                          auVar31._32_4_ = uVar168;
                          auVar31._36_4_ = uVar168;
                          auVar31._40_4_ = uVar168;
                          auVar31._44_4_ = uVar168;
                          auVar31._48_4_ = uVar168;
                          auVar31._52_4_ = uVar168;
                          auVar31._56_4_ = uVar168;
                          auVar31._60_4_ = uVar168;
                          auVar128 = vfmadd231ps_avx512f(auVar128,auVar134,auVar31);
                          uVar168 = *(undefined4 *)(pauVar47[1] + lVar67 + 8);
                          auVar32._4_4_ = uVar168;
                          auVar32._0_4_ = uVar168;
                          auVar32._8_4_ = uVar168;
                          auVar32._12_4_ = uVar168;
                          auVar32._16_4_ = uVar168;
                          auVar32._20_4_ = uVar168;
                          auVar32._24_4_ = uVar168;
                          auVar32._28_4_ = uVar168;
                          auVar32._32_4_ = uVar168;
                          auVar32._36_4_ = uVar168;
                          auVar32._40_4_ = uVar168;
                          auVar32._44_4_ = uVar168;
                          auVar32._48_4_ = uVar168;
                          auVar32._52_4_ = uVar168;
                          auVar32._56_4_ = uVar168;
                          auVar32._60_4_ = uVar168;
                          auVar127 = vfmadd231ps_avx512f(auVar127,auVar134,auVar32);
                          uVar168 = *(undefined4 *)(pauVar47[1] + lVar67 + 0xc);
                          auVar33._4_4_ = uVar168;
                          auVar33._0_4_ = uVar168;
                          auVar33._8_4_ = uVar168;
                          auVar33._12_4_ = uVar168;
                          auVar33._16_4_ = uVar168;
                          auVar33._20_4_ = uVar168;
                          auVar33._24_4_ = uVar168;
                          auVar33._28_4_ = uVar168;
                          auVar33._32_4_ = uVar168;
                          auVar33._36_4_ = uVar168;
                          auVar33._40_4_ = uVar168;
                          auVar33._44_4_ = uVar168;
                          auVar33._48_4_ = uVar168;
                          auVar33._52_4_ = uVar168;
                          auVar33._56_4_ = uVar168;
                          auVar33._60_4_ = uVar168;
                          auVar126 = vfmadd231ps_avx512f(auVar126,auVar134,auVar33);
                          lVar67 = lVar67 + 0x20;
                          uVar63 = (int)uVar76 - 1;
                          uVar76 = (ulong)uVar63;
                        } while (uVar63 != 0);
                        pauVar47 = pauVar47 + uVar45 * 2 + 2;
                      }
                      if (iVar38 < K) {
                        *pauVar78 = auVar133;
                        pauVar78[1] = auVar132;
                        pauVar78[2] = auVar131;
                        pauVar78[3] = auVar130;
                        pauVar78[4] = auVar129;
                        pauVar78[5] = auVar128;
                        pauVar78[6] = auVar127;
                        pauVar78[7] = auVar126;
                      }
                      else if (iVar61 < 8) {
                        if (iVar61 == 1) {
                          auVar134 = vunpcklps_avx512f(auVar133,auVar132);
                          auVar132 = vunpckhps_avx512f(auVar133,auVar132);
                          auVar133 = vunpcklps_avx512f(auVar131,auVar130);
                          auVar130 = vunpckhps_avx512f(auVar131,auVar130);
                          auVar131 = vunpcklps_avx512f(auVar129,auVar128);
                          auVar128 = vunpckhps_avx512f(auVar129,auVar128);
                          auVar129 = vunpcklps_avx512f(auVar127,auVar126);
                          auVar126 = vunpckhps_avx512f(auVar127,auVar126);
                          auVar127 = vunpcklpd_avx512f(auVar134,auVar133);
                          auVar133 = vunpckhpd_avx512f(auVar134,auVar133);
                          auVar134 = vunpcklpd_avx512f(auVar132,auVar130);
                          auVar130 = vunpckhpd_avx512f(auVar132,auVar130);
                          auVar132 = vunpcklpd_avx512f(auVar131,auVar129);
                          auVar129 = vunpckhpd_avx512f(auVar131,auVar129);
                          auVar131 = vunpcklpd_avx512f(auVar128,auVar126);
                          auVar126 = vunpckhpd_avx512f(auVar128,auVar126);
                          auVar128 = vshuff64x2_avx512f(auVar127,auVar132,0x88);
                          auVar135 = vshuff64x2_avx512f(auVar133,auVar129,0x88);
                          auVar136 = vshuff64x2_avx512f(auVar134,auVar131,0x88);
                          auVar137 = vshuff64x2_avx512f(auVar130,auVar126,0x88);
                          auVar127 = vshuff64x2_avx512f(auVar127,auVar132,0xdd);
                          auVar129 = vshuff64x2_avx512f(auVar133,auVar129,0xdd);
                          auVar131 = vshuff64x2_avx512f(auVar134,auVar131,0xdd);
                          auVar126 = vshuff64x2_avx512f(auVar130,auVar126,0xdd);
                          auVar130 = vshuff64x2_avx512f(auVar128,auVar135,0x88);
                          auVar132 = vshuff64x2_avx512f(auVar136,auVar137,0x88);
                          auVar133 = vshuff64x2_avx512f(auVar127,auVar129,0x88);
                          auVar134 = vshuff64x2_avx512f(auVar131,auVar126,0x88);
                          auVar128 = vshuff64x2_avx512f(auVar128,auVar135,0xdd);
                          auVar135 = vshuff64x2_avx512f(auVar136,auVar137,0xdd);
                          auVar127 = vshuff64x2_avx512f(auVar127,auVar129,0xdd);
                          auVar126 = vshuff64x2_avx512f(auVar131,auVar126,0xdd);
                          *(undefined1 (*) [32])*pauVar69 = auVar130._0_32_;
                          auVar113 = vextractf64x4_avx512f(auVar130,1);
                          *(undefined1 (*) [32])(*pauVar69 + lVar43 * 4) = auVar113;
                          *(undefined1 (*) [32])(*pauVar69 + lVar83 * 4) = auVar132._0_32_;
                          auVar113 = vextractf64x4_avx512f(auVar132,1);
                          *(undefined1 (*) [32])(*pauVar69 + lVar39 * 4) = auVar113;
                          *(undefined1 (*) [32])(*pauVar69 + lVar66 * 4) = auVar133._0_32_;
                          auVar113 = vextractf64x4_avx512f(auVar133,1);
                          *(undefined1 (*) [32])(*pauVar69 + lVar60 * 4) = auVar113;
                          *(undefined1 (*) [32])(*pauVar69 + lVar77 * 4) = auVar134._0_32_;
                          auVar113 = vextractf64x4_avx512f(auVar134,1);
                          *(undefined1 (*) [32])(*pauVar69 + local_208 * 4) = auVar113;
                          *(undefined1 (*) [32])(*pauVar69 + lVar84 * 4) = auVar128._0_32_;
                          auVar113 = vextractf64x4_avx512f(auVar128,1);
                          *(undefined1 (*) [32])(*pauVar69 + local_210 * 4) = auVar113;
                          *(undefined1 (*) [32])(*pauVar69 + local_218 * 4) = auVar135._0_32_;
                          auVar113 = vextractf64x4_avx512f(auVar135,1);
                          *(undefined1 (*) [32])(*pauVar69 + local_220 * 4) = auVar113;
                          *(undefined1 (*) [32])(*pauVar69 + lVar85 * 4) = auVar127._0_32_;
                          auVar113 = vextractf64x4_avx512f(auVar127,1);
                          *(undefined1 (*) [32])(*pauVar69 + local_228 * 4) = auVar113;
                          *(undefined1 (*) [32])(*pauVar69 + local_230 * 4) = auVar126._0_32_;
                          auVar113 = vextractf64x4_avx512f(auVar126,1);
                          *(undefined1 (*) [32])(*pauVar69 + local_238 * 4) = auVar113;
                          pauVar69 = (undefined1 (*) [64])(*pauVar69 + 0x20);
                        }
                        else if (iVar61 == 4) {
                          auVar134 = vinsertf64x4_avx512f(auVar133,auVar132._0_32_,1);
                          auVar135 = vinsertf64x4_avx512f(auVar131,auVar130._0_32_,1);
                          auVar132 = vshuff64x2_avx512f(auVar133,auVar132,0xee);
                          auVar130 = vshuff64x2_avx512f(auVar131,auVar130,0xee);
                          auVar131 = vinsertf64x4_avx512f(auVar129,auVar128._0_32_,1);
                          auVar133 = vinsertf64x4_avx512f(auVar127,auVar126._0_32_,1);
                          auVar128 = vshuff64x2_avx512f(auVar129,auVar128,0xee);
                          auVar126 = vshuff64x2_avx512f(auVar127,auVar126,0xee);
                          auVar127 = vshuff64x2_avx512f(auVar134,auVar135,0x88);
                          auVar129 = vshuff64x2_avx512f(auVar134,auVar135,0xdd);
                          auVar134 = vshuff64x2_avx512f(auVar132,auVar130,0x88);
                          auVar130 = vshuff64x2_avx512f(auVar132,auVar130,0xdd);
                          auVar132 = vshuff64x2_avx512f(auVar131,auVar133,0x88);
                          auVar131 = vshuff64x2_avx512f(auVar131,auVar133,0xdd);
                          auVar133 = vshuff64x2_avx512f(auVar128,auVar126,0x88);
                          auVar126 = vshuff64x2_avx512f(auVar128,auVar126,0xdd);
                          *pauVar69 = auVar127;
                          pauVar69[1] = auVar132;
                          *(undefined1 (*) [64])(*pauVar69 + lVar66 * 4) = auVar129;
                          *(undefined1 (*) [64])(pauVar69[1] + lVar66 * 4) = auVar131;
                          *(undefined1 (*) [64])(*pauVar69 + lVar84 * 4) = auVar134;
                          *(undefined1 (*) [64])(pauVar69[1] + lVar84 * 4) = auVar133;
                          *(undefined1 (*) [64])(*pauVar69 + lVar85 * 4) = auVar130;
                          *(undefined1 (*) [64])(pauVar69[1] + lVar85 * 4) = auVar126;
                          pauVar69 = pauVar69 + 2;
                        }
                      }
                      else if (iVar61 == 8) {
                        auVar134 = vinsertf64x4_avx512f(auVar133,auVar132._0_32_,1);
                        auVar135 = vinsertf64x4_avx512f(auVar131,auVar130._0_32_,1);
                        auVar136 = vinsertf64x4_avx512f(auVar129,auVar128._0_32_,1);
                        auVar137 = vinsertf64x4_avx512f(auVar127,auVar126._0_32_,1);
                        auVar132 = vshuff64x2_avx512f(auVar133,auVar132,0xee);
                        auVar130 = vshuff64x2_avx512f(auVar131,auVar130,0xee);
                        auVar128 = vshuff64x2_avx512f(auVar129,auVar128,0xee);
                        auVar126 = vshuff64x2_avx512f(auVar127,auVar126,0xee);
                        *pauVar69 = auVar134;
                        pauVar69[1] = auVar135;
                        pauVar69[2] = auVar136;
                        pauVar69[3] = auVar137;
                        *(undefined1 (*) [64])(*pauVar69 + lVar84 * 4) = auVar132;
                        *(undefined1 (*) [64])(pauVar69[1] + lVar84 * 4) = auVar130;
                        *(undefined1 (*) [64])(pauVar69[2] + lVar84 * 4) = auVar128;
                        *(undefined1 (*) [64])(pauVar69[3] + lVar84 * 4) = auVar126;
                        pauVar69 = pauVar69 + 4;
                      }
                      else if (iVar61 == 0x10) {
                        *pauVar69 = auVar133;
                        pauVar69[1] = auVar132;
                        pauVar69[2] = auVar131;
                        pauVar69[3] = auVar130;
                        pauVar69[4] = auVar129;
                        pauVar69[5] = auVar128;
                        pauVar69[6] = auVar127;
                        pauVar69[7] = auVar126;
                        pauVar69 = pauVar69 + 8;
                      }
                      pauVar78 = pauVar78 + 8;
                      iVar62 = uVar75 + 0xf;
                      uVar75 = uVar75 + 8;
                    }
                    uVar63 = uVar75 | 3;
                    while ((int)uVar63 < (int)uVar79) {
                      if (iVar59 == 0) {
                        if (pauVar40 == (undefined1 (*) [64])0x0) {
                          auVar126 = ZEXT864(0) << 0x40;
                          auVar127 = ZEXT864(0) << 0x40;
                          auVar128 = ZEXT864(0) << 0x40;
                          auVar129 = ZEXT864(0) << 0x40;
                        }
                        else {
                          auVar126 = *pauVar40;
                          auVar127 = auVar126;
                          auVar128 = auVar126;
                          auVar129 = auVar126;
                        }
                      }
                      else {
                        auVar126 = pauVar78[3];
                        auVar127 = pauVar78[2];
                        auVar128 = pauVar78[1];
                        auVar129 = *pauVar78;
                      }
                      if (0 < iVar56) {
                        lVar67 = 0;
                        uVar76 = uVar65;
                        do {
                          auVar130 = *(undefined1 (*) [64])(*pauVar53 + lVar67 * 4);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar67);
                          auVar131._4_4_ = uVar168;
                          auVar131._0_4_ = uVar168;
                          auVar131._8_4_ = uVar168;
                          auVar131._12_4_ = uVar168;
                          auVar131._16_4_ = uVar168;
                          auVar131._20_4_ = uVar168;
                          auVar131._24_4_ = uVar168;
                          auVar131._28_4_ = uVar168;
                          auVar131._32_4_ = uVar168;
                          auVar131._36_4_ = uVar168;
                          auVar131._40_4_ = uVar168;
                          auVar131._44_4_ = uVar168;
                          auVar131._48_4_ = uVar168;
                          auVar131._52_4_ = uVar168;
                          auVar131._56_4_ = uVar168;
                          auVar131._60_4_ = uVar168;
                          auVar129 = vfmadd231ps_avx512f(auVar129,auVar130,auVar131);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar67 + 4);
                          auVar132._4_4_ = uVar168;
                          auVar132._0_4_ = uVar168;
                          auVar132._8_4_ = uVar168;
                          auVar132._12_4_ = uVar168;
                          auVar132._16_4_ = uVar168;
                          auVar132._20_4_ = uVar168;
                          auVar132._24_4_ = uVar168;
                          auVar132._28_4_ = uVar168;
                          auVar132._32_4_ = uVar168;
                          auVar132._36_4_ = uVar168;
                          auVar132._40_4_ = uVar168;
                          auVar132._44_4_ = uVar168;
                          auVar132._48_4_ = uVar168;
                          auVar132._52_4_ = uVar168;
                          auVar132._56_4_ = uVar168;
                          auVar132._60_4_ = uVar168;
                          auVar128 = vfmadd231ps_avx512f(auVar128,auVar130,auVar132);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar67 + 8);
                          auVar133._4_4_ = uVar168;
                          auVar133._0_4_ = uVar168;
                          auVar133._8_4_ = uVar168;
                          auVar133._12_4_ = uVar168;
                          auVar133._16_4_ = uVar168;
                          auVar133._20_4_ = uVar168;
                          auVar133._24_4_ = uVar168;
                          auVar133._28_4_ = uVar168;
                          auVar133._32_4_ = uVar168;
                          auVar133._36_4_ = uVar168;
                          auVar133._40_4_ = uVar168;
                          auVar133._44_4_ = uVar168;
                          auVar133._48_4_ = uVar168;
                          auVar133._52_4_ = uVar168;
                          auVar133._56_4_ = uVar168;
                          auVar133._60_4_ = uVar168;
                          auVar127 = vfmadd231ps_avx512f(auVar127,auVar130,auVar133);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar67 + 0xc);
                          auVar134._4_4_ = uVar168;
                          auVar134._0_4_ = uVar168;
                          auVar134._8_4_ = uVar168;
                          auVar134._12_4_ = uVar168;
                          auVar134._16_4_ = uVar168;
                          auVar134._20_4_ = uVar168;
                          auVar134._24_4_ = uVar168;
                          auVar134._28_4_ = uVar168;
                          auVar134._32_4_ = uVar168;
                          auVar134._36_4_ = uVar168;
                          auVar134._40_4_ = uVar168;
                          auVar134._44_4_ = uVar168;
                          auVar134._48_4_ = uVar168;
                          auVar134._52_4_ = uVar168;
                          auVar134._56_4_ = uVar168;
                          auVar134._60_4_ = uVar168;
                          auVar126 = vfmadd231ps_avx512f(auVar126,auVar130,auVar134);
                          lVar67 = lVar67 + 0x10;
                          uVar63 = (int)uVar76 - 1;
                          uVar76 = (ulong)uVar63;
                        } while (uVar63 != 0);
                        pauVar47 = pauVar47 + uVar45 + 1;
                      }
                      if (iVar38 < K) {
                        *pauVar78 = auVar129;
                        pauVar78[1] = auVar128;
                        pauVar78[2] = auVar127;
                        pauVar78[3] = auVar126;
                      }
                      else if (iVar61 < 8) {
                        if (iVar61 == 1) {
                          auVar105 = vextractf32x4_avx512f(auVar129,2);
                          auVar106 = vextractf32x4_avx512f(auVar128,2);
                          auVar107 = vextractf32x4_avx512f(auVar127,2);
                          auVar108 = vextractf32x4_avx512f(auVar126,2);
                          auVar109 = vextractf32x4_avx512f(auVar129,3);
                          auVar110 = vextractf32x4_avx512f(auVar128,3);
                          auVar91 = vextractf32x4_avx512f(auVar127,3);
                          auVar92 = vextractf32x4_avx512f(auVar126,3);
                          auVar101 = vunpcklps_avx512vl(auVar129._0_16_,auVar128._0_16_);
                          auVar102 = vunpcklps_avx512vl(auVar127._0_16_,auVar126._0_16_);
                          auVar99 = vunpckhps_avx(auVar129._0_16_,auVar128._0_16_);
                          auVar100 = vunpckhps_avx(auVar127._0_16_,auVar126._0_16_);
                          auVar93 = vunpcklpd_avx512vl(auVar101,auVar102);
                          auVar94 = vunpckhpd_avx512vl(auVar101,auVar102);
                          auVar95 = vunpcklpd_avx512vl(auVar99,auVar100);
                          auVar99 = vunpckhpd_avx(auVar99,auVar100);
                          auVar102 = vunpcklps_avx(auVar129._16_16_,auVar128._16_16_);
                          auVar103 = vunpcklps_avx512vl(auVar127._16_16_,auVar126._16_16_);
                          auVar100 = vunpckhps_avx(auVar129._16_16_,auVar128._16_16_);
                          auVar101 = vunpckhps_avx(auVar127._16_16_,auVar126._16_16_);
                          auVar96 = vunpcklpd_avx512vl(auVar102,auVar103);
                          auVar97 = vunpckhpd_avx512vl(auVar102,auVar103);
                          auVar104 = vunpcklpd_avx(auVar100,auVar101);
                          auVar100 = vunpckhpd_avx(auVar100,auVar101);
                          auVar103 = vunpcklps_avx(auVar105,auVar106);
                          auVar98 = vunpcklps_avx512vl(auVar107,auVar108);
                          auVar101 = vunpckhps_avx(auVar105,auVar106);
                          auVar102 = vunpckhps_avx(auVar107,auVar108);
                          auVar107 = vunpcklpd_avx512vl(auVar103,auVar98);
                          auVar108 = vunpckhpd_avx512vl(auVar103,auVar98);
                          auVar105 = vunpcklpd_avx(auVar101,auVar102);
                          auVar101 = vunpckhpd_avx(auVar101,auVar102);
                          auVar106 = vunpcklps_avx(auVar109,auVar110);
                          auVar98 = vunpcklps_avx512vl(auVar91,auVar92);
                          auVar102 = vunpckhps_avx(auVar109,auVar110);
                          auVar103 = vunpckhps_avx(auVar91,auVar92);
                          auVar109 = vunpcklpd_avx512vl(auVar106,auVar98);
                          auVar110 = vunpckhpd_avx512vl(auVar106,auVar98);
                          auVar106 = vunpcklpd_avx(auVar102,auVar103);
                          auVar102 = vunpckhpd_avx(auVar102,auVar103);
                          *(undefined1 (*) [16])*pauVar69 = auVar93;
                          *(undefined1 (*) [16])(*pauVar69 + lVar43 * 4) = auVar94;
                          *(undefined1 (*) [16])(*pauVar69 + lVar83 * 4) = auVar95;
                          *(undefined1 (*) [16])(*pauVar69 + lVar39 * 4) = auVar99;
                          *(undefined1 (*) [16])(*pauVar69 + lVar66 * 4) = auVar96;
                          *(undefined1 (*) [16])(*pauVar69 + lVar60 * 4) = auVar97;
                          *(undefined1 (*) [16])(*pauVar69 + lVar77 * 4) = auVar104;
                          *(undefined1 (*) [16])(*pauVar69 + local_208 * 4) = auVar100;
                          *(undefined1 (*) [16])(*pauVar69 + lVar84 * 4) = auVar107;
                          *(undefined1 (*) [16])(*pauVar69 + local_210 * 4) = auVar108;
                          *(undefined1 (*) [16])(*pauVar69 + local_218 * 4) = auVar105;
                          *(undefined1 (*) [16])(*pauVar69 + local_220 * 4) = auVar101;
                          *(undefined1 (*) [16])(*pauVar69 + lVar85 * 4) = auVar109;
                          *(undefined1 (*) [16])(*pauVar69 + local_228 * 4) = auVar110;
                          *(undefined1 (*) [16])(*pauVar69 + local_230 * 4) = auVar106;
                          *(undefined1 (*) [16])(*pauVar69 + local_238 * 4) = auVar102;
                          pauVar69 = (undefined1 (*) [64])(*pauVar69 + 0x10);
                        }
                        else if (iVar61 == 4) {
                          auVar130 = vinsertf64x4_avx512f(auVar129,auVar128._0_32_,1);
                          auVar131 = vinsertf64x4_avx512f(auVar127,auVar126._0_32_,1);
                          auVar128 = vshuff64x2_avx512f(auVar129,auVar128,0xee);
                          auVar126 = vshuff64x2_avx512f(auVar127,auVar126,0xee);
                          auVar127 = vshuff64x2_avx512f(auVar130,auVar131,0x88);
                          auVar129 = vshuff64x2_avx512f(auVar130,auVar131,0xdd);
                          auVar130 = vshuff64x2_avx512f(auVar128,auVar126,0x88);
                          auVar126 = vshuff64x2_avx512f(auVar128,auVar126,0xdd);
                          *pauVar69 = auVar127;
                          *(undefined1 (*) [64])(*pauVar69 + lVar66 * 4) = auVar129;
                          *(undefined1 (*) [64])(*pauVar69 + lVar84 * 4) = auVar130;
                          *(undefined1 (*) [64])(*pauVar69 + lVar85 * 4) = auVar126;
                          pauVar69 = pauVar69 + 1;
                        }
                      }
                      else if (iVar61 == 8) {
                        auVar130 = vinsertf64x4_avx512f(auVar129,auVar128._0_32_,1);
                        auVar131 = vinsertf64x4_avx512f(auVar127,auVar126._0_32_,1);
                        auVar128 = vshuff64x2_avx512f(auVar129,auVar128,0xee);
                        auVar126 = vshuff64x2_avx512f(auVar127,auVar126,0xee);
                        *pauVar69 = auVar130;
                        pauVar69[1] = auVar131;
                        *(undefined1 (*) [64])(*pauVar69 + lVar84 * 4) = auVar128;
                        *(undefined1 (*) [64])(pauVar69[1] + lVar84 * 4) = auVar126;
                        pauVar69 = pauVar69 + 2;
                      }
                      else if (iVar61 == 0x10) {
                        *pauVar69 = auVar129;
                        pauVar69[1] = auVar128;
                        pauVar69[2] = auVar127;
                        pauVar69[3] = auVar126;
                        pauVar69 = pauVar69 + 4;
                      }
                      pauVar78 = pauVar78 + 4;
                      uVar63 = uVar75 + 7;
                      uVar75 = uVar75 + 4;
                    }
                    uVar63 = uVar75 | 1;
                    while ((int)uVar63 < (int)uVar79) {
                      if (iVar59 == 0) {
                        if (pauVar40 == (undefined1 (*) [64])0x0) {
                          auVar126 = ZEXT864(0) << 0x40;
                          auVar127 = ZEXT864(0) << 0x40;
                        }
                        else {
                          auVar126 = *pauVar40;
                          auVar127 = auVar126;
                        }
                      }
                      else {
                        auVar126 = pauVar78[1];
                        auVar127 = *pauVar78;
                      }
                      if (0 < iVar56) {
                        lVar67 = 0;
                        uVar76 = uVar65;
                        do {
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar67);
                          auVar128._4_4_ = uVar168;
                          auVar128._0_4_ = uVar168;
                          auVar128._8_4_ = uVar168;
                          auVar128._12_4_ = uVar168;
                          auVar128._16_4_ = uVar168;
                          auVar128._20_4_ = uVar168;
                          auVar128._24_4_ = uVar168;
                          auVar128._28_4_ = uVar168;
                          auVar128._32_4_ = uVar168;
                          auVar128._36_4_ = uVar168;
                          auVar128._40_4_ = uVar168;
                          auVar128._44_4_ = uVar168;
                          auVar128._48_4_ = uVar168;
                          auVar128._52_4_ = uVar168;
                          auVar128._56_4_ = uVar168;
                          auVar128._60_4_ = uVar168;
                          auVar127 = vfmadd231ps_avx512f(auVar127,*(undefined1 (*) [64])
                                                                   (*pauVar53 + lVar67 * 8),auVar128
                                                        );
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar67 + 4);
                          auVar129._4_4_ = uVar168;
                          auVar129._0_4_ = uVar168;
                          auVar129._8_4_ = uVar168;
                          auVar129._12_4_ = uVar168;
                          auVar129._16_4_ = uVar168;
                          auVar129._20_4_ = uVar168;
                          auVar129._24_4_ = uVar168;
                          auVar129._28_4_ = uVar168;
                          auVar129._32_4_ = uVar168;
                          auVar129._36_4_ = uVar168;
                          auVar129._40_4_ = uVar168;
                          auVar129._44_4_ = uVar168;
                          auVar129._48_4_ = uVar168;
                          auVar129._52_4_ = uVar168;
                          auVar129._56_4_ = uVar168;
                          auVar129._60_4_ = uVar168;
                          auVar126 = vfmadd231ps_avx512f(auVar126,*(undefined1 (*) [64])
                                                                   (*pauVar53 + lVar67 * 8),auVar129
                                                        );
                          lVar67 = lVar67 + 8;
                          uVar63 = (int)uVar76 - 1;
                          uVar76 = (ulong)uVar63;
                        } while (uVar63 != 0);
                        pauVar47 = (undefined1 (*) [16])(*pauVar47 + uVar45 * 8 + 8);
                      }
                      if (iVar38 < K) {
                        *pauVar78 = auVar127;
                        pauVar78[1] = auVar126;
                      }
                      else if (iVar61 < 8) {
                        auVar100 = auVar127._0_16_;
                        auVar99 = auVar126._0_16_;
                        if (iVar61 == 1) {
                          *(int *)*pauVar69 = auVar127._0_4_;
                          uVar168 = vextractps_avx(auVar100,1);
                          *(undefined4 *)(*pauVar69 + lVar43 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar100,2);
                          *(undefined4 *)(*pauVar69 + lVar83 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar100,3);
                          *(undefined4 *)(*pauVar69 + local_1c0 * 4) = uVar168;
                          auVar100 = auVar127._16_16_;
                          *(int *)(*pauVar69 + lVar66 * 4) = auVar127._16_4_;
                          uVar168 = vextractps_avx(auVar100,1);
                          *(undefined4 *)(*pauVar69 + local_1c8 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar100,2);
                          *(undefined4 *)(*pauVar69 + local_80 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar100,3);
                          *(undefined4 *)(*pauVar69 + local_88 * 4) = uVar168;
                          auVar100 = vextracti32x4_avx512f(auVar127,2);
                          *(int *)(*pauVar69 + lVar84 * 4) = auVar100._0_4_;
                          uVar168 = vextractps_avx(auVar100,1);
                          *(undefined4 *)(*pauVar69 + local_90 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar100,2);
                          *(undefined4 *)(*pauVar69 + local_98 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar100,3);
                          *(undefined4 *)(*pauVar69 + local_a0 * 4) = uVar168;
                          auVar100 = vextracti32x4_avx512f(auVar127,3);
                          *(int *)(*pauVar69 + local_a8 * 4) = auVar100._0_4_;
                          uVar168 = vextractps_avx(auVar100,1);
                          *(undefined4 *)(*pauVar69 + local_b0 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar100,2);
                          *(undefined4 *)(*pauVar69 + local_1b8 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar100,3);
                          *(undefined4 *)(*pauVar69 + local_b8 * 4) = uVar168;
                          *(int *)(*pauVar69 + 4) = auVar126._0_4_;
                          uVar168 = vextractps_avx(auVar99,1);
                          *(undefined4 *)(*pauVar69 + local_1b0 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar99,2);
                          *(undefined4 *)(*pauVar69 + local_c0 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar99,3);
                          *(undefined4 *)(*pauVar69 + local_c8 * 4) = uVar168;
                          auVar99 = auVar126._16_16_;
                          *(int *)(*pauVar69 + local_d0 * 4) = auVar126._16_4_;
                          uVar168 = vextractps_avx(auVar99,1);
                          *(undefined4 *)(*pauVar69 + local_d8 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar99,2);
                          *(undefined4 *)(*pauVar69 + local_e0 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar99,3);
                          *(undefined4 *)(*pauVar69 + local_e8 * 4) = uVar168;
                          auVar99 = vextracti32x4_avx512f(auVar126,2);
                          *(int *)(*pauVar69 + local_f0 * 4) = auVar99._0_4_;
                          uVar168 = vextractps_avx(auVar99,1);
                          *(undefined4 *)(*pauVar69 + local_f8 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar99,2);
                          *(undefined4 *)(*pauVar69 + local_100 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar99,3);
                          *(undefined4 *)(*pauVar69 + local_108 * 4) = uVar168;
                          auVar99 = vextracti32x4_avx512f(auVar126,3);
                          *(int *)(*pauVar69 + local_110 * 4) = auVar99._0_4_;
                          uVar168 = vextractps_avx(auVar99,1);
                          *(undefined4 *)(*pauVar69 + local_118 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar99,2);
                          *(undefined4 *)(*pauVar69 + local_120 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar99,3);
                          *(undefined4 *)(*pauVar69 + local_128 * 4) = uVar168;
                          pauVar69 = (undefined1 (*) [64])(*pauVar69 + 8);
                        }
                        else if (iVar61 == 4) {
                          *(undefined1 (*) [16])(*pauVar69 + 0x10) = auVar99;
                          *(undefined1 (*) [16])*pauVar69 = auVar100;
                          auVar99 = vextractf32x4_avx512f(auVar126,1);
                          *(undefined1 (*) [16])(*pauVar69 + lVar66 * 4 + 8) = auVar99;
                          auVar99 = vextractf32x4_avx512f(auVar127,1);
                          *(undefined1 (*) [16])(*pauVar69 + lVar66 * 4) = auVar99;
                          auVar99 = vextractf32x4_avx512f(auVar126,2);
                          *(undefined1 (*) [16])(*pauVar69 + lVar84 * 4 + 8) = auVar99;
                          auVar99 = vextractf32x4_avx512f(auVar127,2);
                          *(undefined1 (*) [16])(*pauVar69 + lVar84 * 4) = auVar99;
                          auVar99 = vextractf32x4_avx512f(auVar126,3);
                          *(undefined1 (*) [16])(*pauVar69 + lVar85 * 4 + 8) = auVar99;
                          auVar99 = vextractf32x4_avx512f(auVar127,3);
                          *(undefined1 (*) [16])(*pauVar69 + lVar85 * 4) = auVar99;
                          pauVar69 = (undefined1 (*) [64])(*pauVar69 + 0x20);
                        }
                      }
                      else if (iVar61 == 8) {
                        auVar128 = vinsertf64x4_avx512f(auVar127,auVar126._0_32_,1);
                        auVar126 = vshuff64x2_avx512f(auVar127,auVar126,0xee);
                        *pauVar69 = auVar128;
                        *(undefined1 (*) [64])(*pauVar69 + lVar84 * 4) = auVar126;
                        pauVar69 = pauVar69 + 1;
                      }
                      else if (iVar61 == 0x10) {
                        *pauVar69 = auVar127;
                        pauVar69[1] = auVar126;
                        pauVar69 = pauVar69 + 2;
                      }
                      pauVar78 = pauVar78 + 2;
                      uVar63 = uVar75 + 3;
                      uVar75 = uVar75 + 2;
                    }
                    if ((int)uVar75 < (int)uVar79) {
                      do {
                        if (iVar59 == 0) {
                          if (pauVar40 == (undefined1 (*) [64])0x0) {
                            auVar126 = ZEXT864(0) << 0x40;
                          }
                          else {
                            auVar126 = *pauVar40;
                          }
                        }
                        else {
                          auVar126 = *pauVar78;
                        }
                        if (0 < iVar56) {
                          lVar67 = 0;
                          pauVar70 = pauVar53;
                          do {
                            uVar168 = *(undefined4 *)(*pauVar47 + lVar67 * 4);
                            auVar127._4_4_ = uVar168;
                            auVar127._0_4_ = uVar168;
                            auVar127._8_4_ = uVar168;
                            auVar127._12_4_ = uVar168;
                            auVar127._16_4_ = uVar168;
                            auVar127._20_4_ = uVar168;
                            auVar127._24_4_ = uVar168;
                            auVar127._28_4_ = uVar168;
                            auVar127._32_4_ = uVar168;
                            auVar127._36_4_ = uVar168;
                            auVar127._40_4_ = uVar168;
                            auVar127._44_4_ = uVar168;
                            auVar127._48_4_ = uVar168;
                            auVar127._52_4_ = uVar168;
                            auVar127._56_4_ = uVar168;
                            auVar127._60_4_ = uVar168;
                            auVar126 = vfmadd231ps_avx512f(auVar126,*pauVar70,auVar127);
                            pauVar70 = pauVar70 + 1;
                            lVar67 = lVar67 + 1;
                          } while (uVar64 != (uint)lVar67);
                          pauVar47 = (undefined1 (*) [16])(*pauVar47 + uVar45 * 4 + 4);
                        }
                        if (iVar38 < K) {
                          *pauVar78 = auVar126;
                        }
                        else if (iVar61 < 8) {
                          auVar99 = auVar126._0_16_;
                          if (iVar61 == 1) {
                            *(int *)*pauVar69 = auVar126._0_4_;
                            uVar168 = vextractps_avx(auVar99,1);
                            *(undefined4 *)(*pauVar69 + lVar43 * 4) = uVar168;
                            uVar168 = vextractps_avx(auVar99,2);
                            *(undefined4 *)(*pauVar69 + lVar83 * 4) = uVar168;
                            uVar168 = vextractps_avx(auVar99,3);
                            *(undefined4 *)(*pauVar69 + lVar39 * 4) = uVar168;
                            auVar99 = auVar126._16_16_;
                            *(int *)(*pauVar69 + lVar66 * 4) = auVar126._16_4_;
                            uVar168 = vextractps_avx(auVar99,1);
                            *(undefined4 *)(*pauVar69 + lVar60 * 4) = uVar168;
                            uVar168 = vextractps_avx(auVar99,2);
                            *(undefined4 *)(*pauVar69 + lVar77 * 4) = uVar168;
                            uVar168 = vextractps_avx(auVar99,3);
                            *(undefined4 *)(*pauVar69 + local_208 * 4) = uVar168;
                            auVar99 = vextracti32x4_avx512f(auVar126,2);
                            *(int *)(*pauVar69 + lVar84 * 4) = auVar99._0_4_;
                            uVar168 = vextractps_avx(auVar99,1);
                            *(undefined4 *)(*pauVar69 + local_210 * 4) = uVar168;
                            uVar168 = vextractps_avx(auVar99,2);
                            *(undefined4 *)(*pauVar69 + local_218 * 4) = uVar168;
                            uVar168 = vextractps_avx(auVar99,3);
                            *(undefined4 *)(*pauVar69 + local_220 * 4) = uVar168;
                            auVar99 = vextracti32x4_avx512f(auVar126,3);
                            *(int *)(*pauVar69 + lVar85 * 4) = auVar99._0_4_;
                            uVar168 = vextractps_avx(auVar99,1);
                            *(undefined4 *)(*pauVar69 + local_228 * 4) = uVar168;
                            uVar168 = vextractps_avx(auVar99,2);
                            *(undefined4 *)(*pauVar69 + local_230 * 4) = uVar168;
                            uVar168 = vextractps_avx(auVar99,3);
                            *(undefined4 *)(*pauVar69 + local_238 * 4) = uVar168;
                            pauVar69 = (undefined1 (*) [64])(*pauVar69 + 4);
                          }
                          else if (iVar61 == 4) {
                            *(undefined1 (*) [16])*pauVar69 = auVar99;
                            auVar99 = vextractf32x4_avx512f(auVar126,1);
                            *(undefined1 (*) [16])(*pauVar69 + lVar66 * 4) = auVar99;
                            auVar99 = vextractf32x4_avx512f(auVar126,2);
                            *(undefined1 (*) [16])(*pauVar69 + lVar84 * 4) = auVar99;
                            auVar99 = vextractf32x4_avx512f(auVar126,3);
                            *(undefined1 (*) [16])(*pauVar69 + lVar85 * 4) = auVar99;
                            pauVar69 = (undefined1 (*) [64])(*pauVar69 + 0x10);
                          }
                        }
                        else if (iVar61 == 8) {
                          *(undefined1 (*) [32])*pauVar69 = auVar126._0_32_;
                          auVar113 = vextractf64x4_avx512f(auVar126,1);
                          *(undefined1 (*) [32])(*pauVar69 + lVar84 * 4) = auVar113;
                          pauVar69 = (undefined1 (*) [64])(*pauVar69 + 0x20);
                        }
                        else if (iVar61 == 0x10) {
                          *pauVar69 = auVar126;
                          pauVar69 = pauVar69 + 1;
                        }
                        pauVar78 = pauVar78 + 1;
                        uVar75 = uVar75 + 1;
                      } while (uVar75 != uVar79);
                    }
                    pauVar53 = (undefined1 (*) [64])(*pauVar53 + local_130);
                    uVar76 = uVar46 + 0x10;
                    uVar68 = uVar46 + 0x1f;
                    uVar46 = uVar76;
                  } while (uVar68 < uVar48);
                }
                if ((int)((uint)uVar76 | 7) < (int)uVar48) {
                  local_1c0 = (long)(iVar61 * iVar72);
                  lVar60 = (long)(iVar73 * 2);
                  lVar77 = (long)(sVar1 * 0x300000000) >> 0x20;
                  lVar85 = (long)(iVar73 * 4);
                  lVar43 = (long)(sVar1 * 0x500000000) >> 0x20;
                  lVar84 = (long)(sVar1 * 0x600000000) >> 0x20;
                  lVar83 = (long)(sVar1 * 0x700000000) >> 0x20;
                  local_208 = (long)(iVar73 * 6);
                  local_210 = (long)(iVar73 * 7);
                  local_218 = (long)(iVar73 * 2 + 1);
                  local_220 = (long)(iVar73 * 3 + 1);
                  local_228 = (long)(iVar73 * 4 + 1);
                  local_230 = (long)(iVar73 * 5 + 1);
                  local_238 = (long)(iVar73 * 6 + 1);
                  local_1b0 = (long)(iVar73 * 7 + 1);
                  uVar45 = (ulong)(iVar56 - 1);
                  local_1c8 = (long)(iVar56 * 8) * 4;
                  lVar39 = (long)iVar73;
                  uVar76 = uVar76 & 0xffffffff;
                  do {
                    local_1b8 = uVar76;
                    pauVar69 = (undefined1 (*) [64])
                               ((long)local_240->data + local_1b8 * 4 + local_200 * 4);
                    if (pauVar40 == (undefined1 (*) [64])0x0) {
                      pauVar69 = pauVar40;
                    }
                    pauVar40 = pauVar69;
                    uVar64 = 0;
                    pauVar41 = (undefined1 (*) [32])
                               ((long)local_248->data +
                               local_1c0 * 4 + (local_1b8 + local_200) * lVar39 * 4);
                    pauVar47 = pauVar42;
                    if (0xb < (int)uVar79) {
                      uVar75 = 0;
                      do {
                        if (iVar59 == 0) {
                          if (pauVar40 == (undefined1 (*) [64])0x0) {
                            auVar126 = ZEXT864(0) << 0x40;
                            auVar127 = ZEXT864(0) << 0x40;
                            auVar128 = ZEXT864(0) << 0x40;
                            auVar129 = ZEXT864(0) << 0x40;
                            auVar130 = ZEXT864(0) << 0x40;
                            auVar131 = ZEXT864(0) << 0x40;
                            auVar132 = ZEXT864(0) << 0x40;
                            auVar133 = ZEXT864(0) << 0x40;
                            auVar134 = ZEXT864(0) << 0x40;
                            auVar135 = ZEXT864(0) << 0x40;
                            auVar136 = ZEXT864(0) << 0x40;
                            auVar137 = ZEXT864(0) << 0x40;
                          }
                          else {
                            auVar113 = *(undefined1 (*) [32])*pauVar40;
                            auVar126 = ZEXT3264(auVar113);
                            auVar127 = ZEXT3264(auVar113);
                            auVar128 = ZEXT3264(auVar113);
                            auVar129 = ZEXT3264(auVar113);
                            auVar130 = ZEXT3264(auVar113);
                            auVar131 = ZEXT3264(auVar113);
                            auVar132 = ZEXT3264(auVar113);
                            auVar133 = ZEXT3264(auVar113);
                            auVar134 = ZEXT3264(auVar113);
                            auVar135 = ZEXT3264(auVar113);
                            auVar136 = ZEXT3264(auVar113);
                            auVar137 = ZEXT3264(auVar113);
                          }
                        }
                        else {
                          auVar137 = ZEXT3264(*(undefined1 (*) [32])*pauVar78);
                          auVar136 = ZEXT3264(*(undefined1 (*) [32])(*pauVar78 + 0x20));
                          auVar135 = ZEXT3264(*(undefined1 (*) [32])pauVar78[1]);
                          auVar134 = ZEXT3264(*(undefined1 (*) [32])(pauVar78[1] + 0x20));
                          auVar133 = ZEXT3264(*(undefined1 (*) [32])pauVar78[2]);
                          auVar132 = ZEXT3264(*(undefined1 (*) [32])(pauVar78[2] + 0x20));
                          auVar131 = ZEXT3264(*(undefined1 (*) [32])pauVar78[3]);
                          auVar130 = ZEXT3264(*(undefined1 (*) [32])(pauVar78[3] + 0x20));
                          auVar129 = ZEXT3264(*(undefined1 (*) [32])pauVar78[4]);
                          auVar128 = ZEXT3264(*(undefined1 (*) [32])(pauVar78[4] + 0x20));
                          auVar127 = ZEXT3264(*(undefined1 (*) [32])pauVar78[5]);
                          auVar126 = ZEXT3264(*(undefined1 (*) [32])(pauVar78[5] + 0x20));
                        }
                        auVar120 = auVar130._0_32_;
                        auVar119 = auVar131._0_32_;
                        auVar118 = auVar132._0_32_;
                        auVar117 = auVar133._0_32_;
                        auVar116 = auVar134._0_32_;
                        auVar115 = auVar135._0_32_;
                        auVar114 = auVar136._0_32_;
                        auVar113 = auVar137._0_32_;
                        auVar124 = auVar126._0_32_;
                        auVar122 = auVar128._0_32_;
                        auVar123 = auVar127._0_32_;
                        auVar121 = auVar129._0_32_;
                        uVar76 = uVar65;
                        pauVar69 = pauVar53;
                        pauVar50 = pauVar47;
                        if (0 < iVar56) {
                          do {
                            auVar124 = *(undefined1 (*) [32])*pauVar69;
                            uVar168 = *(undefined4 *)*pauVar50;
                            auVar113._4_4_ = uVar168;
                            auVar113._0_4_ = uVar168;
                            auVar113._8_4_ = uVar168;
                            auVar113._12_4_ = uVar168;
                            auVar113._16_4_ = uVar168;
                            auVar113._20_4_ = uVar168;
                            auVar113._24_4_ = uVar168;
                            auVar113._28_4_ = uVar168;
                            auVar113 = vfmadd231ps_avx512vl(auVar137._0_32_,auVar124,auVar113);
                            auVar137 = ZEXT3264(auVar113);
                            uVar168 = *(undefined4 *)(*pauVar50 + 4);
                            auVar114._4_4_ = uVar168;
                            auVar114._0_4_ = uVar168;
                            auVar114._8_4_ = uVar168;
                            auVar114._12_4_ = uVar168;
                            auVar114._16_4_ = uVar168;
                            auVar114._20_4_ = uVar168;
                            auVar114._24_4_ = uVar168;
                            auVar114._28_4_ = uVar168;
                            auVar114 = vfmadd231ps_avx512vl(auVar136._0_32_,auVar124,auVar114);
                            auVar136 = ZEXT3264(auVar114);
                            uVar168 = *(undefined4 *)(*pauVar50 + 8);
                            auVar115._4_4_ = uVar168;
                            auVar115._0_4_ = uVar168;
                            auVar115._8_4_ = uVar168;
                            auVar115._12_4_ = uVar168;
                            auVar115._16_4_ = uVar168;
                            auVar115._20_4_ = uVar168;
                            auVar115._24_4_ = uVar168;
                            auVar115._28_4_ = uVar168;
                            auVar115 = vfmadd231ps_avx512vl(auVar135._0_32_,auVar124,auVar115);
                            auVar135 = ZEXT3264(auVar115);
                            uVar168 = *(undefined4 *)(*pauVar50 + 0xc);
                            auVar116._4_4_ = uVar168;
                            auVar116._0_4_ = uVar168;
                            auVar116._8_4_ = uVar168;
                            auVar116._12_4_ = uVar168;
                            auVar116._16_4_ = uVar168;
                            auVar116._20_4_ = uVar168;
                            auVar116._24_4_ = uVar168;
                            auVar116._28_4_ = uVar168;
                            auVar116 = vfmadd231ps_avx512vl(auVar134._0_32_,auVar124,auVar116);
                            auVar134 = ZEXT3264(auVar116);
                            uVar168 = *(undefined4 *)pauVar50[1];
                            auVar117._4_4_ = uVar168;
                            auVar117._0_4_ = uVar168;
                            auVar117._8_4_ = uVar168;
                            auVar117._12_4_ = uVar168;
                            auVar117._16_4_ = uVar168;
                            auVar117._20_4_ = uVar168;
                            auVar117._24_4_ = uVar168;
                            auVar117._28_4_ = uVar168;
                            auVar117 = vfmadd231ps_avx512vl(auVar133._0_32_,auVar124,auVar117);
                            auVar133 = ZEXT3264(auVar117);
                            uVar168 = *(undefined4 *)(pauVar50[1] + 4);
                            auVar118._4_4_ = uVar168;
                            auVar118._0_4_ = uVar168;
                            auVar118._8_4_ = uVar168;
                            auVar118._12_4_ = uVar168;
                            auVar118._16_4_ = uVar168;
                            auVar118._20_4_ = uVar168;
                            auVar118._24_4_ = uVar168;
                            auVar118._28_4_ = uVar168;
                            auVar118 = vfmadd231ps_avx512vl(auVar132._0_32_,auVar124,auVar118);
                            auVar132 = ZEXT3264(auVar118);
                            uVar168 = *(undefined4 *)(pauVar50[1] + 8);
                            auVar119._4_4_ = uVar168;
                            auVar119._0_4_ = uVar168;
                            auVar119._8_4_ = uVar168;
                            auVar119._12_4_ = uVar168;
                            auVar119._16_4_ = uVar168;
                            auVar119._20_4_ = uVar168;
                            auVar119._24_4_ = uVar168;
                            auVar119._28_4_ = uVar168;
                            auVar119 = vfmadd231ps_avx512vl(auVar131._0_32_,auVar124,auVar119);
                            auVar131 = ZEXT3264(auVar119);
                            uVar168 = *(undefined4 *)(pauVar50[1] + 0xc);
                            auVar120._4_4_ = uVar168;
                            auVar120._0_4_ = uVar168;
                            auVar120._8_4_ = uVar168;
                            auVar120._12_4_ = uVar168;
                            auVar120._16_4_ = uVar168;
                            auVar120._20_4_ = uVar168;
                            auVar120._24_4_ = uVar168;
                            auVar120._28_4_ = uVar168;
                            auVar120 = vfmadd231ps_avx512vl(auVar130._0_32_,auVar124,auVar120);
                            auVar130 = ZEXT3264(auVar120);
                            uVar168 = *(undefined4 *)pauVar50[2];
                            auVar121._4_4_ = uVar168;
                            auVar121._0_4_ = uVar168;
                            auVar121._8_4_ = uVar168;
                            auVar121._12_4_ = uVar168;
                            auVar121._16_4_ = uVar168;
                            auVar121._20_4_ = uVar168;
                            auVar121._24_4_ = uVar168;
                            auVar121._28_4_ = uVar168;
                            auVar121 = vfmadd231ps_avx512vl(auVar129._0_32_,auVar124,auVar121);
                            auVar129 = ZEXT3264(auVar121);
                            uVar168 = *(undefined4 *)(pauVar50[2] + 4);
                            auVar123._4_4_ = uVar168;
                            auVar123._0_4_ = uVar168;
                            auVar123._8_4_ = uVar168;
                            auVar123._12_4_ = uVar168;
                            auVar123._16_4_ = uVar168;
                            auVar123._20_4_ = uVar168;
                            auVar123._24_4_ = uVar168;
                            auVar123._28_4_ = uVar168;
                            auVar122 = vfmadd231ps_avx512vl(auVar128._0_32_,auVar124,auVar123);
                            auVar128 = ZEXT3264(auVar122);
                            uVar168 = *(undefined4 *)(pauVar50[2] + 8);
                            auVar125._4_4_ = uVar168;
                            auVar125._0_4_ = uVar168;
                            auVar125._8_4_ = uVar168;
                            auVar125._12_4_ = uVar168;
                            auVar125._16_4_ = uVar168;
                            auVar125._20_4_ = uVar168;
                            auVar125._24_4_ = uVar168;
                            auVar125._28_4_ = uVar168;
                            auVar123 = vfmadd231ps_avx512vl(auVar127._0_32_,auVar124,auVar125);
                            auVar127 = ZEXT3264(auVar123);
                            uVar168 = *(undefined4 *)(pauVar50[2] + 0xc);
                            auVar111._4_4_ = uVar168;
                            auVar111._0_4_ = uVar168;
                            auVar111._8_4_ = uVar168;
                            auVar111._12_4_ = uVar168;
                            auVar111._16_4_ = uVar168;
                            auVar111._20_4_ = uVar168;
                            auVar111._24_4_ = uVar168;
                            auVar111._28_4_ = uVar168;
                            auVar124 = vfmadd231ps_avx512vl(auVar126._0_32_,auVar124,auVar111);
                            auVar126 = ZEXT3264(auVar124);
                            uVar64 = (int)uVar76 - 1;
                            uVar76 = (ulong)uVar64;
                            pauVar69 = (undefined1 (*) [64])(*pauVar69 + 0x20);
                            pauVar50 = pauVar50 + 3;
                          } while (uVar64 != 0);
                          pauVar47 = pauVar47 + uVar45 * 3 + 3;
                        }
                        if (iVar38 < K) {
                          *(undefined1 (*) [32])*pauVar78 = auVar113;
                          *(undefined1 (*) [32])(*pauVar78 + 0x20) = auVar114;
                          *(undefined1 (*) [32])pauVar78[1] = auVar115;
                          *(undefined1 (*) [32])(pauVar78[1] + 0x20) = auVar116;
                          *(undefined1 (*) [32])pauVar78[2] = auVar117;
                          *(undefined1 (*) [32])(pauVar78[2] + 0x20) = auVar118;
                          *(undefined1 (*) [32])pauVar78[3] = auVar119;
                          *(undefined1 (*) [32])(pauVar78[3] + 0x20) = auVar120;
                          *(undefined1 (*) [32])pauVar78[4] = auVar121;
                          *(undefined1 (*) [32])(pauVar78[4] + 0x20) = auVar122;
                          *(undefined1 (*) [32])pauVar78[5] = auVar123;
                          *(undefined1 (*) [32])(pauVar78[5] + 0x20) = auVar124;
                        }
                        else {
                          auVar100 = auVar122._0_16_;
                          auVar99 = auVar124._0_16_;
                          if (iVar61 == 1) {
                            auVar125 = vunpcklps_avx(auVar113,auVar114);
                            auVar114 = vunpckhps_avx(auVar113,auVar114);
                            auVar113 = vunpcklps_avx(auVar115,auVar116);
                            auVar115 = vunpckhps_avx(auVar115,auVar116);
                            auVar111 = vunpcklps_avx(auVar117,auVar118);
                            auVar116 = vunpckhps_avx(auVar117,auVar118);
                            auVar112 = vunpcklps_avx(auVar119,auVar120);
                            auVar117 = vunpckhps_avx(auVar119,auVar120);
                            auVar118 = vunpcklpd_avx(auVar125,auVar113);
                            auVar113 = vunpckhpd_avx(auVar125,auVar113);
                            auVar119 = vunpcklpd_avx(auVar114,auVar115);
                            auVar114 = vunpckhpd_avx(auVar114,auVar115);
                            auVar120 = vunpcklpd_avx(auVar111,auVar112);
                            auVar115 = vunpckhpd_avx(auVar111,auVar112);
                            auVar125 = vunpcklpd_avx(auVar116,auVar117);
                            auVar116 = vunpckhpd_avx(auVar116,auVar117);
                            auVar112._16_16_ = auVar120._0_16_;
                            auVar112._0_16_ = auVar118._0_16_;
                            auVar216._16_16_ = auVar115._0_16_;
                            auVar216._0_16_ = auVar113._0_16_;
                            auVar219._16_16_ = auVar125._0_16_;
                            auVar219._0_16_ = auVar119._0_16_;
                            auVar221._16_16_ = auVar116._0_16_;
                            auVar221._0_16_ = auVar114._0_16_;
                            auVar117 = vperm2f128_avx(auVar118,auVar120,0x31);
                            auVar113 = vperm2f128_avx(auVar113,auVar115,0x31);
                            auVar115 = vperm2f128_avx(auVar119,auVar125,0x31);
                            auVar114 = vperm2f128_avx(auVar114,auVar116,0x31);
                            *pauVar41 = auVar112;
                            *(undefined1 (*) [32])(*pauVar41 + lVar39 * 4) = auVar216;
                            *(undefined1 (*) [32])(*pauVar41 + lVar60 * 4) = auVar219;
                            *(undefined1 (*) [32])(*pauVar41 + lVar77 * 4) = auVar221;
                            *(undefined1 (*) [32])(*pauVar41 + lVar85 * 4) = auVar117;
                            *(undefined1 (*) [32])(*pauVar41 + lVar43 * 4) = auVar113;
                            *(undefined1 (*) [32])(*pauVar41 + lVar84 * 4) = auVar115;
                            *(undefined1 (*) [32])(*pauVar41 + lVar83 * 4) = auVar114;
                            auVar103 = vunpcklps_avx(auVar121._0_16_,auVar100);
                            auVar104 = vunpcklps_avx(auVar123._0_16_,auVar99);
                            auVar101 = vunpckhps_avx(auVar121._0_16_,auVar100);
                            auVar102 = vunpckhps_avx(auVar123._0_16_,auVar99);
                            auVar99 = vmovlhps_avx(auVar103,auVar104);
                            auVar100 = vunpckhpd_avx(auVar103,auVar104);
                            auVar105 = vunpcklpd_avx(auVar101,auVar102);
                            auVar101 = vunpckhpd_avx(auVar101,auVar102);
                            auVar102 = vunpcklps_avx(auVar121._16_16_,auVar122._16_16_);
                            auVar107 = vunpcklps_avx(auVar123._16_16_,auVar124._16_16_);
                            auVar103 = vunpckhps_avx(auVar121._16_16_,auVar122._16_16_);
                            auVar104 = vunpckhps_avx(auVar123._16_16_,auVar124._16_16_);
                            auVar106 = vunpcklpd_avx(auVar102,auVar107);
                            auVar102 = vunpckhpd_avx(auVar102,auVar107);
                            auVar107 = vunpcklpd_avx(auVar103,auVar104);
                            auVar103 = vunpckhpd_avx(auVar103,auVar104);
                            *(undefined1 (*) [16])pauVar41[1] = auVar99;
                            *(undefined1 (*) [16])(pauVar41[1] + lVar39 * 4) = auVar100;
                            *(undefined1 (*) [16])(pauVar41[1] + lVar60 * 4) = auVar105;
                            *(undefined1 (*) [16])(pauVar41[1] + lVar77 * 4) = auVar101;
                            *(undefined1 (*) [16])(pauVar41[1] + lVar85 * 4) = auVar106;
                            *(undefined1 (*) [16])(pauVar41[1] + lVar43 * 4) = auVar102;
                            *(undefined1 (*) [16])(pauVar41[1] + lVar84 * 4) = auVar107;
                            *(undefined1 (*) [16])(pauVar41[1] + lVar83 * 4) = auVar103;
                            pauVar41 = (undefined1 (*) [32])(pauVar41[1] + 0x10);
                          }
                          else if (iVar61 == 4) {
                            auVar214._16_16_ = auVar114._0_16_;
                            auVar214._0_16_ = auVar113._0_16_;
                            auVar215._16_16_ = auVar116._0_16_;
                            auVar215._0_16_ = auVar115._0_16_;
                            auVar218._16_16_ = auVar118._0_16_;
                            auVar218._0_16_ = auVar117._0_16_;
                            auVar220._16_16_ = auVar120._0_16_;
                            auVar220._0_16_ = auVar119._0_16_;
                            auVar125 = vinsertf32x4_avx512vl(auVar121,auVar100,1);
                            auVar111 = vinsertf32x4_avx512vl(auVar123,auVar99,1);
                            auVar113 = vperm2f128_avx(auVar113,auVar114,0x31);
                            auVar114 = vperm2f128_avx(auVar115,auVar116,0x31);
                            auVar115 = vperm2f128_avx(auVar117,auVar118,0x31);
                            auVar116 = vperm2f128_avx(auVar119,auVar120,0x31);
                            auVar117 = vperm2f128_avx(auVar121,auVar122,0x31);
                            auVar118 = vperm2f128_avx(auVar123,auVar124,0x31);
                            *pauVar41 = auVar214;
                            pauVar41[1] = auVar215;
                            pauVar41[2] = auVar218;
                            pauVar41[3] = auVar220;
                            pauVar41[4] = auVar125;
                            pauVar41[5] = auVar111;
                            *(undefined1 (*) [32])(*pauVar41 + lVar85 * 4) = auVar113;
                            *(undefined1 (*) [32])(pauVar41[1] + lVar85 * 4) = auVar114;
                            *(undefined1 (*) [32])(pauVar41[2] + lVar85 * 4) = auVar115;
                            *(undefined1 (*) [32])(pauVar41[3] + lVar85 * 4) = auVar116;
                            *(undefined1 (*) [32])(pauVar41[4] + lVar85 * 4) = auVar117;
                            *(undefined1 (*) [32])(pauVar41[5] + lVar85 * 4) = auVar118;
                            pauVar41 = pauVar41 + 6;
                          }
                          else if (iVar61 == 8) {
                            *pauVar41 = auVar113;
                            pauVar41[1] = auVar114;
                            pauVar41[2] = auVar115;
                            pauVar41[3] = auVar116;
                            pauVar41[4] = auVar117;
                            pauVar41[5] = auVar118;
                            pauVar41[6] = auVar119;
                            pauVar41[7] = auVar120;
                            pauVar41[8] = auVar121;
                            pauVar41[9] = auVar122;
                            pauVar41[10] = auVar123;
                            pauVar41[0xb] = auVar124;
                            pauVar41 = pauVar41 + 0xc;
                          }
                        }
                        pauVar78 = pauVar78 + 6;
                        uVar64 = uVar75 + 0xc;
                        iVar62 = uVar75 + 0x17;
                        uVar75 = uVar64;
                      } while (iVar62 < (int)uVar79);
                    }
                    iVar62 = uVar64 + 7;
                    while (iVar62 < (int)uVar79) {
                      if (iVar59 == 0) {
                        if (pauVar40 == (undefined1 (*) [64])0x0) {
                          auVar126 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar132 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          auVar113 = *(undefined1 (*) [32])*pauVar40;
                          auVar126 = ZEXT3264(auVar113);
                          auVar127 = ZEXT3264(auVar113);
                          auVar128 = ZEXT3264(auVar113);
                          auVar129 = ZEXT3264(auVar113);
                          auVar130 = ZEXT3264(auVar113);
                          auVar131 = ZEXT3264(auVar113);
                          auVar132 = ZEXT3264(auVar113);
                          auVar133 = ZEXT3264(auVar113);
                        }
                      }
                      else {
                        auVar133 = ZEXT3264(*(undefined1 (*) [32])*pauVar78);
                        auVar132 = ZEXT3264(*(undefined1 (*) [32])(*pauVar78 + 0x20));
                        auVar131 = ZEXT3264(*(undefined1 (*) [32])pauVar78[1]);
                        auVar130 = ZEXT3264(*(undefined1 (*) [32])(pauVar78[1] + 0x20));
                        auVar129 = ZEXT3264(*(undefined1 (*) [32])pauVar78[2]);
                        auVar128 = ZEXT3264(*(undefined1 (*) [32])(pauVar78[2] + 0x20));
                        auVar127 = ZEXT3264(*(undefined1 (*) [32])pauVar78[3]);
                        auVar126 = ZEXT3264(*(undefined1 (*) [32])(pauVar78[3] + 0x20));
                      }
                      auVar120 = auVar126._0_32_;
                      auVar119 = auVar127._0_32_;
                      auVar118 = auVar128._0_32_;
                      auVar117 = auVar129._0_32_;
                      auVar116 = auVar130._0_32_;
                      auVar115 = auVar131._0_32_;
                      auVar114 = auVar132._0_32_;
                      auVar113 = auVar133._0_32_;
                      if (0 < iVar56) {
                        lVar66 = 0;
                        uVar76 = uVar65;
                        do {
                          auVar120 = *(undefined1 (*) [32])(*pauVar53 + lVar66);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar66);
                          auVar124._4_4_ = uVar168;
                          auVar124._0_4_ = uVar168;
                          auVar124._8_4_ = uVar168;
                          auVar124._12_4_ = uVar168;
                          auVar124._16_4_ = uVar168;
                          auVar124._20_4_ = uVar168;
                          auVar124._24_4_ = uVar168;
                          auVar124._28_4_ = uVar168;
                          auVar113 = vfmadd231ps_avx512vl(auVar133._0_32_,auVar120,auVar124);
                          auVar133 = ZEXT3264(auVar113);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar66 + 4);
                          auVar13._4_4_ = uVar168;
                          auVar13._0_4_ = uVar168;
                          auVar13._8_4_ = uVar168;
                          auVar13._12_4_ = uVar168;
                          auVar13._16_4_ = uVar168;
                          auVar13._20_4_ = uVar168;
                          auVar13._24_4_ = uVar168;
                          auVar13._28_4_ = uVar168;
                          auVar114 = vfmadd231ps_avx512vl(auVar132._0_32_,auVar120,auVar13);
                          auVar132 = ZEXT3264(auVar114);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar66 + 8);
                          auVar14._4_4_ = uVar168;
                          auVar14._0_4_ = uVar168;
                          auVar14._8_4_ = uVar168;
                          auVar14._12_4_ = uVar168;
                          auVar14._16_4_ = uVar168;
                          auVar14._20_4_ = uVar168;
                          auVar14._24_4_ = uVar168;
                          auVar14._28_4_ = uVar168;
                          auVar115 = vfmadd231ps_avx512vl(auVar131._0_32_,auVar120,auVar14);
                          auVar131 = ZEXT3264(auVar115);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar66 + 0xc);
                          auVar15._4_4_ = uVar168;
                          auVar15._0_4_ = uVar168;
                          auVar15._8_4_ = uVar168;
                          auVar15._12_4_ = uVar168;
                          auVar15._16_4_ = uVar168;
                          auVar15._20_4_ = uVar168;
                          auVar15._24_4_ = uVar168;
                          auVar15._28_4_ = uVar168;
                          auVar116 = vfmadd231ps_avx512vl(auVar130._0_32_,auVar120,auVar15);
                          auVar130 = ZEXT3264(auVar116);
                          uVar168 = *(undefined4 *)(pauVar47[1] + lVar66);
                          auVar16._4_4_ = uVar168;
                          auVar16._0_4_ = uVar168;
                          auVar16._8_4_ = uVar168;
                          auVar16._12_4_ = uVar168;
                          auVar16._16_4_ = uVar168;
                          auVar16._20_4_ = uVar168;
                          auVar16._24_4_ = uVar168;
                          auVar16._28_4_ = uVar168;
                          auVar117 = vfmadd231ps_avx512vl(auVar129._0_32_,auVar120,auVar16);
                          auVar129 = ZEXT3264(auVar117);
                          uVar168 = *(undefined4 *)(pauVar47[1] + lVar66 + 4);
                          auVar17._4_4_ = uVar168;
                          auVar17._0_4_ = uVar168;
                          auVar17._8_4_ = uVar168;
                          auVar17._12_4_ = uVar168;
                          auVar17._16_4_ = uVar168;
                          auVar17._20_4_ = uVar168;
                          auVar17._24_4_ = uVar168;
                          auVar17._28_4_ = uVar168;
                          auVar118 = vfmadd231ps_avx512vl(auVar128._0_32_,auVar120,auVar17);
                          auVar128 = ZEXT3264(auVar118);
                          uVar168 = *(undefined4 *)(pauVar47[1] + lVar66 + 8);
                          auVar18._4_4_ = uVar168;
                          auVar18._0_4_ = uVar168;
                          auVar18._8_4_ = uVar168;
                          auVar18._12_4_ = uVar168;
                          auVar18._16_4_ = uVar168;
                          auVar18._20_4_ = uVar168;
                          auVar18._24_4_ = uVar168;
                          auVar18._28_4_ = uVar168;
                          auVar119 = vfmadd231ps_avx512vl(auVar127._0_32_,auVar120,auVar18);
                          auVar127 = ZEXT3264(auVar119);
                          uVar168 = *(undefined4 *)(pauVar47[1] + lVar66 + 0xc);
                          auVar19._4_4_ = uVar168;
                          auVar19._0_4_ = uVar168;
                          auVar19._8_4_ = uVar168;
                          auVar19._12_4_ = uVar168;
                          auVar19._16_4_ = uVar168;
                          auVar19._20_4_ = uVar168;
                          auVar19._24_4_ = uVar168;
                          auVar19._28_4_ = uVar168;
                          auVar120 = vfmadd231ps_avx512vl(auVar126._0_32_,auVar120,auVar19);
                          auVar126 = ZEXT3264(auVar120);
                          lVar66 = lVar66 + 0x20;
                          uVar75 = (int)uVar76 - 1;
                          uVar76 = (ulong)uVar75;
                        } while (uVar75 != 0);
                        pauVar47 = pauVar47 + uVar45 * 2 + 2;
                      }
                      if (iVar38 < K) {
                        *(undefined1 (*) [32])*pauVar78 = auVar113;
                        *(undefined1 (*) [32])(*pauVar78 + 0x20) = auVar114;
                        *(undefined1 (*) [32])pauVar78[1] = auVar115;
                        *(undefined1 (*) [32])(pauVar78[1] + 0x20) = auVar116;
                        *(undefined1 (*) [32])pauVar78[2] = auVar117;
                        *(undefined1 (*) [32])(pauVar78[2] + 0x20) = auVar118;
                        *(undefined1 (*) [32])pauVar78[3] = auVar119;
                        *(undefined1 (*) [32])(pauVar78[3] + 0x20) = auVar120;
                      }
                      else if (iVar61 == 1) {
                        auVar121 = vunpcklps_avx(auVar113,auVar114);
                        auVar114 = vunpckhps_avx(auVar113,auVar114);
                        auVar113 = vunpcklps_avx(auVar115,auVar116);
                        auVar115 = vunpckhps_avx(auVar115,auVar116);
                        auVar122 = vunpcklps_avx(auVar117,auVar118);
                        auVar116 = vunpckhps_avx(auVar117,auVar118);
                        auVar123 = vunpcklps_avx(auVar119,auVar120);
                        auVar117 = vunpckhps_avx(auVar119,auVar120);
                        auVar118 = vunpcklpd_avx(auVar121,auVar113);
                        auVar113 = vunpckhpd_avx(auVar121,auVar113);
                        auVar119 = vunpcklpd_avx(auVar114,auVar115);
                        auVar114 = vunpckhpd_avx(auVar114,auVar115);
                        auVar120 = vunpcklpd_avx(auVar122,auVar123);
                        auVar115 = vunpckhpd_avx(auVar122,auVar123);
                        auVar121 = vunpcklpd_avx(auVar116,auVar117);
                        auVar116 = vunpckhpd_avx(auVar116,auVar117);
                        auVar190._16_16_ = auVar120._0_16_;
                        auVar190._0_16_ = auVar118._0_16_;
                        auVar209._16_16_ = auVar115._0_16_;
                        auVar209._0_16_ = auVar113._0_16_;
                        auVar211._16_16_ = auVar121._0_16_;
                        auVar211._0_16_ = auVar119._0_16_;
                        auVar213._16_16_ = auVar116._0_16_;
                        auVar213._0_16_ = auVar114._0_16_;
                        auVar117 = vperm2f128_avx(auVar118,auVar120,0x31);
                        auVar113 = vperm2f128_avx(auVar113,auVar115,0x31);
                        auVar115 = vperm2f128_avx(auVar119,auVar121,0x31);
                        auVar114 = vperm2f128_avx(auVar114,auVar116,0x31);
                        *pauVar41 = auVar190;
                        *(undefined1 (*) [32])(*pauVar41 + lVar39 * 4) = auVar209;
                        *(undefined1 (*) [32])(*pauVar41 + lVar60 * 4) = auVar211;
                        *(undefined1 (*) [32])(*pauVar41 + lVar77 * 4) = auVar213;
                        *(undefined1 (*) [32])(*pauVar41 + lVar85 * 4) = auVar117;
                        *(undefined1 (*) [32])(*pauVar41 + lVar43 * 4) = auVar113;
                        *(undefined1 (*) [32])(*pauVar41 + lVar84 * 4) = auVar115;
                        *(undefined1 (*) [32])(*pauVar41 + lVar83 * 4) = auVar114;
                        pauVar41 = pauVar41 + 1;
                      }
                      else if (iVar61 == 4) {
                        auVar205._16_16_ = auVar114._0_16_;
                        auVar205._0_16_ = auVar113._0_16_;
                        auVar208._16_16_ = auVar116._0_16_;
                        auVar208._0_16_ = auVar115._0_16_;
                        auVar210._16_16_ = auVar118._0_16_;
                        auVar210._0_16_ = auVar117._0_16_;
                        auVar212._16_16_ = auVar120._0_16_;
                        auVar212._0_16_ = auVar119._0_16_;
                        auVar113 = vperm2f128_avx(auVar113,auVar114,0x31);
                        auVar114 = vperm2f128_avx(auVar115,auVar116,0x31);
                        auVar115 = vperm2f128_avx(auVar117,auVar118,0x31);
                        auVar116 = vperm2f128_avx(auVar119,auVar120,0x31);
                        *pauVar41 = auVar205;
                        pauVar41[1] = auVar208;
                        pauVar41[2] = auVar210;
                        pauVar41[3] = auVar212;
                        *(undefined1 (*) [32])(*pauVar41 + lVar85 * 4) = auVar113;
                        *(undefined1 (*) [32])(pauVar41[1] + lVar85 * 4) = auVar114;
                        *(undefined1 (*) [32])(pauVar41[2] + lVar85 * 4) = auVar115;
                        *(undefined1 (*) [32])(pauVar41[3] + lVar85 * 4) = auVar116;
                        pauVar41 = pauVar41 + 4;
                      }
                      else if (iVar61 == 8) {
                        *pauVar41 = auVar113;
                        pauVar41[1] = auVar114;
                        pauVar41[2] = auVar115;
                        pauVar41[3] = auVar116;
                        pauVar41[4] = auVar117;
                        pauVar41[5] = auVar118;
                        pauVar41[6] = auVar119;
                        pauVar41[7] = auVar120;
                        pauVar41 = pauVar41 + 8;
                      }
                      pauVar78 = pauVar78 + 4;
                      iVar62 = uVar64 + 0xf;
                      uVar64 = uVar64 + 8;
                    }
                    uVar75 = uVar64 | 3;
                    while ((int)uVar75 < (int)uVar79) {
                      if (iVar59 == 0) {
                        if (pauVar40 == (undefined1 (*) [64])0x0) {
                          auVar126 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          auVar113 = *(undefined1 (*) [32])*pauVar40;
                          auVar126 = ZEXT3264(auVar113);
                          auVar127 = ZEXT3264(auVar113);
                          auVar128 = ZEXT3264(auVar113);
                          auVar129 = ZEXT3264(auVar113);
                        }
                      }
                      else {
                        auVar129 = ZEXT3264(*(undefined1 (*) [32])*pauVar78);
                        auVar128 = ZEXT3264(*(undefined1 (*) [32])(*pauVar78 + 0x20));
                        auVar127 = ZEXT3264(*(undefined1 (*) [32])pauVar78[1]);
                        auVar126 = ZEXT3264(*(undefined1 (*) [32])(pauVar78[1] + 0x20));
                      }
                      auVar116 = auVar126._0_32_;
                      auVar115 = auVar127._0_32_;
                      auVar114 = auVar128._0_32_;
                      auVar113 = auVar129._0_32_;
                      if (0 < iVar56) {
                        lVar66 = 0;
                        uVar76 = uVar65;
                        do {
                          auVar116 = *(undefined1 (*) [32])(*pauVar53 + lVar66 * 2);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar66);
                          auVar20._4_4_ = uVar168;
                          auVar20._0_4_ = uVar168;
                          auVar20._8_4_ = uVar168;
                          auVar20._12_4_ = uVar168;
                          auVar20._16_4_ = uVar168;
                          auVar20._20_4_ = uVar168;
                          auVar20._24_4_ = uVar168;
                          auVar20._28_4_ = uVar168;
                          auVar113 = vfmadd231ps_avx512vl(auVar129._0_32_,auVar116,auVar20);
                          auVar129 = ZEXT3264(auVar113);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar66 + 4);
                          auVar21._4_4_ = uVar168;
                          auVar21._0_4_ = uVar168;
                          auVar21._8_4_ = uVar168;
                          auVar21._12_4_ = uVar168;
                          auVar21._16_4_ = uVar168;
                          auVar21._20_4_ = uVar168;
                          auVar21._24_4_ = uVar168;
                          auVar21._28_4_ = uVar168;
                          auVar114 = vfmadd231ps_avx512vl(auVar128._0_32_,auVar116,auVar21);
                          auVar128 = ZEXT3264(auVar114);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar66 + 8);
                          auVar22._4_4_ = uVar168;
                          auVar22._0_4_ = uVar168;
                          auVar22._8_4_ = uVar168;
                          auVar22._12_4_ = uVar168;
                          auVar22._16_4_ = uVar168;
                          auVar22._20_4_ = uVar168;
                          auVar22._24_4_ = uVar168;
                          auVar22._28_4_ = uVar168;
                          auVar115 = vfmadd231ps_avx512vl(auVar127._0_32_,auVar116,auVar22);
                          auVar127 = ZEXT3264(auVar115);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar66 + 0xc);
                          auVar23._4_4_ = uVar168;
                          auVar23._0_4_ = uVar168;
                          auVar23._8_4_ = uVar168;
                          auVar23._12_4_ = uVar168;
                          auVar23._16_4_ = uVar168;
                          auVar23._20_4_ = uVar168;
                          auVar23._24_4_ = uVar168;
                          auVar23._28_4_ = uVar168;
                          auVar116 = vfmadd231ps_avx512vl(auVar126._0_32_,auVar116,auVar23);
                          auVar126 = ZEXT3264(auVar116);
                          lVar66 = lVar66 + 0x10;
                          uVar75 = (int)uVar76 - 1;
                          uVar76 = (ulong)uVar75;
                        } while (uVar75 != 0);
                        pauVar47 = pauVar47 + uVar45 + 1;
                      }
                      if (iVar38 < K) {
                        *(undefined1 (*) [32])*pauVar78 = auVar113;
                        *(undefined1 (*) [32])(*pauVar78 + 0x20) = auVar114;
                        *(undefined1 (*) [32])pauVar78[1] = auVar115;
                        *(undefined1 (*) [32])(pauVar78[1] + 0x20) = auVar116;
                      }
                      else {
                        auVar102 = auVar113._0_16_;
                        auVar101 = auVar114._0_16_;
                        auVar100 = auVar115._0_16_;
                        auVar99 = auVar116._0_16_;
                        if (iVar61 == 1) {
                          auVar103 = vunpcklps_avx(auVar102,auVar101);
                          auVar104 = vunpcklps_avx(auVar100,auVar99);
                          auVar101 = vunpckhps_avx(auVar102,auVar101);
                          auVar102 = vunpckhps_avx(auVar100,auVar99);
                          auVar99 = vmovlhps_avx(auVar103,auVar104);
                          auVar100 = vunpckhpd_avx(auVar103,auVar104);
                          auVar105 = vunpcklpd_avx(auVar101,auVar102);
                          auVar101 = vunpckhpd_avx(auVar101,auVar102);
                          auVar102 = vunpcklps_avx(auVar113._16_16_,auVar114._16_16_);
                          auVar107 = vunpcklps_avx(auVar115._16_16_,auVar116._16_16_);
                          auVar103 = vunpckhps_avx(auVar113._16_16_,auVar114._16_16_);
                          auVar104 = vunpckhps_avx(auVar115._16_16_,auVar116._16_16_);
                          auVar106 = vunpcklpd_avx(auVar102,auVar107);
                          auVar102 = vunpckhpd_avx(auVar102,auVar107);
                          auVar107 = vunpcklpd_avx(auVar103,auVar104);
                          auVar103 = vunpckhpd_avx(auVar103,auVar104);
                          *(undefined1 (*) [16])*pauVar41 = auVar99;
                          *(undefined1 (*) [16])(*pauVar41 + lVar39 * 4) = auVar100;
                          *(undefined1 (*) [16])(*pauVar41 + lVar60 * 4) = auVar105;
                          *(undefined1 (*) [16])(*pauVar41 + lVar77 * 4) = auVar101;
                          *(undefined1 (*) [16])(*pauVar41 + lVar85 * 4) = auVar106;
                          *(undefined1 (*) [16])(*pauVar41 + lVar43 * 4) = auVar102;
                          *(undefined1 (*) [16])(*pauVar41 + lVar84 * 4) = auVar107;
                          *(undefined1 (*) [16])(*pauVar41 + lVar83 * 4) = auVar103;
                          pauVar41 = (undefined1 (*) [32])(*pauVar41 + 0x10);
                        }
                        else if (iVar61 == 4) {
                          auVar198._16_16_ = auVar101;
                          auVar198._0_16_ = auVar102;
                          auVar202._16_16_ = auVar99;
                          auVar202._0_16_ = auVar100;
                          auVar113 = vperm2f128_avx(auVar113,auVar114,0x31);
                          auVar114 = vperm2f128_avx(auVar115,auVar116,0x31);
                          *pauVar41 = auVar198;
                          pauVar41[1] = auVar202;
                          *(undefined1 (*) [32])(*pauVar41 + lVar85 * 4) = auVar113;
                          *(undefined1 (*) [32])(pauVar41[1] + lVar85 * 4) = auVar114;
                          pauVar41 = pauVar41 + 2;
                        }
                        else if (iVar61 == 8) {
                          *pauVar41 = auVar113;
                          pauVar41[1] = auVar114;
                          pauVar41[2] = auVar115;
                          pauVar41[3] = auVar116;
                          pauVar41 = pauVar41 + 4;
                        }
                      }
                      pauVar78 = pauVar78 + 2;
                      uVar75 = uVar64 + 7;
                      uVar64 = uVar64 + 4;
                    }
                    uVar75 = uVar64 | 1;
                    while ((int)uVar75 < (int)uVar79) {
                      if (iVar59 == 0) {
                        if (pauVar40 == (undefined1 (*) [64])0x0) {
                          auVar126 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          auVar126 = ZEXT3264(*(undefined1 (*) [32])*pauVar40);
                          auVar127 = ZEXT3264(*(undefined1 (*) [32])*pauVar40);
                        }
                      }
                      else {
                        auVar127 = ZEXT3264(*(undefined1 (*) [32])*pauVar78);
                        auVar126 = ZEXT3264(*(undefined1 (*) [32])(*pauVar78 + 0x20));
                      }
                      auVar114 = auVar126._0_32_;
                      auVar113 = auVar127._0_32_;
                      if (0 < iVar56) {
                        lVar66 = 0;
                        uVar76 = uVar65;
                        do {
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar66);
                          auVar24._4_4_ = uVar168;
                          auVar24._0_4_ = uVar168;
                          auVar24._8_4_ = uVar168;
                          auVar24._12_4_ = uVar168;
                          auVar24._16_4_ = uVar168;
                          auVar24._20_4_ = uVar168;
                          auVar24._24_4_ = uVar168;
                          auVar24._28_4_ = uVar168;
                          auVar113 = vfmadd231ps_avx512vl
                                               (auVar127._0_32_,
                                                *(undefined1 (*) [32])(*pauVar53 + lVar66 * 4),
                                                auVar24);
                          auVar127 = ZEXT3264(auVar113);
                          uVar168 = *(undefined4 *)(*pauVar47 + lVar66 + 4);
                          auVar25._4_4_ = uVar168;
                          auVar25._0_4_ = uVar168;
                          auVar25._8_4_ = uVar168;
                          auVar25._12_4_ = uVar168;
                          auVar25._16_4_ = uVar168;
                          auVar25._20_4_ = uVar168;
                          auVar25._24_4_ = uVar168;
                          auVar25._28_4_ = uVar168;
                          auVar114 = vfmadd231ps_avx512vl
                                               (auVar126._0_32_,
                                                *(undefined1 (*) [32])(*pauVar53 + lVar66 * 4),
                                                auVar25);
                          auVar126 = ZEXT3264(auVar114);
                          lVar66 = lVar66 + 8;
                          uVar75 = (int)uVar76 - 1;
                          uVar76 = (ulong)uVar75;
                        } while (uVar75 != 0);
                        pauVar47 = (undefined1 (*) [16])(*pauVar47 + uVar45 * 8 + 8);
                      }
                      if (iVar38 < K) {
                        *(undefined1 (*) [32])*pauVar78 = auVar113;
                        *(undefined1 (*) [32])(*pauVar78 + 0x20) = auVar114;
                      }
                      else {
                        auVar101 = auVar113._16_16_;
                        auVar99 = auVar114._0_16_;
                        auVar100 = auVar113._0_16_;
                        if (iVar61 == 1) {
                          *(int *)*pauVar41 = auVar113._0_4_;
                          uVar168 = vextractps_avx(auVar100,1);
                          *(undefined4 *)(*pauVar41 + lVar39 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar100,2);
                          *(undefined4 *)(*pauVar41 + lVar60 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar100,3);
                          *(undefined4 *)(*pauVar41 + (long)(iVar73 * 3) * 4) = uVar168;
                          *(int *)(*pauVar41 + lVar85 * 4) = auVar113._16_4_;
                          uVar168 = vextractps_avx(auVar101,1);
                          *(undefined4 *)(*pauVar41 + (long)(iVar73 * 5) * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar101,2);
                          *(undefined4 *)(*pauVar41 + local_208 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar101,3);
                          *(undefined4 *)(*pauVar41 + local_210 * 4) = uVar168;
                          *(int *)(*pauVar41 + 4) = auVar114._0_4_;
                          uVar168 = vextractps_avx(auVar99,1);
                          *(undefined4 *)
                           (*pauVar41 + ((long)((sVar1 << 0x20) + 0x100000000) >> 0x20) * 4) =
                               uVar168;
                          uVar168 = vextractps_avx(auVar99,2);
                          *(undefined4 *)(*pauVar41 + local_218 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar99,3);
                          *(undefined4 *)(*pauVar41 + local_220 * 4) = uVar168;
                          auVar99 = auVar114._16_16_;
                          *(int *)(*pauVar41 + local_228 * 4) = auVar114._16_4_;
                          uVar168 = vextractps_avx(auVar99,1);
                          *(undefined4 *)(*pauVar41 + local_230 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar99,2);
                          *(undefined4 *)(*pauVar41 + local_238 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar99,3);
                          *(undefined4 *)(*pauVar41 + local_1b0 * 4) = uVar168;
                          pauVar41 = (undefined1 (*) [32])(*pauVar41 + 8);
                        }
                        else if (iVar61 == 4) {
                          auVar191._16_16_ = auVar99;
                          auVar191._0_16_ = auVar100;
                          auVar113 = vperm2f128_avx(auVar113,auVar114,0x31);
                          *pauVar41 = auVar191;
                          *(undefined1 (*) [32])(*pauVar41 + lVar85 * 4) = auVar113;
                          pauVar41 = pauVar41 + 1;
                        }
                        else if (iVar61 == 8) {
                          *pauVar41 = auVar113;
                          pauVar41[1] = auVar114;
                          pauVar41 = pauVar41 + 2;
                        }
                      }
                      pauVar78 = pauVar78 + 1;
                      uVar75 = uVar64 + 3;
                      uVar64 = uVar64 + 2;
                    }
                    if ((int)uVar64 < (int)uVar79) {
                      do {
                        if (iVar59 == 0) {
                          if (pauVar40 == (undefined1 (*) [64])0x0) {
                            auVar126 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar126 = ZEXT3264(*(undefined1 (*) [32])*pauVar40);
                          }
                        }
                        else {
                          auVar126 = ZEXT3264(*(undefined1 (*) [32])*pauVar78);
                        }
                        auVar113 = auVar126._0_32_;
                        if (0 < iVar56) {
                          lVar66 = 0;
                          uVar76 = uVar65;
                          do {
                            uVar168 = *(undefined4 *)(*pauVar47 + lVar66);
                            auVar26._4_4_ = uVar168;
                            auVar26._0_4_ = uVar168;
                            auVar26._8_4_ = uVar168;
                            auVar26._12_4_ = uVar168;
                            auVar26._16_4_ = uVar168;
                            auVar26._20_4_ = uVar168;
                            auVar26._24_4_ = uVar168;
                            auVar26._28_4_ = uVar168;
                            auVar113 = vfmadd231ps_avx512vl
                                                 (auVar126._0_32_,
                                                  *(undefined1 (*) [32])(*pauVar53 + lVar66 * 8),
                                                  auVar26);
                            auVar126 = ZEXT3264(auVar113);
                            lVar66 = lVar66 + 4;
                            uVar75 = (int)uVar76 - 1;
                            uVar76 = (ulong)uVar75;
                          } while (uVar75 != 0);
                          pauVar47 = (undefined1 (*) [16])(*pauVar47 + uVar45 * 4 + 4);
                        }
                        if (iVar38 < K) {
                          *(undefined1 (*) [32])*pauVar78 = auVar113;
                        }
                        else {
                          auVar100 = auVar113._16_16_;
                          auVar99 = auVar113._0_16_;
                          if (iVar61 == 1) {
                            *(int *)*pauVar41 = auVar113._0_4_;
                            uVar168 = vextractps_avx(auVar99,1);
                            *(undefined4 *)(*pauVar41 + lVar39 * 4) = uVar168;
                            uVar168 = vextractps_avx(auVar99,2);
                            *(undefined4 *)(*pauVar41 + lVar60 * 4) = uVar168;
                            uVar168 = vextractps_avx(auVar99,3);
                            *(undefined4 *)(*pauVar41 + lVar77 * 4) = uVar168;
                            *(int *)(*pauVar41 + lVar85 * 4) = auVar113._16_4_;
                            uVar168 = vextractps_avx(auVar100,1);
                            *(undefined4 *)(*pauVar41 + lVar43 * 4) = uVar168;
                            uVar168 = vextractps_avx(auVar100,2);
                            *(undefined4 *)(*pauVar41 + lVar84 * 4) = uVar168;
                            uVar168 = vextractps_avx(auVar100,3);
                            *(undefined4 *)(*pauVar41 + lVar83 * 4) = uVar168;
                            pauVar41 = (undefined1 (*) [32])(*pauVar41 + 4);
                          }
                          else if (iVar61 == 4) {
                            *(undefined1 (*) [16])*pauVar41 = auVar99;
                            *(undefined1 (*) [16])(*pauVar41 + lVar85 * 4) = auVar100;
                            pauVar41 = (undefined1 (*) [32])(*pauVar41 + 0x10);
                          }
                          else if (iVar61 == 8) {
                            *pauVar41 = auVar113;
                            pauVar41 = pauVar41 + 1;
                          }
                        }
                        pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x20);
                        uVar64 = uVar64 + 1;
                      } while (uVar64 != uVar79);
                    }
                    pauVar53 = (undefined1 (*) [64])(*pauVar53 + local_1c8);
                    uVar76 = local_1b8 + 8;
                    local_1a4 = iVar38;
                  } while ((long)(local_1b8 + 0xf) < local_1f0);
                }
                if ((int)((uint)uVar76 | 3) < (int)uVar48) {
                  lVar60 = (long)iVar73;
                  lVar85 = (long)(iVar73 * 2);
                  lVar39 = (long)(sVar1 * 0x300000000) >> 0x20;
                  uVar46 = (ulong)(iVar56 - 1);
                  uVar45 = uVar76 & 0xffffffff;
                  do {
                    pauVar69 = (undefined1 (*) [64])
                               ((long)local_240->data + uVar45 * 4 + local_200 * 4);
                    if (pauVar40 == (undefined1 (*) [64])0x0) {
                      pauVar69 = pauVar40;
                    }
                    pauVar40 = pauVar69;
                    uVar64 = 0;
                    pauVar47 = (undefined1 (*) [16])
                               ((long)local_248->data +
                               (long)(iVar61 * iVar72) * 4 + (uVar45 + local_200) * lVar60 * 4);
                    pauVar50 = pauVar42;
                    if (0xb < (int)uVar79) {
                      uVar75 = 0;
                      do {
                        if (iVar59 == 0) {
                          if (pauVar40 == (undefined1 (*) [64])0x0) {
                            auVar126 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar132 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar134 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar135 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar136 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar137 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar99 = *(undefined1 (*) [16])*pauVar40;
                            auVar126 = ZEXT1664(auVar99);
                            auVar127 = ZEXT1664(auVar99);
                            auVar128 = ZEXT1664(auVar99);
                            auVar129 = ZEXT1664(auVar99);
                            auVar130 = ZEXT1664(auVar99);
                            auVar131 = ZEXT1664(auVar99);
                            auVar132 = ZEXT1664(auVar99);
                            auVar133 = ZEXT1664(auVar99);
                            auVar134 = ZEXT1664(auVar99);
                            auVar135 = ZEXT1664(auVar99);
                            auVar136 = ZEXT1664(auVar99);
                            auVar137 = ZEXT1664(auVar99);
                          }
                        }
                        else {
                          auVar137 = ZEXT1664(*(undefined1 (*) [16])*pauVar78);
                          auVar136 = ZEXT1664(*(undefined1 (*) [16])(*pauVar78 + 0x10));
                          auVar135 = ZEXT1664(*(undefined1 (*) [16])(*pauVar78 + 0x20));
                          auVar134 = ZEXT1664(*(undefined1 (*) [16])(*pauVar78 + 0x30));
                          auVar133 = ZEXT1664(*(undefined1 (*) [16])pauVar78[1]);
                          auVar132 = ZEXT1664(*(undefined1 (*) [16])(pauVar78[1] + 0x10));
                          auVar131 = ZEXT1664(*(undefined1 (*) [16])(pauVar78[1] + 0x20));
                          auVar130 = ZEXT1664(*(undefined1 (*) [16])(pauVar78[1] + 0x30));
                          auVar129 = ZEXT1664(*(undefined1 (*) [16])pauVar78[2]);
                          auVar126 = ZEXT1664(*(undefined1 (*) [16])(pauVar78[2] + 0x10));
                          auVar127 = ZEXT1664(*(undefined1 (*) [16])(pauVar78[2] + 0x20));
                          auVar128 = ZEXT1664(*(undefined1 (*) [16])(pauVar78[2] + 0x30));
                        }
                        auVar110 = auVar128._0_16_;
                        auVar109 = auVar127._0_16_;
                        auVar108 = auVar126._0_16_;
                        auVar107 = auVar129._0_16_;
                        auVar106 = auVar130._0_16_;
                        auVar105 = auVar131._0_16_;
                        auVar104 = auVar132._0_16_;
                        auVar103 = auVar133._0_16_;
                        auVar102 = auVar134._0_16_;
                        auVar101 = auVar135._0_16_;
                        auVar100 = auVar136._0_16_;
                        auVar99 = auVar137._0_16_;
                        pauVar69 = pauVar53;
                        pauVar71 = pauVar50;
                        uVar76 = uVar65;
                        if (0 < iVar56) {
                          do {
                            auVar110 = *(undefined1 (*) [16])*pauVar69;
                            uVar168 = *(undefined4 *)*pauVar71;
                            auVar99._4_4_ = uVar168;
                            auVar99._0_4_ = uVar168;
                            auVar99._8_4_ = uVar168;
                            auVar99._12_4_ = uVar168;
                            auVar99 = vfmadd231ps_avx512vl(auVar137._0_16_,auVar110,auVar99);
                            auVar137 = ZEXT1664(auVar99);
                            uVar168 = *(undefined4 *)(*pauVar71 + 4);
                            auVar100._4_4_ = uVar168;
                            auVar100._0_4_ = uVar168;
                            auVar100._8_4_ = uVar168;
                            auVar100._12_4_ = uVar168;
                            auVar100 = vfmadd231ps_avx512vl(auVar136._0_16_,auVar110,auVar100);
                            auVar136 = ZEXT1664(auVar100);
                            uVar168 = *(undefined4 *)(*pauVar71 + 8);
                            auVar101._4_4_ = uVar168;
                            auVar101._0_4_ = uVar168;
                            auVar101._8_4_ = uVar168;
                            auVar101._12_4_ = uVar168;
                            auVar101 = vfmadd231ps_avx512vl(auVar135._0_16_,auVar110,auVar101);
                            auVar135 = ZEXT1664(auVar101);
                            uVar168 = *(undefined4 *)(*pauVar71 + 0xc);
                            auVar102._4_4_ = uVar168;
                            auVar102._0_4_ = uVar168;
                            auVar102._8_4_ = uVar168;
                            auVar102._12_4_ = uVar168;
                            auVar102 = vfmadd231ps_avx512vl(auVar134._0_16_,auVar110,auVar102);
                            auVar134 = ZEXT1664(auVar102);
                            uVar168 = *(undefined4 *)pauVar71[1];
                            auVar103._4_4_ = uVar168;
                            auVar103._0_4_ = uVar168;
                            auVar103._8_4_ = uVar168;
                            auVar103._12_4_ = uVar168;
                            auVar103 = vfmadd231ps_avx512vl(auVar133._0_16_,auVar110,auVar103);
                            auVar133 = ZEXT1664(auVar103);
                            uVar168 = *(undefined4 *)(pauVar71[1] + 4);
                            auVar104._4_4_ = uVar168;
                            auVar104._0_4_ = uVar168;
                            auVar104._8_4_ = uVar168;
                            auVar104._12_4_ = uVar168;
                            auVar104 = vfmadd231ps_avx512vl(auVar132._0_16_,auVar110,auVar104);
                            auVar132 = ZEXT1664(auVar104);
                            uVar168 = *(undefined4 *)(pauVar71[1] + 8);
                            auVar105._4_4_ = uVar168;
                            auVar105._0_4_ = uVar168;
                            auVar105._8_4_ = uVar168;
                            auVar105._12_4_ = uVar168;
                            auVar105 = vfmadd231ps_avx512vl(auVar131._0_16_,auVar110,auVar105);
                            auVar131 = ZEXT1664(auVar105);
                            uVar168 = *(undefined4 *)(pauVar71[1] + 0xc);
                            auVar106._4_4_ = uVar168;
                            auVar106._0_4_ = uVar168;
                            auVar106._8_4_ = uVar168;
                            auVar106._12_4_ = uVar168;
                            auVar106 = vfmadd231ps_avx512vl(auVar130._0_16_,auVar110,auVar106);
                            auVar130 = ZEXT1664(auVar106);
                            uVar168 = *(undefined4 *)pauVar71[2];
                            auVar107._4_4_ = uVar168;
                            auVar107._0_4_ = uVar168;
                            auVar107._8_4_ = uVar168;
                            auVar107._12_4_ = uVar168;
                            auVar107 = vfmadd231ps_avx512vl(auVar129._0_16_,auVar110,auVar107);
                            auVar129 = ZEXT1664(auVar107);
                            uVar168 = *(undefined4 *)(pauVar71[2] + 4);
                            auVar108._4_4_ = uVar168;
                            auVar108._0_4_ = uVar168;
                            auVar108._8_4_ = uVar168;
                            auVar108._12_4_ = uVar168;
                            auVar108 = vfmadd231ps_avx512vl(auVar126._0_16_,auVar110,auVar108);
                            auVar126 = ZEXT1664(auVar108);
                            uVar168 = *(undefined4 *)(pauVar71[2] + 8);
                            auVar109._4_4_ = uVar168;
                            auVar109._0_4_ = uVar168;
                            auVar109._8_4_ = uVar168;
                            auVar109._12_4_ = uVar168;
                            auVar109 = vfmadd231ps_avx512vl(auVar127._0_16_,auVar110,auVar109);
                            auVar127 = ZEXT1664(auVar109);
                            uVar168 = *(undefined4 *)(pauVar71[2] + 0xc);
                            auVar91._4_4_ = uVar168;
                            auVar91._0_4_ = uVar168;
                            auVar91._8_4_ = uVar168;
                            auVar91._12_4_ = uVar168;
                            auVar110 = vfmadd231ps_avx512vl(auVar128._0_16_,auVar110,auVar91);
                            auVar128 = ZEXT1664(auVar110);
                            uVar64 = (int)uVar76 - 1;
                            pauVar69 = (undefined1 (*) [64])(*pauVar69 + 0x10);
                            pauVar71 = pauVar71 + 3;
                            uVar76 = (ulong)uVar64;
                          } while (uVar64 != 0);
                          pauVar50 = pauVar50 + uVar46 * 3 + 3;
                        }
                        if (iVar38 < K) {
                          *(undefined1 (*) [16])*pauVar78 = auVar99;
                          *(undefined1 (*) [16])(*pauVar78 + 0x10) = auVar100;
                          *(undefined1 (*) [16])(*pauVar78 + 0x20) = auVar101;
                          *(undefined1 (*) [16])(*pauVar78 + 0x30) = auVar102;
                          *(undefined1 (*) [16])pauVar78[1] = auVar103;
                          *(undefined1 (*) [16])(pauVar78[1] + 0x10) = auVar104;
                          *(undefined1 (*) [16])(pauVar78[1] + 0x20) = auVar105;
                          *(undefined1 (*) [16])(pauVar78[1] + 0x30) = auVar106;
                          *(undefined1 (*) [16])pauVar78[2] = auVar107;
                          *(undefined1 (*) [16])(pauVar78[2] + 0x10) = auVar108;
                          *(undefined1 (*) [16])(pauVar78[2] + 0x20) = auVar109;
                          *(undefined1 (*) [16])(pauVar78[2] + 0x30) = auVar110;
                        }
                        else if (iVar61 == 1) {
                          auVar91 = vunpcklps_avx(auVar99,auVar100);
                          auVar93 = vunpcklps_avx(auVar101,auVar102);
                          auVar92 = vunpckhps_avx(auVar99,auVar100);
                          auVar101 = vunpckhps_avx(auVar101,auVar102);
                          auVar99 = vmovlhps_avx(auVar91,auVar93);
                          auVar91 = vunpckhpd_avx(auVar91,auVar93);
                          auVar100 = vmovlhps_avx(auVar92,auVar101);
                          auVar92 = vunpckhpd_avx(auVar92,auVar101);
                          auVar102 = vunpcklps_avx(auVar103,auVar104);
                          auVar93 = vunpcklps_avx(auVar105,auVar106);
                          auVar103 = vunpckhps_avx(auVar103,auVar104);
                          auVar104 = vunpckhps_avx(auVar105,auVar106);
                          auVar101 = vmovlhps_avx(auVar102,auVar93);
                          auVar105 = vunpckhpd_avx(auVar102,auVar93);
                          auVar102 = vmovlhps_avx(auVar103,auVar104);
                          auVar106 = vunpckhpd_avx(auVar103,auVar104);
                          auVar104 = vunpcklps_avx(auVar107,auVar108);
                          auVar93 = vunpcklps_avx(auVar109,auVar110);
                          auVar108 = vunpckhps_avx(auVar107,auVar108);
                          auVar109 = vunpckhps_avx(auVar109,auVar110);
                          auVar103 = vmovlhps_avx(auVar104,auVar93);
                          auVar107 = vunpckhpd_avx(auVar104,auVar93);
                          auVar104 = vmovlhps_avx(auVar108,auVar109);
                          auVar108 = vunpckhpd_avx(auVar108,auVar109);
                          *pauVar47 = auVar99;
                          *(undefined1 (*) [16])(*pauVar47 + lVar60 * 4) = auVar91;
                          *(undefined1 (*) [16])(*pauVar47 + lVar85 * 4) = auVar100;
                          *(undefined1 (*) [16])(*pauVar47 + lVar39 * 4) = auVar92;
                          pauVar47[1] = auVar101;
                          *(undefined1 (*) [16])(pauVar47[1] + lVar60 * 4) = auVar105;
                          *(undefined1 (*) [16])(pauVar47[1] + lVar85 * 4) = auVar102;
                          *(undefined1 (*) [16])(pauVar47[1] + lVar39 * 4) = auVar106;
                          pauVar47[2] = auVar103;
                          *(undefined1 (*) [16])(pauVar47[2] + lVar60 * 4) = auVar107;
                          *(undefined1 (*) [16])(pauVar47[2] + lVar85 * 4) = auVar104;
                          *(undefined1 (*) [16])(pauVar47[2] + lVar39 * 4) = auVar108;
                          pauVar47 = pauVar47 + 3;
                        }
                        else if (iVar61 == 4) {
                          *pauVar47 = auVar99;
                          pauVar47[1] = auVar100;
                          pauVar47[2] = auVar101;
                          pauVar47[3] = auVar102;
                          pauVar47[4] = auVar103;
                          pauVar47[5] = auVar104;
                          pauVar47[6] = auVar105;
                          pauVar47[7] = auVar106;
                          pauVar47[8] = auVar107;
                          pauVar47[9] = auVar108;
                          pauVar47[10] = auVar109;
                          pauVar47[0xb] = auVar110;
                          pauVar47 = pauVar47 + 0xc;
                        }
                        pauVar78 = pauVar78 + 3;
                        uVar64 = uVar75 + 0xc;
                        iVar62 = uVar75 + 0x17;
                        uVar75 = uVar64;
                      } while (iVar62 < (int)uVar79);
                    }
                    iVar62 = uVar64 + 7;
                    while (iVar62 < (int)uVar79) {
                      if (iVar59 == 0) {
                        if (pauVar40 == (undefined1 (*) [64])0x0) {
                          auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar132 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar126 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          auVar99 = *(undefined1 (*) [16])*pauVar40;
                          auVar129 = ZEXT1664(auVar99);
                          auVar131 = ZEXT1664(auVar99);
                          auVar132 = ZEXT1664(auVar99);
                          auVar133 = ZEXT1664(auVar99);
                          auVar126 = ZEXT1664(auVar99);
                          auVar127 = ZEXT1664(auVar99);
                          auVar128 = ZEXT1664(auVar99);
                          auVar130 = ZEXT1664(auVar99);
                        }
                      }
                      else {
                        auVar129 = ZEXT1664(*(undefined1 (*) [16])*pauVar78);
                        auVar131 = ZEXT1664(*(undefined1 (*) [16])(*pauVar78 + 0x10));
                        auVar132 = ZEXT1664(*(undefined1 (*) [16])(*pauVar78 + 0x20));
                        auVar133 = ZEXT1664(*(undefined1 (*) [16])(*pauVar78 + 0x30));
                        auVar126 = ZEXT1664(*(undefined1 (*) [16])pauVar78[1]);
                        auVar127 = ZEXT1664(*(undefined1 (*) [16])(pauVar78[1] + 0x10));
                        auVar128 = ZEXT1664(*(undefined1 (*) [16])(pauVar78[1] + 0x20));
                        auVar130 = ZEXT1664(*(undefined1 (*) [16])(pauVar78[1] + 0x30));
                      }
                      auVar106 = auVar130._0_16_;
                      auVar105 = auVar128._0_16_;
                      auVar104 = auVar127._0_16_;
                      auVar103 = auVar126._0_16_;
                      auVar102 = auVar133._0_16_;
                      auVar101 = auVar132._0_16_;
                      auVar100 = auVar131._0_16_;
                      auVar99 = auVar129._0_16_;
                      if (0 < iVar56) {
                        lVar77 = 0;
                        uVar76 = uVar65;
                        do {
                          auVar106 = *(undefined1 (*) [16])(*pauVar53 + lVar77);
                          uVar168 = *(undefined4 *)(*pauVar50 + lVar77 * 2);
                          auVar110._4_4_ = uVar168;
                          auVar110._0_4_ = uVar168;
                          auVar110._8_4_ = uVar168;
                          auVar110._12_4_ = uVar168;
                          auVar99 = vfmadd231ps_avx512vl(auVar129._0_16_,auVar106,auVar110);
                          auVar129 = ZEXT1664(auVar99);
                          uVar168 = *(undefined4 *)(*pauVar50 + lVar77 * 2 + 4);
                          auVar92._4_4_ = uVar168;
                          auVar92._0_4_ = uVar168;
                          auVar92._8_4_ = uVar168;
                          auVar92._12_4_ = uVar168;
                          auVar100 = vfmadd231ps_avx512vl(auVar131._0_16_,auVar106,auVar92);
                          auVar131 = ZEXT1664(auVar100);
                          uVar168 = *(undefined4 *)(*pauVar50 + lVar77 * 2 + 8);
                          auVar93._4_4_ = uVar168;
                          auVar93._0_4_ = uVar168;
                          auVar93._8_4_ = uVar168;
                          auVar93._12_4_ = uVar168;
                          auVar101 = vfmadd231ps_avx512vl(auVar132._0_16_,auVar106,auVar93);
                          auVar132 = ZEXT1664(auVar101);
                          uVar168 = *(undefined4 *)(*pauVar50 + lVar77 * 2 + 0xc);
                          auVar94._4_4_ = uVar168;
                          auVar94._0_4_ = uVar168;
                          auVar94._8_4_ = uVar168;
                          auVar94._12_4_ = uVar168;
                          auVar102 = vfmadd231ps_avx512vl(auVar133._0_16_,auVar106,auVar94);
                          auVar133 = ZEXT1664(auVar102);
                          uVar168 = *(undefined4 *)(pauVar50[1] + lVar77 * 2);
                          auVar95._4_4_ = uVar168;
                          auVar95._0_4_ = uVar168;
                          auVar95._8_4_ = uVar168;
                          auVar95._12_4_ = uVar168;
                          auVar103 = vfmadd231ps_avx512vl(auVar126._0_16_,auVar106,auVar95);
                          auVar126 = ZEXT1664(auVar103);
                          uVar168 = *(undefined4 *)(pauVar50[1] + lVar77 * 2 + 4);
                          auVar96._4_4_ = uVar168;
                          auVar96._0_4_ = uVar168;
                          auVar96._8_4_ = uVar168;
                          auVar96._12_4_ = uVar168;
                          auVar104 = vfmadd231ps_avx512vl(auVar127._0_16_,auVar106,auVar96);
                          auVar127 = ZEXT1664(auVar104);
                          uVar168 = *(undefined4 *)(pauVar50[1] + lVar77 * 2 + 8);
                          auVar97._4_4_ = uVar168;
                          auVar97._0_4_ = uVar168;
                          auVar97._8_4_ = uVar168;
                          auVar97._12_4_ = uVar168;
                          auVar105 = vfmadd231ps_avx512vl(auVar128._0_16_,auVar106,auVar97);
                          auVar128 = ZEXT1664(auVar105);
                          uVar168 = *(undefined4 *)(pauVar50[1] + lVar77 * 2 + 0xc);
                          auVar98._4_4_ = uVar168;
                          auVar98._0_4_ = uVar168;
                          auVar98._8_4_ = uVar168;
                          auVar98._12_4_ = uVar168;
                          auVar106 = vfmadd231ps_avx512vl(auVar130._0_16_,auVar106,auVar98);
                          auVar130 = ZEXT1664(auVar106);
                          lVar77 = lVar77 + 0x10;
                          uVar75 = (int)uVar76 - 1;
                          uVar76 = (ulong)uVar75;
                        } while (uVar75 != 0);
                        pauVar50 = pauVar50 + uVar46 * 2 + 2;
                      }
                      if (iVar38 < K) {
                        *(undefined1 (*) [16])*pauVar78 = auVar99;
                        *(undefined1 (*) [16])(*pauVar78 + 0x10) = auVar100;
                        *(undefined1 (*) [16])(*pauVar78 + 0x20) = auVar101;
                        *(undefined1 (*) [16])(*pauVar78 + 0x30) = auVar102;
                        *(undefined1 (*) [16])pauVar78[1] = auVar103;
                        *(undefined1 (*) [16])(pauVar78[1] + 0x10) = auVar104;
                        *(undefined1 (*) [16])(pauVar78[1] + 0x20) = auVar105;
                        *(undefined1 (*) [16])(pauVar78[1] + 0x30) = auVar106;
                      }
                      else if (iVar61 == 1) {
                        auVar107 = vunpcklps_avx(auVar99,auVar100);
                        auVar109 = vunpcklps_avx(auVar101,auVar102);
                        auVar108 = vunpckhps_avx(auVar99,auVar100);
                        auVar101 = vunpckhps_avx(auVar101,auVar102);
                        auVar99 = vmovlhps_avx(auVar107,auVar109);
                        auVar107 = vunpckhpd_avx(auVar107,auVar109);
                        auVar100 = vmovlhps_avx(auVar108,auVar101);
                        auVar108 = vunpckhpd_avx(auVar108,auVar101);
                        auVar102 = vunpcklps_avx(auVar103,auVar104);
                        auVar109 = vunpcklps_avx(auVar105,auVar106);
                        auVar104 = vunpckhps_avx(auVar103,auVar104);
                        auVar105 = vunpckhps_avx(auVar105,auVar106);
                        auVar101 = vmovlhps_avx(auVar102,auVar109);
                        auVar103 = vunpckhpd_avx(auVar102,auVar109);
                        auVar102 = vmovlhps_avx(auVar104,auVar105);
                        auVar104 = vunpckhpd_avx(auVar104,auVar105);
                        *pauVar47 = auVar99;
                        *(undefined1 (*) [16])(*pauVar47 + lVar60 * 4) = auVar107;
                        *(undefined1 (*) [16])(*pauVar47 + lVar85 * 4) = auVar100;
                        *(undefined1 (*) [16])(*pauVar47 + lVar39 * 4) = auVar108;
                        pauVar47[1] = auVar101;
                        *(undefined1 (*) [16])(pauVar47[1] + lVar60 * 4) = auVar103;
                        *(undefined1 (*) [16])(pauVar47[1] + lVar85 * 4) = auVar102;
                        *(undefined1 (*) [16])(pauVar47[1] + lVar39 * 4) = auVar104;
                        pauVar47 = pauVar47 + 2;
                      }
                      else if (iVar61 == 4) {
                        *pauVar47 = auVar99;
                        pauVar47[1] = auVar100;
                        pauVar47[2] = auVar101;
                        pauVar47[3] = auVar102;
                        pauVar47[4] = auVar103;
                        pauVar47[5] = auVar104;
                        pauVar47[6] = auVar105;
                        pauVar47[7] = auVar106;
                        pauVar47 = pauVar47 + 8;
                      }
                      pauVar78 = pauVar78 + 2;
                      iVar62 = uVar64 + 0xf;
                      uVar64 = uVar64 + 8;
                    }
                    uVar75 = uVar64 | 3;
                    while ((int)uVar75 < (int)uVar79) {
                      if (iVar59 == 0) {
                        if (pauVar40 == (undefined1 (*) [64])0x0) {
                          auVar126 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          auVar99 = *(undefined1 (*) [16])*pauVar40;
                          auVar126 = ZEXT1664(auVar99);
                          auVar127 = ZEXT1664(auVar99);
                          auVar128 = ZEXT1664(auVar99);
                          auVar129 = ZEXT1664(auVar99);
                        }
                      }
                      else {
                        auVar126 = ZEXT1664(*(undefined1 (*) [16])*pauVar78);
                        auVar127 = ZEXT1664(*(undefined1 (*) [16])(*pauVar78 + 0x10));
                        auVar128 = ZEXT1664(*(undefined1 (*) [16])(*pauVar78 + 0x20));
                        auVar129 = ZEXT1664(*(undefined1 (*) [16])(*pauVar78 + 0x30));
                      }
                      auVar102 = auVar129._0_16_;
                      auVar101 = auVar128._0_16_;
                      auVar100 = auVar127._0_16_;
                      auVar99 = auVar126._0_16_;
                      if (0 < iVar56) {
                        lVar77 = 0;
                        uVar76 = uVar65;
                        do {
                          auVar102 = *(undefined1 (*) [16])(*pauVar53 + lVar77);
                          uVar168 = *(undefined4 *)(*pauVar50 + lVar77);
                          auVar4._4_4_ = uVar168;
                          auVar4._0_4_ = uVar168;
                          auVar4._8_4_ = uVar168;
                          auVar4._12_4_ = uVar168;
                          auVar99 = vfmadd231ps_avx512vl(auVar126._0_16_,auVar102,auVar4);
                          auVar126 = ZEXT1664(auVar99);
                          uVar168 = *(undefined4 *)(*pauVar50 + lVar77 + 4);
                          auVar5._4_4_ = uVar168;
                          auVar5._0_4_ = uVar168;
                          auVar5._8_4_ = uVar168;
                          auVar5._12_4_ = uVar168;
                          auVar100 = vfmadd231ps_avx512vl(auVar127._0_16_,auVar102,auVar5);
                          auVar127 = ZEXT1664(auVar100);
                          uVar168 = *(undefined4 *)(*pauVar50 + lVar77 + 8);
                          auVar6._4_4_ = uVar168;
                          auVar6._0_4_ = uVar168;
                          auVar6._8_4_ = uVar168;
                          auVar6._12_4_ = uVar168;
                          auVar101 = vfmadd231ps_avx512vl(auVar128._0_16_,auVar102,auVar6);
                          auVar128 = ZEXT1664(auVar101);
                          uVar168 = *(undefined4 *)(*pauVar50 + lVar77 + 0xc);
                          auVar7._4_4_ = uVar168;
                          auVar7._0_4_ = uVar168;
                          auVar7._8_4_ = uVar168;
                          auVar7._12_4_ = uVar168;
                          auVar102 = vfmadd231ps_avx512vl(auVar129._0_16_,auVar102,auVar7);
                          auVar129 = ZEXT1664(auVar102);
                          lVar77 = lVar77 + 0x10;
                          uVar75 = (int)uVar76 - 1;
                          uVar76 = (ulong)uVar75;
                        } while (uVar75 != 0);
                        pauVar50 = pauVar50 + uVar46 + 1;
                      }
                      if (iVar38 < K) {
                        *(undefined1 (*) [16])*pauVar78 = auVar99;
                        *(undefined1 (*) [16])(*pauVar78 + 0x10) = auVar100;
                        *(undefined1 (*) [16])(*pauVar78 + 0x20) = auVar101;
                        *(undefined1 (*) [16])(*pauVar78 + 0x30) = auVar102;
                      }
                      else if (iVar61 == 1) {
                        auVar104 = vunpcklps_avx(auVar99,auVar100);
                        auVar105 = vunpcklps_avx(auVar101,auVar102);
                        auVar103 = vunpckhps_avx(auVar99,auVar100);
                        auVar102 = vunpckhps_avx(auVar101,auVar102);
                        auVar99 = vmovlhps_avx(auVar104,auVar105);
                        auVar101 = vunpckhpd_avx(auVar104,auVar105);
                        auVar100 = vmovlhps_avx(auVar103,auVar102);
                        auVar102 = vunpckhpd_avx(auVar103,auVar102);
                        *pauVar47 = auVar99;
                        *(undefined1 (*) [16])(*pauVar47 + lVar60 * 4) = auVar101;
                        *(undefined1 (*) [16])(*pauVar47 + lVar85 * 4) = auVar100;
                        *(undefined1 (*) [16])(*pauVar47 + lVar39 * 4) = auVar102;
                        pauVar47 = pauVar47 + 1;
                      }
                      else if (iVar61 == 4) {
                        *pauVar47 = auVar99;
                        pauVar47[1] = auVar100;
                        pauVar47[2] = auVar101;
                        pauVar47[3] = auVar102;
                        pauVar47 = pauVar47 + 4;
                      }
                      pauVar78 = pauVar78 + 1;
                      uVar75 = uVar64 + 7;
                      uVar64 = uVar64 + 4;
                    }
                    uVar75 = uVar64 | 1;
                    while ((int)uVar75 < (int)uVar79) {
                      if (iVar59 == 0) {
                        if (pauVar40 == (undefined1 (*) [64])0x0) {
                          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar126 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          auVar127 = ZEXT1664(*(undefined1 (*) [16])*pauVar40);
                          auVar126 = ZEXT1664(*(undefined1 (*) [16])*pauVar40);
                        }
                      }
                      else {
                        auVar127 = ZEXT1664(*(undefined1 (*) [16])*pauVar78);
                        auVar126 = ZEXT1664(*(undefined1 (*) [16])(*pauVar78 + 0x10));
                      }
                      auVar100 = auVar126._0_16_;
                      auVar99 = auVar127._0_16_;
                      if (0 < iVar56) {
                        lVar77 = 0;
                        uVar76 = uVar65;
                        do {
                          uVar168 = *(undefined4 *)(*pauVar50 + lVar77);
                          auVar8._4_4_ = uVar168;
                          auVar8._0_4_ = uVar168;
                          auVar8._8_4_ = uVar168;
                          auVar8._12_4_ = uVar168;
                          auVar99 = vfmadd231ps_avx512vl
                                              (auVar127._0_16_,
                                               *(undefined1 (*) [16])(*pauVar53 + lVar77 * 2),auVar8
                                              );
                          auVar127 = ZEXT1664(auVar99);
                          uVar168 = *(undefined4 *)(*pauVar50 + lVar77 + 4);
                          auVar9._4_4_ = uVar168;
                          auVar9._0_4_ = uVar168;
                          auVar9._8_4_ = uVar168;
                          auVar9._12_4_ = uVar168;
                          auVar100 = vfmadd231ps_avx512vl
                                               (auVar126._0_16_,
                                                *(undefined1 (*) [16])(*pauVar53 + lVar77 * 2),
                                                auVar9);
                          auVar126 = ZEXT1664(auVar100);
                          lVar77 = lVar77 + 8;
                          uVar75 = (int)uVar76 - 1;
                          uVar76 = (ulong)uVar75;
                        } while (uVar75 != 0);
                        pauVar50 = (undefined1 (*) [16])(*pauVar50 + uVar46 * 8 + 8);
                      }
                      if (iVar38 < K) {
                        *(undefined1 (*) [16])*pauVar78 = auVar99;
                        *(undefined1 (*) [16])(*pauVar78 + 0x10) = auVar100;
                      }
                      else if (iVar61 == 1) {
                        *(int *)*pauVar47 = auVar99._0_4_;
                        uVar168 = vextractps_avx(auVar99,1);
                        *(undefined4 *)(*pauVar47 + lVar60 * 4) = uVar168;
                        uVar168 = vextractps_avx(auVar99,2);
                        *(undefined4 *)(*pauVar47 + lVar85 * 4) = uVar168;
                        uVar168 = vextractps_avx(auVar99,3);
                        *(undefined4 *)(*pauVar47 + (long)(iVar73 * 3) * 4) = uVar168;
                        *(int *)(*pauVar47 + 4) = auVar100._0_4_;
                        uVar168 = vextractps_avx(auVar100,1);
                        *(undefined4 *)
                         (*pauVar47 + ((long)((sVar1 << 0x20) + 0x100000000) >> 0x20) * 4) = uVar168
                        ;
                        uVar168 = vextractps_avx(auVar100,2);
                        *(undefined4 *)(*pauVar47 + (long)(iVar73 * 2 + 1) * 4) = uVar168;
                        uVar168 = vextractps_avx(auVar100,3);
                        *(undefined4 *)(*pauVar47 + (long)(iVar73 * 3 + 1) * 4) = uVar168;
                        pauVar47 = (undefined1 (*) [16])(*pauVar47 + 8);
                      }
                      else if (iVar61 == 4) {
                        *pauVar47 = auVar99;
                        pauVar47[1] = auVar100;
                        pauVar47 = pauVar47 + 2;
                      }
                      pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x20);
                      uVar75 = uVar64 + 3;
                      uVar64 = uVar64 + 2;
                    }
                    if ((int)uVar64 < (int)uVar79) {
                      do {
                        if (iVar59 == 0) {
                          if (pauVar40 == (undefined1 (*) [64])0x0) {
                            auVar126 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar126 = ZEXT1664(*(undefined1 (*) [16])*pauVar40);
                          }
                        }
                        else {
                          auVar126 = ZEXT1664(*(undefined1 (*) [16])*pauVar78);
                        }
                        auVar99 = auVar126._0_16_;
                        if (0 < iVar56) {
                          lVar77 = 0;
                          uVar76 = uVar65;
                          do {
                            uVar168 = *(undefined4 *)(*pauVar50 + lVar77);
                            auVar10._4_4_ = uVar168;
                            auVar10._0_4_ = uVar168;
                            auVar10._8_4_ = uVar168;
                            auVar10._12_4_ = uVar168;
                            auVar99 = vfmadd231ps_avx512vl
                                                (auVar126._0_16_,
                                                 *(undefined1 (*) [16])(*pauVar53 + lVar77 * 4),
                                                 auVar10);
                            auVar126 = ZEXT1664(auVar99);
                            lVar77 = lVar77 + 4;
                            uVar75 = (int)uVar76 - 1;
                            uVar76 = (ulong)uVar75;
                          } while (uVar75 != 0);
                          pauVar50 = (undefined1 (*) [16])(*pauVar50 + uVar46 * 4 + 4);
                        }
                        if (iVar38 < K) {
                          *(undefined1 (*) [16])*pauVar78 = auVar99;
                        }
                        else if (iVar61 == 1) {
                          *(int *)*pauVar47 = auVar99._0_4_;
                          uVar168 = vextractps_avx(auVar99,1);
                          *(undefined4 *)(*pauVar47 + lVar60 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar99,2);
                          *(undefined4 *)(*pauVar47 + lVar85 * 4) = uVar168;
                          uVar168 = vextractps_avx(auVar99,3);
                          *(undefined4 *)(*pauVar47 + lVar39 * 4) = uVar168;
                          pauVar47 = (undefined1 (*) [16])(*pauVar47 + 4);
                        }
                        else if (iVar61 == 4) {
                          *pauVar47 = auVar99;
                          pauVar47 = pauVar47 + 1;
                        }
                        pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x10);
                        uVar64 = uVar64 + 1;
                      } while (uVar64 != uVar79);
                    }
                    pauVar53 = (undefined1 (*) [64])(*pauVar53 + (long)(iVar56 * 4) * 4);
                    uVar76 = uVar45 + 4;
                    lVar77 = uVar45 + 7;
                    uVar45 = uVar76;
                  } while (lVar77 < local_1f0);
                }
                if ((int)((uint)uVar76 | 1) < (int)uVar48) {
                  lVar85 = (long)iVar73;
                  uVar65 = (ulong)(iVar56 - 1);
                  auVar126 = vpbroadcastq_avx512f();
                  uVar45 = (ulong)(iVar56 + 0xfU & 0xfffffff0);
                  if ((int)uVar82 < (int)uVar80) {
                    uVar80 = uVar82;
                  }
                  uVar46 = (long)(int)(uint)uVar76;
                  do {
                    pauVar69 = (undefined1 (*) [64])
                               ((long)local_240->data + uVar46 * 4 + local_200 * 4);
                    if (pauVar40 != (undefined1 (*) [64])0x0) {
                      pauVar40 = pauVar69;
                    }
                    uVar82 = 0;
                    pauVar47 = (undefined1 (*) [16])
                               ((long)local_248->data +
                               local_1a0 * 4 + (uVar46 + local_200) * lVar85 * 4);
                    pauVar50 = pauVar42;
                    if (0xb < (int)uVar79) {
                      uVar64 = 0;
                      do {
                        if (iVar59 == 0) {
                          if (pauVar40 == (undefined1 (*) [64])0x0) {
                            auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar132 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            uVar168 = *(undefined4 *)*pauVar40;
                            auVar169._4_4_ = uVar168;
                            auVar169._0_4_ = uVar168;
                            auVar169._8_4_ = uVar168;
                            auVar169._12_4_ = uVar168;
                            auVar127 = ZEXT1664(auVar169);
                            uVar168 = *(undefined4 *)(*pauVar40 + 4);
                            auVar194._4_4_ = uVar168;
                            auVar194._0_4_ = uVar168;
                            auVar194._8_4_ = uVar168;
                            auVar194._12_4_ = uVar168;
                            auVar130 = ZEXT1664(auVar194);
                            auVar128 = ZEXT1664(auVar169);
                            auVar129 = ZEXT1664(auVar169);
                            auVar131 = ZEXT1664(auVar194);
                            auVar132 = ZEXT1664(auVar194);
                          }
                        }
                        else {
                          auVar99 = vshufps_avx(*(undefined1 (*) [16])*pauVar78,
                                                *(undefined1 (*) [16])(*pauVar78 + 0x10),0x88);
                          auVar127 = ZEXT1664(auVar99);
                          auVar99 = vshufps_avx(*(undefined1 (*) [16])(*pauVar78 + 0x20),
                                                *(undefined1 (*) [16])(*pauVar78 + 0x30),0x88);
                          auVar128 = ZEXT1664(auVar99);
                          auVar99 = vshufps_avx(*(undefined1 (*) [16])pauVar78[1],
                                                *(undefined1 (*) [16])(pauVar78[1] + 0x10),0x88);
                          auVar129 = ZEXT1664(auVar99);
                          auVar99 = vshufps_avx(*(undefined1 (*) [16])*pauVar78,
                                                *(undefined1 (*) [16])(*pauVar78 + 0x10),0xdd);
                          auVar130 = ZEXT1664(auVar99);
                          auVar99 = vshufps_avx(*(undefined1 (*) [16])(*pauVar78 + 0x20),
                                                *(undefined1 (*) [16])(*pauVar78 + 0x30),0xdd);
                          auVar131 = ZEXT1664(auVar99);
                          auVar99 = vshufps_avx(*(undefined1 (*) [16])pauVar78[1],
                                                *(undefined1 (*) [16])(pauVar78[1] + 0x10),0xdd);
                          auVar132 = ZEXT1664(auVar99);
                        }
                        auVar104 = auVar132._0_16_;
                        auVar101 = auVar129._0_16_;
                        auVar103 = auVar131._0_16_;
                        auVar100 = auVar128._0_16_;
                        auVar102 = auVar130._0_16_;
                        auVar99 = auVar127._0_16_;
                        if (0 < iVar56) {
                          lVar39 = 0;
                          pauVar71 = pauVar50;
                          do {
                            uVar168 = *(undefined4 *)(*pauVar53 + lVar39 * 8);
                            auVar206._4_4_ = uVar168;
                            auVar206._0_4_ = uVar168;
                            auVar206._8_4_ = uVar168;
                            auVar206._12_4_ = uVar168;
                            auVar99 = vfmadd231ps_fma(auVar127._0_16_,auVar206,*pauVar71);
                            auVar127 = ZEXT1664(auVar99);
                            auVar100 = vfmadd231ps_fma(auVar128._0_16_,auVar206,pauVar71[1]);
                            auVar128 = ZEXT1664(auVar100);
                            auVar101 = vfmadd231ps_fma(auVar129._0_16_,pauVar71[2],auVar206);
                            auVar129 = ZEXT1664(auVar101);
                            uVar168 = *(undefined4 *)(*pauVar53 + lVar39 * 8 + 4);
                            auVar207._4_4_ = uVar168;
                            auVar207._0_4_ = uVar168;
                            auVar207._8_4_ = uVar168;
                            auVar207._12_4_ = uVar168;
                            auVar102 = vfmadd231ps_fma(auVar130._0_16_,auVar207,*pauVar71);
                            auVar130 = ZEXT1664(auVar102);
                            auVar103 = vfmadd231ps_fma(auVar131._0_16_,auVar207,pauVar71[1]);
                            auVar131 = ZEXT1664(auVar103);
                            auVar104 = vfmadd231ps_fma(auVar132._0_16_,auVar207,pauVar71[2]);
                            auVar132 = ZEXT1664(auVar104);
                            pauVar71 = pauVar71 + 3;
                            lVar39 = lVar39 + 1;
                          } while (uVar80 != (uint)lVar39);
                          pauVar50 = pauVar50 + uVar65 * 3 + 3;
                        }
                        if (iVar38 < K) {
                          auVar105 = vunpcklps_avx(auVar99,auVar102);
                          auVar99 = vunpckhps_avx(auVar99,auVar102);
                          auVar102 = vunpcklps_avx(auVar100,auVar103);
                          auVar100 = vunpckhps_avx(auVar100,auVar103);
                          auVar103 = vunpcklps_avx(auVar101,auVar104);
                          auVar101 = vunpckhps_avx(auVar101,auVar104);
                          *(undefined1 (*) [16])*pauVar78 = auVar105;
                          *(undefined1 (*) [16])(*pauVar78 + 0x10) = auVar99;
                          *(undefined1 (*) [16])(*pauVar78 + 0x20) = auVar102;
                          *(undefined1 (*) [16])(*pauVar78 + 0x30) = auVar100;
                          *(undefined1 (*) [16])pauVar78[1] = auVar103;
                          *(undefined1 (*) [16])(pauVar78[1] + 0x10) = auVar101;
                        }
                        else {
                          *pauVar47 = auVar99;
                          pauVar47[1] = auVar100;
                          pauVar47[2] = auVar101;
                          *(undefined1 (*) [16])(*pauVar47 + lVar85 * 4) = auVar102;
                          *(undefined1 (*) [16])(pauVar47[1] + lVar85 * 4) = auVar103;
                          *(undefined1 (*) [16])(pauVar47[2] + lVar85 * 4) = auVar104;
                          pauVar47 = pauVar47 + 3;
                        }
                        pauVar78 = (undefined1 (*) [64])(pauVar78[1] + 0x20);
                        uVar82 = uVar64 + 0xc;
                        iVar61 = uVar64 + 0x17;
                        uVar64 = uVar82;
                      } while (iVar61 < (int)uVar79);
                    }
                    iVar61 = uVar82 + 7;
                    while (iVar61 < (int)uVar79) {
                      if (iVar59 == 0) {
                        if (pauVar40 == (undefined1 (*) [64])0x0) {
                          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          uVar168 = *(undefined4 *)*pauVar40;
                          auVar170._4_4_ = uVar168;
                          auVar170._0_4_ = uVar168;
                          auVar170._8_4_ = uVar168;
                          auVar170._12_4_ = uVar168;
                          auVar127 = ZEXT1664(auVar170);
                          uVar168 = *(undefined4 *)(*pauVar40 + 4);
                          auVar192._4_4_ = uVar168;
                          auVar192._0_4_ = uVar168;
                          auVar192._8_4_ = uVar168;
                          auVar192._12_4_ = uVar168;
                          auVar129 = ZEXT1664(auVar192);
                          auVar128 = ZEXT1664(auVar170);
                          auVar130 = ZEXT1664(auVar192);
                        }
                      }
                      else {
                        auVar99 = vshufps_avx(*(undefined1 (*) [16])*pauVar78,
                                              *(undefined1 (*) [16])(*pauVar78 + 0x10),0x88);
                        auVar127 = ZEXT1664(auVar99);
                        auVar99 = vshufps_avx(*(undefined1 (*) [16])(*pauVar78 + 0x20),
                                              *(undefined1 (*) [16])(*pauVar78 + 0x30),0x88);
                        auVar128 = ZEXT1664(auVar99);
                        auVar99 = vshufps_avx(*(undefined1 (*) [16])*pauVar78,
                                              *(undefined1 (*) [16])(*pauVar78 + 0x10),0xdd);
                        auVar129 = ZEXT1664(auVar99);
                        auVar99 = vshufps_avx(*(undefined1 (*) [16])(*pauVar78 + 0x20),
                                              *(undefined1 (*) [16])(*pauVar78 + 0x30),0xdd);
                        auVar130 = ZEXT1664(auVar99);
                      }
                      auVar102 = auVar130._0_16_;
                      auVar100 = auVar128._0_16_;
                      auVar101 = auVar129._0_16_;
                      auVar99 = auVar127._0_16_;
                      if (0 < iVar56) {
                        lVar39 = 0;
                        pauVar71 = pauVar50;
                        do {
                          uVar168 = *(undefined4 *)(*pauVar53 + lVar39 * 8);
                          auVar203._4_4_ = uVar168;
                          auVar203._0_4_ = uVar168;
                          auVar203._8_4_ = uVar168;
                          auVar203._12_4_ = uVar168;
                          auVar99 = vfmadd231ps_fma(auVar127._0_16_,auVar203,*pauVar71);
                          auVar127 = ZEXT1664(auVar99);
                          auVar100 = vfmadd231ps_fma(auVar128._0_16_,pauVar71[1],auVar203);
                          auVar128 = ZEXT1664(auVar100);
                          uVar168 = *(undefined4 *)(*pauVar53 + lVar39 * 8 + 4);
                          auVar204._4_4_ = uVar168;
                          auVar204._0_4_ = uVar168;
                          auVar204._8_4_ = uVar168;
                          auVar204._12_4_ = uVar168;
                          auVar101 = vfmadd231ps_fma(auVar129._0_16_,auVar204,*pauVar71);
                          auVar129 = ZEXT1664(auVar101);
                          auVar102 = vfmadd231ps_fma(auVar130._0_16_,auVar204,pauVar71[1]);
                          auVar130 = ZEXT1664(auVar102);
                          pauVar71 = pauVar71 + 2;
                          lVar39 = lVar39 + 1;
                        } while (uVar80 != (uint)lVar39);
                        pauVar50 = pauVar50 + uVar65 * 2 + 2;
                      }
                      if (iVar38 < K) {
                        auVar103 = vunpcklps_avx(auVar99,auVar101);
                        auVar99 = vunpckhps_avx(auVar99,auVar101);
                        auVar101 = vunpcklps_avx(auVar100,auVar102);
                        auVar100 = vunpckhps_avx(auVar100,auVar102);
                        *(undefined1 (*) [16])*pauVar78 = auVar103;
                        *(undefined1 (*) [16])(*pauVar78 + 0x10) = auVar99;
                        *(undefined1 (*) [16])(*pauVar78 + 0x20) = auVar101;
                        *(undefined1 (*) [16])(*pauVar78 + 0x30) = auVar100;
                      }
                      else {
                        *pauVar47 = auVar99;
                        pauVar47[1] = auVar100;
                        *(undefined1 (*) [16])(*pauVar47 + lVar85 * 4) = auVar101;
                        *(undefined1 (*) [16])(pauVar47[1] + lVar85 * 4) = auVar102;
                        pauVar47 = pauVar47 + 2;
                      }
                      pauVar78 = pauVar78 + 1;
                      iVar61 = uVar82 + 0xf;
                      uVar82 = uVar82 + 8;
                    }
                    uVar64 = uVar82 | 3;
                    while ((int)uVar64 < (int)uVar79) {
                      if (iVar59 == 0) {
                        if (pauVar40 == (undefined1 (*) [64])0x0) {
                          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          uVar168 = *(undefined4 *)*pauVar40;
                          auVar127 = ZEXT1664(CONCAT412(uVar168,CONCAT48(uVar168,CONCAT44(uVar168,
                                                  uVar168))));
                          uVar168 = *(undefined4 *)(*pauVar40 + 4);
                          auVar128 = ZEXT1664(CONCAT412(uVar168,CONCAT48(uVar168,CONCAT44(uVar168,
                                                  uVar168))));
                        }
                      }
                      else {
                        auVar99 = vshufps_avx(*(undefined1 (*) [16])*pauVar78,
                                              *(undefined1 (*) [16])(*pauVar78 + 0x10),0x88);
                        auVar127 = ZEXT1664(auVar99);
                        auVar99 = vshufps_avx(*(undefined1 (*) [16])*pauVar78,
                                              *(undefined1 (*) [16])(*pauVar78 + 0x10),0xdd);
                        auVar128 = ZEXT1664(auVar99);
                      }
                      auVar100 = auVar128._0_16_;
                      auVar99 = auVar127._0_16_;
                      if (0 < iVar56) {
                        lVar39 = 0;
                        pauVar71 = pauVar50;
                        do {
                          uVar168 = *(undefined4 *)(*pauVar53 + lVar39 * 8);
                          auVar11._4_4_ = uVar168;
                          auVar11._0_4_ = uVar168;
                          auVar11._8_4_ = uVar168;
                          auVar11._12_4_ = uVar168;
                          auVar99 = vfmadd231ps_avx512vl(auVar127._0_16_,*pauVar71,auVar11);
                          auVar127 = ZEXT1664(auVar99);
                          uVar168 = *(undefined4 *)(*pauVar53 + lVar39 * 8 + 4);
                          auVar12._4_4_ = uVar168;
                          auVar12._0_4_ = uVar168;
                          auVar12._8_4_ = uVar168;
                          auVar12._12_4_ = uVar168;
                          auVar100 = vfmadd231ps_avx512vl(auVar128._0_16_,*pauVar71,auVar12);
                          auVar128 = ZEXT1664(auVar100);
                          pauVar71 = pauVar71 + 1;
                          lVar39 = lVar39 + 1;
                        } while (uVar80 != (uint)lVar39);
                        pauVar50 = pauVar50 + uVar65 + 1;
                      }
                      if (iVar38 < K) {
                        auVar101 = vunpcklps_avx(auVar99,auVar100);
                        auVar99 = vunpckhps_avx(auVar99,auVar100);
                        *(undefined1 (*) [16])*pauVar78 = auVar101;
                        *(undefined1 (*) [16])(*pauVar78 + 0x10) = auVar99;
                      }
                      else {
                        *pauVar47 = auVar99;
                        *(undefined1 (*) [16])(*pauVar47 + lVar85 * 4) = auVar100;
                        pauVar47 = pauVar47 + 1;
                      }
                      pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x20);
                      uVar64 = uVar82 + 7;
                      uVar82 = uVar82 + 4;
                    }
                    uVar64 = uVar82 | 1;
                    while ((int)uVar64 < (int)uVar79) {
                      if (iVar59 == 0) {
                        if (pauVar40 == (undefined1 (*) [64])0x0) {
                          uVar168 = 0;
                          uVar182 = 0;
                          uVar199 = 0;
                          uVar181 = 0;
                        }
                        else {
                          uVar168 = *(undefined4 *)*pauVar40;
                          uVar182 = *(undefined4 *)(*pauVar40 + 4);
                          uVar199 = uVar168;
                          uVar181 = uVar182;
                        }
                      }
                      else {
                        uVar168 = *(undefined4 *)*pauVar78;
                        uVar182 = *(undefined4 *)(*pauVar78 + 4);
                        uVar199 = *(undefined4 *)(*pauVar78 + 8);
                        uVar181 = *(undefined4 *)(*pauVar78 + 0xc);
                      }
                      if (0 < iVar56) {
                        uVar3 = SUB128(ZEXT812(0),4);
                        uVar76 = 0;
                        auVar131 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                        auVar132 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        pauVar70 = pauVar53;
                        pauVar71 = pauVar50;
                        auVar127 = ZEXT1264(CONCAT84(uVar3,uVar168));
                        auVar128 = ZEXT1264(CONCAT84(uVar3,uVar199));
                        auVar129 = ZEXT1264(CONCAT84(uVar3,uVar182));
                        auVar130 = ZEXT1264(CONCAT84(uVar3,uVar181));
                        do {
                          auVar136 = auVar130;
                          auVar135 = auVar129;
                          auVar134 = auVar128;
                          auVar133 = auVar127;
                          auVar127 = vpbroadcastq_avx512f();
                          auVar128 = vporq_avx512f(auVar127,auVar131);
                          auVar127 = vporq_avx512f(auVar127,auVar132);
                          uVar3 = vpcmpuq_avx512f(auVar127,auVar126,2);
                          bVar34 = (byte)uVar3;
                          uVar3 = vpcmpuq_avx512f(auVar128,auVar126,2);
                          bVar35 = (byte)uVar3;
                          uVar90 = CONCAT11(bVar35,bVar34);
                          auVar127 = vgatherdps_avx512f(*(undefined4 *)(*pauVar70 + uVar76));
                          auVar130._4_4_ = (uint)((byte)(uVar90 >> 1) & 1) * auVar127._4_4_;
                          auVar130._0_4_ = (uint)(bVar34 & 1) * auVar127._0_4_;
                          auVar130._8_4_ = (uint)((byte)(uVar90 >> 2) & 1) * auVar127._8_4_;
                          auVar130._12_4_ = (uint)((byte)(uVar90 >> 3) & 1) * auVar127._12_4_;
                          auVar130._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * auVar127._16_4_;
                          auVar130._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * auVar127._20_4_;
                          auVar130._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * auVar127._24_4_;
                          auVar130._28_4_ = (uint)((byte)(uVar90 >> 7) & 1) * auVar127._28_4_;
                          auVar130._32_4_ = (uint)(bVar35 & 1) * auVar127._32_4_;
                          auVar130._36_4_ = (uint)(bVar35 >> 1 & 1) * auVar127._36_4_;
                          auVar130._40_4_ = (uint)(bVar35 >> 2 & 1) * auVar127._40_4_;
                          auVar130._44_4_ = (uint)(bVar35 >> 3 & 1) * auVar127._44_4_;
                          auVar130._48_4_ = (uint)(bVar35 >> 4 & 1) * auVar127._48_4_;
                          auVar130._52_4_ = (uint)(bVar35 >> 5 & 1) * auVar127._52_4_;
                          auVar130._56_4_ = (uint)(bVar35 >> 6 & 1) * auVar127._56_4_;
                          auVar130._60_4_ = (uint)(bVar35 >> 7) * auVar127._60_4_;
                          auVar127 = vgatherdps_avx512f(*(undefined4 *)(*pauVar71 + uVar76));
                          auVar148._4_4_ = (uint)((byte)(uVar90 >> 1) & 1) * auVar127._4_4_;
                          auVar148._0_4_ = (uint)(bVar34 & 1) * auVar127._0_4_;
                          auVar148._8_4_ = (uint)((byte)(uVar90 >> 2) & 1) * auVar127._8_4_;
                          auVar148._12_4_ = (uint)((byte)(uVar90 >> 3) & 1) * auVar127._12_4_;
                          auVar148._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * auVar127._16_4_;
                          auVar148._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * auVar127._20_4_;
                          auVar148._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * auVar127._24_4_;
                          auVar148._28_4_ = (uint)((byte)(uVar90 >> 7) & 1) * auVar127._28_4_;
                          auVar148._32_4_ = (uint)(bVar35 & 1) * auVar127._32_4_;
                          auVar148._36_4_ = (uint)(bVar35 >> 1 & 1) * auVar127._36_4_;
                          auVar148._40_4_ = (uint)(bVar35 >> 2 & 1) * auVar127._40_4_;
                          auVar148._44_4_ = (uint)(bVar35 >> 3 & 1) * auVar127._44_4_;
                          auVar148._48_4_ = (uint)(bVar35 >> 4 & 1) * auVar127._48_4_;
                          auVar148._52_4_ = (uint)(bVar35 >> 5 & 1) * auVar127._52_4_;
                          auVar148._56_4_ = (uint)(bVar35 >> 6 & 1) * auVar127._56_4_;
                          auVar148._60_4_ = (uint)(bVar35 >> 7) * auVar127._60_4_;
                          auVar127 = vfmadd213ps_avx512f(auVar130,auVar148,auVar133);
                          auVar128 = vgatherdps_avx512f(*(undefined4 *)(*pauVar70 + uVar76 + 4));
                          auVar149._4_4_ = (uint)((byte)(uVar90 >> 1) & 1) * auVar128._4_4_;
                          auVar149._0_4_ = (uint)(bVar34 & 1) * auVar128._0_4_;
                          auVar149._8_4_ = (uint)((byte)(uVar90 >> 2) & 1) * auVar128._8_4_;
                          auVar149._12_4_ = (uint)((byte)(uVar90 >> 3) & 1) * auVar128._12_4_;
                          auVar149._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * auVar128._16_4_;
                          auVar149._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * auVar128._20_4_;
                          auVar149._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * auVar128._24_4_;
                          auVar149._28_4_ = (uint)((byte)(uVar90 >> 7) & 1) * auVar128._28_4_;
                          auVar149._32_4_ = (uint)(bVar35 & 1) * auVar128._32_4_;
                          auVar149._36_4_ = (uint)(bVar35 >> 1 & 1) * auVar128._36_4_;
                          auVar149._40_4_ = (uint)(bVar35 >> 2 & 1) * auVar128._40_4_;
                          auVar149._44_4_ = (uint)(bVar35 >> 3 & 1) * auVar128._44_4_;
                          auVar149._48_4_ = (uint)(bVar35 >> 4 & 1) * auVar128._48_4_;
                          auVar149._52_4_ = (uint)(bVar35 >> 5 & 1) * auVar128._52_4_;
                          auVar149._56_4_ = (uint)(bVar35 >> 6 & 1) * auVar128._56_4_;
                          auVar149._60_4_ = (uint)(bVar35 >> 7) * auVar128._60_4_;
                          auVar129 = vfmadd213ps_avx512f(auVar148,auVar149,auVar135);
                          auVar128 = vgatherdps_avx512f(*(undefined4 *)(*pauVar71 + uVar76 + 4));
                          auVar150._4_4_ = (uint)((byte)(uVar90 >> 1) & 1) * auVar128._4_4_;
                          auVar150._0_4_ = (uint)(bVar34 & 1) * auVar128._0_4_;
                          auVar150._8_4_ = (uint)((byte)(uVar90 >> 2) & 1) * auVar128._8_4_;
                          auVar150._12_4_ = (uint)((byte)(uVar90 >> 3) & 1) * auVar128._12_4_;
                          auVar150._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * auVar128._16_4_;
                          auVar150._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * auVar128._20_4_;
                          auVar150._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * auVar128._24_4_;
                          auVar150._28_4_ = (uint)((byte)(uVar90 >> 7) & 1) * auVar128._28_4_;
                          auVar150._32_4_ = (uint)(bVar35 & 1) * auVar128._32_4_;
                          auVar150._36_4_ = (uint)(bVar35 >> 1 & 1) * auVar128._36_4_;
                          auVar150._40_4_ = (uint)(bVar35 >> 2 & 1) * auVar128._40_4_;
                          auVar150._44_4_ = (uint)(bVar35 >> 3 & 1) * auVar128._44_4_;
                          auVar150._48_4_ = (uint)(bVar35 >> 4 & 1) * auVar128._48_4_;
                          auVar150._52_4_ = (uint)(bVar35 >> 5 & 1) * auVar128._52_4_;
                          auVar150._56_4_ = (uint)(bVar35 >> 6 & 1) * auVar128._56_4_;
                          auVar150._60_4_ = (uint)(bVar35 >> 7) * auVar128._60_4_;
                          auVar128 = vfmadd213ps_avx512f(auVar130,auVar150,auVar134);
                          auVar130 = vfmadd213ps_avx512f(auVar150,auVar149,auVar136);
                          uVar76 = uVar76 + 0x10;
                          pauVar70 = pauVar70 + 2;
                          pauVar71 = pauVar71 + 8;
                        } while (uVar45 != uVar76);
                        auVar151._0_4_ =
                             (uint)(bVar34 & 1) * auVar130._0_4_ |
                             (uint)!(bool)(bVar34 & 1) * auVar136._0_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 1) & 1);
                        auVar151._4_4_ =
                             (uint)bVar57 * auVar130._4_4_ | (uint)!bVar57 * auVar136._4_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 2) & 1);
                        auVar151._8_4_ =
                             (uint)bVar57 * auVar130._8_4_ | (uint)!bVar57 * auVar136._8_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 3) & 1);
                        auVar151._12_4_ =
                             (uint)bVar57 * auVar130._12_4_ | (uint)!bVar57 * auVar136._12_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 4) & 1);
                        auVar151._16_4_ =
                             (uint)bVar57 * auVar130._16_4_ | (uint)!bVar57 * auVar136._16_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 5) & 1);
                        auVar151._20_4_ =
                             (uint)bVar57 * auVar130._20_4_ | (uint)!bVar57 * auVar136._20_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 6) & 1);
                        auVar151._24_4_ =
                             (uint)bVar57 * auVar130._24_4_ | (uint)!bVar57 * auVar136._24_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 7) & 1);
                        auVar151._28_4_ =
                             (uint)bVar57 * auVar130._28_4_ | (uint)!bVar57 * auVar136._28_4_;
                        auVar151._32_4_ =
                             (uint)(bVar35 & 1) * auVar130._32_4_ |
                             (uint)!(bool)(bVar35 & 1) * auVar136._32_4_;
                        bVar57 = (bool)(bVar35 >> 1 & 1);
                        auVar151._36_4_ =
                             (uint)bVar57 * auVar130._36_4_ | (uint)!bVar57 * auVar136._36_4_;
                        bVar57 = (bool)(bVar35 >> 2 & 1);
                        auVar151._40_4_ =
                             (uint)bVar57 * auVar130._40_4_ | (uint)!bVar57 * auVar136._40_4_;
                        bVar57 = (bool)(bVar35 >> 3 & 1);
                        auVar151._44_4_ =
                             (uint)bVar57 * auVar130._44_4_ | (uint)!bVar57 * auVar136._44_4_;
                        bVar57 = (bool)(bVar35 >> 4 & 1);
                        auVar151._48_4_ =
                             (uint)bVar57 * auVar130._48_4_ | (uint)!bVar57 * auVar136._48_4_;
                        bVar57 = (bool)(bVar35 >> 5 & 1);
                        auVar151._52_4_ =
                             (uint)bVar57 * auVar130._52_4_ | (uint)!bVar57 * auVar136._52_4_;
                        bVar57 = (bool)(bVar35 >> 6 & 1);
                        auVar151._56_4_ =
                             (uint)bVar57 * auVar130._56_4_ | (uint)!bVar57 * auVar136._56_4_;
                        auVar151._60_4_ =
                             (uint)(bVar35 >> 7) * auVar130._60_4_ |
                             (uint)!(bool)(bVar35 >> 7) * auVar136._60_4_;
                        auVar113 = vextractf64x4_avx512f(auVar151,1);
                        auVar130 = vaddps_avx512f(auVar151,ZEXT3264(auVar113));
                        auVar183._0_4_ = auVar130._16_4_ + auVar130._0_4_;
                        auVar183._4_4_ = auVar130._20_4_ + auVar130._4_4_;
                        auVar183._8_4_ = auVar130._24_4_ + auVar130._8_4_;
                        auVar183._12_4_ = auVar130._28_4_ + auVar130._12_4_;
                        auVar99 = vshufpd_avx(auVar183,auVar183,1);
                        auVar184._0_4_ = auVar99._0_4_ + auVar183._0_4_;
                        auVar184._4_4_ = auVar99._4_4_ + auVar183._4_4_;
                        auVar184._8_4_ = auVar99._8_4_ + auVar183._8_4_;
                        auVar184._12_4_ = auVar99._12_4_ + auVar183._12_4_;
                        auVar99 = vhaddps_avx(auVar184,auVar184);
                        uVar181 = auVar99._0_4_;
                        auVar152._0_4_ =
                             (uint)(bVar34 & 1) * auVar129._0_4_ |
                             (uint)!(bool)(bVar34 & 1) * auVar135._0_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 1) & 1);
                        auVar152._4_4_ =
                             (uint)bVar57 * auVar129._4_4_ | (uint)!bVar57 * auVar135._4_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 2) & 1);
                        auVar152._8_4_ =
                             (uint)bVar57 * auVar129._8_4_ | (uint)!bVar57 * auVar135._8_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 3) & 1);
                        auVar152._12_4_ =
                             (uint)bVar57 * auVar129._12_4_ | (uint)!bVar57 * auVar135._12_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 4) & 1);
                        auVar152._16_4_ =
                             (uint)bVar57 * auVar129._16_4_ | (uint)!bVar57 * auVar135._16_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 5) & 1);
                        auVar152._20_4_ =
                             (uint)bVar57 * auVar129._20_4_ | (uint)!bVar57 * auVar135._20_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 6) & 1);
                        auVar152._24_4_ =
                             (uint)bVar57 * auVar129._24_4_ | (uint)!bVar57 * auVar135._24_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 7) & 1);
                        auVar152._28_4_ =
                             (uint)bVar57 * auVar129._28_4_ | (uint)!bVar57 * auVar135._28_4_;
                        auVar152._32_4_ =
                             (uint)(bVar35 & 1) * auVar129._32_4_ |
                             (uint)!(bool)(bVar35 & 1) * auVar135._32_4_;
                        bVar57 = (bool)(bVar35 >> 1 & 1);
                        auVar152._36_4_ =
                             (uint)bVar57 * auVar129._36_4_ | (uint)!bVar57 * auVar135._36_4_;
                        bVar57 = (bool)(bVar35 >> 2 & 1);
                        auVar152._40_4_ =
                             (uint)bVar57 * auVar129._40_4_ | (uint)!bVar57 * auVar135._40_4_;
                        bVar57 = (bool)(bVar35 >> 3 & 1);
                        auVar152._44_4_ =
                             (uint)bVar57 * auVar129._44_4_ | (uint)!bVar57 * auVar135._44_4_;
                        bVar57 = (bool)(bVar35 >> 4 & 1);
                        auVar152._48_4_ =
                             (uint)bVar57 * auVar129._48_4_ | (uint)!bVar57 * auVar135._48_4_;
                        bVar57 = (bool)(bVar35 >> 5 & 1);
                        auVar152._52_4_ =
                             (uint)bVar57 * auVar129._52_4_ | (uint)!bVar57 * auVar135._52_4_;
                        bVar57 = (bool)(bVar35 >> 6 & 1);
                        auVar152._56_4_ =
                             (uint)bVar57 * auVar129._56_4_ | (uint)!bVar57 * auVar135._56_4_;
                        auVar152._60_4_ =
                             (uint)(bVar35 >> 7) * auVar129._60_4_ |
                             (uint)!(bool)(bVar35 >> 7) * auVar135._60_4_;
                        auVar153._0_4_ =
                             (uint)(bVar34 & 1) * auVar128._0_4_ |
                             (uint)!(bool)(bVar34 & 1) * auVar134._0_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 1) & 1);
                        auVar153._4_4_ =
                             (uint)bVar57 * auVar128._4_4_ | (uint)!bVar57 * auVar134._4_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 2) & 1);
                        auVar153._8_4_ =
                             (uint)bVar57 * auVar128._8_4_ | (uint)!bVar57 * auVar134._8_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 3) & 1);
                        auVar153._12_4_ =
                             (uint)bVar57 * auVar128._12_4_ | (uint)!bVar57 * auVar134._12_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 4) & 1);
                        auVar153._16_4_ =
                             (uint)bVar57 * auVar128._16_4_ | (uint)!bVar57 * auVar134._16_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 5) & 1);
                        auVar153._20_4_ =
                             (uint)bVar57 * auVar128._20_4_ | (uint)!bVar57 * auVar134._20_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 6) & 1);
                        auVar153._24_4_ =
                             (uint)bVar57 * auVar128._24_4_ | (uint)!bVar57 * auVar134._24_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 7) & 1);
                        auVar153._28_4_ =
                             (uint)bVar57 * auVar128._28_4_ | (uint)!bVar57 * auVar134._28_4_;
                        auVar153._32_4_ =
                             (uint)(bVar35 & 1) * auVar128._32_4_ |
                             (uint)!(bool)(bVar35 & 1) * auVar134._32_4_;
                        bVar57 = (bool)(bVar35 >> 1 & 1);
                        auVar153._36_4_ =
                             (uint)bVar57 * auVar128._36_4_ | (uint)!bVar57 * auVar134._36_4_;
                        bVar57 = (bool)(bVar35 >> 2 & 1);
                        auVar153._40_4_ =
                             (uint)bVar57 * auVar128._40_4_ | (uint)!bVar57 * auVar134._40_4_;
                        bVar57 = (bool)(bVar35 >> 3 & 1);
                        auVar153._44_4_ =
                             (uint)bVar57 * auVar128._44_4_ | (uint)!bVar57 * auVar134._44_4_;
                        bVar57 = (bool)(bVar35 >> 4 & 1);
                        auVar153._48_4_ =
                             (uint)bVar57 * auVar128._48_4_ | (uint)!bVar57 * auVar134._48_4_;
                        bVar57 = (bool)(bVar35 >> 5 & 1);
                        auVar153._52_4_ =
                             (uint)bVar57 * auVar128._52_4_ | (uint)!bVar57 * auVar134._52_4_;
                        bVar57 = (bool)(bVar35 >> 6 & 1);
                        auVar153._56_4_ =
                             (uint)bVar57 * auVar128._56_4_ | (uint)!bVar57 * auVar134._56_4_;
                        auVar153._60_4_ =
                             (uint)(bVar35 >> 7) * auVar128._60_4_ |
                             (uint)!(bool)(bVar35 >> 7) * auVar134._60_4_;
                        auVar113 = vextractf64x4_avx512f(auVar153,1);
                        auVar128 = vaddps_avx512f(auVar153,ZEXT3264(auVar113));
                        auVar200._0_4_ = auVar128._0_4_ + auVar128._16_4_;
                        auVar200._4_4_ = auVar128._4_4_ + auVar128._20_4_;
                        auVar200._8_4_ = auVar128._8_4_ + auVar128._24_4_;
                        auVar200._12_4_ = auVar128._12_4_ + auVar128._28_4_;
                        auVar99 = vshufpd_avx(auVar200,auVar200,1);
                        auVar201._0_4_ = auVar200._0_4_ + auVar99._0_4_;
                        auVar201._4_4_ = auVar200._4_4_ + auVar99._4_4_;
                        auVar201._8_4_ = auVar200._8_4_ + auVar99._8_4_;
                        auVar201._12_4_ = auVar200._12_4_ + auVar99._12_4_;
                        auVar99 = vhaddps_avx(auVar201,auVar201);
                        uVar199 = auVar99._0_4_;
                        auVar113 = vextractf64x4_avx512f(auVar152,1);
                        auVar128 = vaddps_avx512f(auVar152,ZEXT3264(auVar113));
                        auVar195._0_4_ = auVar128._0_4_ + auVar128._16_4_;
                        auVar195._4_4_ = auVar128._4_4_ + auVar128._20_4_;
                        auVar195._8_4_ = auVar128._8_4_ + auVar128._24_4_;
                        auVar195._12_4_ = auVar128._12_4_ + auVar128._28_4_;
                        auVar99 = vshufpd_avx(auVar195,auVar195,1);
                        auVar196._0_4_ = auVar195._0_4_ + auVar99._0_4_;
                        auVar196._4_4_ = auVar195._4_4_ + auVar99._4_4_;
                        auVar196._8_4_ = auVar195._8_4_ + auVar99._8_4_;
                        auVar196._12_4_ = auVar195._12_4_ + auVar99._12_4_;
                        auVar99 = vhaddps_avx(auVar196,auVar196);
                        uVar182 = auVar99._0_4_;
                        auVar154._0_4_ =
                             (uint)(bVar34 & 1) * auVar127._0_4_ |
                             (uint)!(bool)(bVar34 & 1) * auVar133._0_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 1) & 1);
                        auVar154._4_4_ =
                             (uint)bVar57 * auVar127._4_4_ | (uint)!bVar57 * auVar133._4_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 2) & 1);
                        auVar154._8_4_ =
                             (uint)bVar57 * auVar127._8_4_ | (uint)!bVar57 * auVar133._8_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 3) & 1);
                        auVar154._12_4_ =
                             (uint)bVar57 * auVar127._12_4_ | (uint)!bVar57 * auVar133._12_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 4) & 1);
                        auVar154._16_4_ =
                             (uint)bVar57 * auVar127._16_4_ | (uint)!bVar57 * auVar133._16_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 5) & 1);
                        auVar154._20_4_ =
                             (uint)bVar57 * auVar127._20_4_ | (uint)!bVar57 * auVar133._20_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 6) & 1);
                        auVar154._24_4_ =
                             (uint)bVar57 * auVar127._24_4_ | (uint)!bVar57 * auVar133._24_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 7) & 1);
                        auVar154._28_4_ =
                             (uint)bVar57 * auVar127._28_4_ | (uint)!bVar57 * auVar133._28_4_;
                        auVar154._32_4_ =
                             (uint)(bVar35 & 1) * auVar127._32_4_ |
                             (uint)!(bool)(bVar35 & 1) * auVar133._32_4_;
                        bVar57 = (bool)(bVar35 >> 1 & 1);
                        auVar154._36_4_ =
                             (uint)bVar57 * auVar127._36_4_ | (uint)!bVar57 * auVar133._36_4_;
                        bVar57 = (bool)(bVar35 >> 2 & 1);
                        auVar154._40_4_ =
                             (uint)bVar57 * auVar127._40_4_ | (uint)!bVar57 * auVar133._40_4_;
                        bVar57 = (bool)(bVar35 >> 3 & 1);
                        auVar154._44_4_ =
                             (uint)bVar57 * auVar127._44_4_ | (uint)!bVar57 * auVar133._44_4_;
                        bVar57 = (bool)(bVar35 >> 4 & 1);
                        auVar154._48_4_ =
                             (uint)bVar57 * auVar127._48_4_ | (uint)!bVar57 * auVar133._48_4_;
                        bVar57 = (bool)(bVar35 >> 5 & 1);
                        auVar154._52_4_ =
                             (uint)bVar57 * auVar127._52_4_ | (uint)!bVar57 * auVar133._52_4_;
                        bVar57 = (bool)(bVar35 >> 6 & 1);
                        auVar154._56_4_ =
                             (uint)bVar57 * auVar127._56_4_ | (uint)!bVar57 * auVar133._56_4_;
                        auVar154._60_4_ =
                             (uint)(bVar35 >> 7) * auVar127._60_4_ |
                             (uint)!(bool)(bVar35 >> 7) * auVar133._60_4_;
                        auVar113 = vextractf64x4_avx512f(auVar154,1);
                        auVar127 = vaddps_avx512f(auVar154,ZEXT3264(auVar113));
                        auVar171._0_4_ = auVar127._0_4_ + auVar127._16_4_;
                        auVar171._4_4_ = auVar127._4_4_ + auVar127._20_4_;
                        auVar171._8_4_ = auVar127._8_4_ + auVar127._24_4_;
                        auVar171._12_4_ = auVar127._12_4_ + auVar127._28_4_;
                        auVar99 = vshufpd_avx(auVar171,auVar171,1);
                        auVar172._0_4_ = auVar171._0_4_ + auVar99._0_4_;
                        auVar172._4_4_ = auVar171._4_4_ + auVar99._4_4_;
                        auVar172._8_4_ = auVar171._8_4_ + auVar99._8_4_;
                        auVar172._12_4_ = auVar171._12_4_ + auVar99._12_4_;
                        auVar99 = vhaddps_avx(auVar172,auVar172);
                        uVar168 = auVar99._0_4_;
                        pauVar50 = (undefined1 (*) [16])(*pauVar50 + uVar65 * 8 + 8);
                      }
                      if (iVar38 < K) {
                        *(undefined4 *)*pauVar78 = uVar168;
                        *(undefined4 *)(*pauVar78 + 4) = uVar182;
                        *(undefined4 *)(*pauVar78 + 8) = uVar199;
                        *(undefined4 *)(*pauVar78 + 0xc) = uVar181;
                      }
                      else {
                        *(undefined4 *)*pauVar47 = uVar168;
                        *(undefined4 *)(*pauVar47 + 4) = uVar199;
                        *(undefined4 *)(*pauVar47 + lVar85 * 4) = uVar182;
                        *(undefined4 *)
                         (*pauVar47 + ((long)((sVar1 << 0x20) + 0x100000000) >> 0x20) * 4) = uVar181
                        ;
                        pauVar47 = (undefined1 (*) [16])(*pauVar47 + 8);
                      }
                      pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x10);
                      uVar64 = uVar82 + 3;
                      uVar82 = uVar82 + 2;
                    }
                    if ((int)uVar82 < (int)uVar79) {
                      do {
                        uVar168 = 0;
                        uVar182 = 0;
                        if (pauVar40 != (undefined1 (*) [64])0x0 || iVar59 != 0) {
                          pauVar70 = pauVar69;
                          if (iVar59 != 0) {
                            pauVar70 = pauVar78;
                          }
                          uVar168 = *(undefined4 *)*pauVar70;
                          uVar182 = *(undefined4 *)(*pauVar70 + 4);
                        }
                        if (0 < iVar56) {
                          uVar76 = 0;
                          auVar129 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                          auVar130 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                          pauVar70 = pauVar53;
                          auVar127 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),uVar168));
                          auVar128 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),uVar182));
                          do {
                            auVar132 = auVar128;
                            auVar131 = auVar127;
                            auVar127 = vpbroadcastq_avx512f();
                            auVar128 = vporq_avx512f(auVar127,auVar129);
                            auVar127 = vporq_avx512f(auVar127,auVar130);
                            uVar3 = vpcmpuq_avx512f(auVar127,auVar126,2);
                            bVar34 = (byte)uVar3;
                            uVar3 = vpcmpuq_avx512f(auVar128,auVar126,2);
                            bVar35 = (byte)uVar3;
                            uVar90 = CONCAT11(bVar35,bVar34);
                            auVar127 = vgatherdps_avx512f(*(undefined4 *)(*pauVar70 + lVar85));
                            auVar155._4_4_ = (uint)((byte)(uVar90 >> 1) & 1) * auVar127._4_4_;
                            auVar155._0_4_ = (uint)(bVar34 & 1) * auVar127._0_4_;
                            auVar155._8_4_ = (uint)((byte)(uVar90 >> 2) & 1) * auVar127._8_4_;
                            auVar155._12_4_ = (uint)((byte)(uVar90 >> 3) & 1) * auVar127._12_4_;
                            auVar155._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * auVar127._16_4_;
                            auVar155._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * auVar127._20_4_;
                            auVar155._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * auVar127._24_4_;
                            auVar155._28_4_ = (uint)((byte)(uVar90 >> 7) & 1) * auVar127._28_4_;
                            auVar155._32_4_ = (uint)(bVar35 & 1) * auVar127._32_4_;
                            auVar155._36_4_ = (uint)(bVar35 >> 1 & 1) * auVar127._36_4_;
                            auVar155._40_4_ = (uint)(bVar35 >> 2 & 1) * auVar127._40_4_;
                            auVar155._44_4_ = (uint)(bVar35 >> 3 & 1) * auVar127._44_4_;
                            auVar155._48_4_ = (uint)(bVar35 >> 4 & 1) * auVar127._48_4_;
                            auVar155._52_4_ = (uint)(bVar35 >> 5 & 1) * auVar127._52_4_;
                            auVar155._56_4_ = (uint)(bVar35 >> 6 & 1) * auVar127._56_4_;
                            auVar155._60_4_ = (uint)(bVar35 >> 7) * auVar127._60_4_;
                            piVar36 = (int *)(*pauVar50 + uVar76 * 4);
                            auVar156._4_4_ = (uint)((byte)(uVar90 >> 1) & 1) * piVar36[1];
                            auVar156._0_4_ = (uint)(bVar34 & 1) * *piVar36;
                            auVar156._8_4_ = (uint)((byte)(uVar90 >> 2) & 1) * piVar36[2];
                            auVar156._12_4_ = (uint)((byte)(uVar90 >> 3) & 1) * piVar36[3];
                            auVar156._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * piVar36[4];
                            auVar156._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * piVar36[5];
                            auVar156._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * piVar36[6];
                            auVar156._28_4_ = (uint)((byte)(uVar90 >> 7) & 1) * piVar36[7];
                            auVar156._32_4_ = (uint)(bVar35 & 1) * piVar36[8];
                            auVar156._36_4_ = (uint)(bVar35 >> 1 & 1) * piVar36[9];
                            auVar156._40_4_ = (uint)(bVar35 >> 2 & 1) * piVar36[10];
                            auVar156._44_4_ = (uint)(bVar35 >> 3 & 1) * piVar36[0xb];
                            auVar156._48_4_ = (uint)(bVar35 >> 4 & 1) * piVar36[0xc];
                            auVar156._52_4_ = (uint)(bVar35 >> 5 & 1) * piVar36[0xd];
                            auVar156._56_4_ = (uint)(bVar35 >> 6 & 1) * piVar36[0xe];
                            auVar156._60_4_ = (uint)(bVar35 >> 7) * piVar36[0xf];
                            auVar127 = vfmadd213ps_avx512f(auVar155,auVar156,auVar131);
                            auVar128 = vgatherdps_avx512f(*(undefined4 *)(*pauVar70 + lVar85 + 4));
                            auVar157._4_4_ = (uint)((byte)(uVar90 >> 1) & 1) * auVar128._4_4_;
                            auVar157._0_4_ = (uint)(bVar34 & 1) * auVar128._0_4_;
                            auVar157._8_4_ = (uint)((byte)(uVar90 >> 2) & 1) * auVar128._8_4_;
                            auVar157._12_4_ = (uint)((byte)(uVar90 >> 3) & 1) * auVar128._12_4_;
                            auVar157._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * auVar128._16_4_;
                            auVar157._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * auVar128._20_4_;
                            auVar157._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * auVar128._24_4_;
                            auVar157._28_4_ = (uint)((byte)(uVar90 >> 7) & 1) * auVar128._28_4_;
                            auVar157._32_4_ = (uint)(bVar35 & 1) * auVar128._32_4_;
                            auVar157._36_4_ = (uint)(bVar35 >> 1 & 1) * auVar128._36_4_;
                            auVar157._40_4_ = (uint)(bVar35 >> 2 & 1) * auVar128._40_4_;
                            auVar157._44_4_ = (uint)(bVar35 >> 3 & 1) * auVar128._44_4_;
                            auVar157._48_4_ = (uint)(bVar35 >> 4 & 1) * auVar128._48_4_;
                            auVar157._52_4_ = (uint)(bVar35 >> 5 & 1) * auVar128._52_4_;
                            auVar157._56_4_ = (uint)(bVar35 >> 6 & 1) * auVar128._56_4_;
                            auVar157._60_4_ = (uint)(bVar35 >> 7) * auVar128._60_4_;
                            auVar128 = vfmadd213ps_avx512f(auVar157,auVar156,auVar132);
                            uVar76 = uVar76 + 0x10;
                            pauVar70 = pauVar70 + 2;
                          } while (uVar45 != uVar76);
                          auVar158._0_4_ =
                               (uint)(bVar34 & 1) * auVar128._0_4_ |
                               (uint)!(bool)(bVar34 & 1) * auVar132._0_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 1) & 1);
                          auVar158._4_4_ =
                               (uint)bVar57 * auVar128._4_4_ | (uint)!bVar57 * auVar132._4_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 2) & 1);
                          auVar158._8_4_ =
                               (uint)bVar57 * auVar128._8_4_ | (uint)!bVar57 * auVar132._8_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 3) & 1);
                          auVar158._12_4_ =
                               (uint)bVar57 * auVar128._12_4_ | (uint)!bVar57 * auVar132._12_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 4) & 1);
                          auVar158._16_4_ =
                               (uint)bVar57 * auVar128._16_4_ | (uint)!bVar57 * auVar132._16_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 5) & 1);
                          auVar158._20_4_ =
                               (uint)bVar57 * auVar128._20_4_ | (uint)!bVar57 * auVar132._20_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 6) & 1);
                          auVar158._24_4_ =
                               (uint)bVar57 * auVar128._24_4_ | (uint)!bVar57 * auVar132._24_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 7) & 1);
                          auVar158._28_4_ =
                               (uint)bVar57 * auVar128._28_4_ | (uint)!bVar57 * auVar132._28_4_;
                          auVar158._32_4_ =
                               (uint)(bVar35 & 1) * auVar128._32_4_ |
                               (uint)!(bool)(bVar35 & 1) * auVar132._32_4_;
                          bVar57 = (bool)(bVar35 >> 1 & 1);
                          auVar158._36_4_ =
                               (uint)bVar57 * auVar128._36_4_ | (uint)!bVar57 * auVar132._36_4_;
                          bVar57 = (bool)(bVar35 >> 2 & 1);
                          auVar158._40_4_ =
                               (uint)bVar57 * auVar128._40_4_ | (uint)!bVar57 * auVar132._40_4_;
                          bVar57 = (bool)(bVar35 >> 3 & 1);
                          auVar158._44_4_ =
                               (uint)bVar57 * auVar128._44_4_ | (uint)!bVar57 * auVar132._44_4_;
                          bVar57 = (bool)(bVar35 >> 4 & 1);
                          auVar158._48_4_ =
                               (uint)bVar57 * auVar128._48_4_ | (uint)!bVar57 * auVar132._48_4_;
                          bVar57 = (bool)(bVar35 >> 5 & 1);
                          auVar158._52_4_ =
                               (uint)bVar57 * auVar128._52_4_ | (uint)!bVar57 * auVar132._52_4_;
                          bVar57 = (bool)(bVar35 >> 6 & 1);
                          auVar158._56_4_ =
                               (uint)bVar57 * auVar128._56_4_ | (uint)!bVar57 * auVar132._56_4_;
                          auVar158._60_4_ =
                               (uint)(bVar35 >> 7) * auVar128._60_4_ |
                               (uint)!(bool)(bVar35 >> 7) * auVar132._60_4_;
                          auVar113 = vextractf64x4_avx512f(auVar158,1);
                          auVar128 = vaddps_avx512f(auVar158,ZEXT3264(auVar113));
                          auVar185._0_4_ = auVar128._0_4_ + auVar128._16_4_;
                          auVar185._4_4_ = auVar128._4_4_ + auVar128._20_4_;
                          auVar185._8_4_ = auVar128._8_4_ + auVar128._24_4_;
                          auVar185._12_4_ = auVar128._12_4_ + auVar128._28_4_;
                          auVar99 = vshufpd_avx(auVar185,auVar185,1);
                          auVar186._0_4_ = auVar185._0_4_ + auVar99._0_4_;
                          auVar186._4_4_ = auVar185._4_4_ + auVar99._4_4_;
                          auVar186._8_4_ = auVar185._8_4_ + auVar99._8_4_;
                          auVar186._12_4_ = auVar185._12_4_ + auVar99._12_4_;
                          auVar99 = vhaddps_avx(auVar186,auVar186);
                          uVar182 = auVar99._0_4_;
                          auVar159._0_4_ =
                               (uint)(bVar34 & 1) * auVar127._0_4_ |
                               (uint)!(bool)(bVar34 & 1) * auVar131._0_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 1) & 1);
                          auVar159._4_4_ =
                               (uint)bVar57 * auVar127._4_4_ | (uint)!bVar57 * auVar131._4_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 2) & 1);
                          auVar159._8_4_ =
                               (uint)bVar57 * auVar127._8_4_ | (uint)!bVar57 * auVar131._8_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 3) & 1);
                          auVar159._12_4_ =
                               (uint)bVar57 * auVar127._12_4_ | (uint)!bVar57 * auVar131._12_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 4) & 1);
                          auVar159._16_4_ =
                               (uint)bVar57 * auVar127._16_4_ | (uint)!bVar57 * auVar131._16_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 5) & 1);
                          auVar159._20_4_ =
                               (uint)bVar57 * auVar127._20_4_ | (uint)!bVar57 * auVar131._20_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 6) & 1);
                          auVar159._24_4_ =
                               (uint)bVar57 * auVar127._24_4_ | (uint)!bVar57 * auVar131._24_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 7) & 1);
                          auVar159._28_4_ =
                               (uint)bVar57 * auVar127._28_4_ | (uint)!bVar57 * auVar131._28_4_;
                          auVar159._32_4_ =
                               (uint)(bVar35 & 1) * auVar127._32_4_ |
                               (uint)!(bool)(bVar35 & 1) * auVar131._32_4_;
                          bVar57 = (bool)(bVar35 >> 1 & 1);
                          auVar159._36_4_ =
                               (uint)bVar57 * auVar127._36_4_ | (uint)!bVar57 * auVar131._36_4_;
                          bVar57 = (bool)(bVar35 >> 2 & 1);
                          auVar159._40_4_ =
                               (uint)bVar57 * auVar127._40_4_ | (uint)!bVar57 * auVar131._40_4_;
                          bVar57 = (bool)(bVar35 >> 3 & 1);
                          auVar159._44_4_ =
                               (uint)bVar57 * auVar127._44_4_ | (uint)!bVar57 * auVar131._44_4_;
                          bVar57 = (bool)(bVar35 >> 4 & 1);
                          auVar159._48_4_ =
                               (uint)bVar57 * auVar127._48_4_ | (uint)!bVar57 * auVar131._48_4_;
                          bVar57 = (bool)(bVar35 >> 5 & 1);
                          auVar159._52_4_ =
                               (uint)bVar57 * auVar127._52_4_ | (uint)!bVar57 * auVar131._52_4_;
                          bVar57 = (bool)(bVar35 >> 6 & 1);
                          auVar159._56_4_ =
                               (uint)bVar57 * auVar127._56_4_ | (uint)!bVar57 * auVar131._56_4_;
                          auVar159._60_4_ =
                               (uint)(bVar35 >> 7) * auVar127._60_4_ |
                               (uint)!(bool)(bVar35 >> 7) * auVar131._60_4_;
                          auVar113 = vextractf64x4_avx512f(auVar159,1);
                          auVar127 = vaddps_avx512f(auVar159,ZEXT3264(auVar113));
                          auVar173._0_4_ = auVar127._0_4_ + auVar127._16_4_;
                          auVar173._4_4_ = auVar127._4_4_ + auVar127._20_4_;
                          auVar173._8_4_ = auVar127._8_4_ + auVar127._24_4_;
                          auVar173._12_4_ = auVar127._12_4_ + auVar127._28_4_;
                          auVar99 = vshufpd_avx(auVar173,auVar173,1);
                          auVar174._0_4_ = auVar173._0_4_ + auVar99._0_4_;
                          auVar174._4_4_ = auVar173._4_4_ + auVar99._4_4_;
                          auVar174._8_4_ = auVar173._8_4_ + auVar99._8_4_;
                          auVar174._12_4_ = auVar173._12_4_ + auVar99._12_4_;
                          auVar99 = vhaddps_avx(auVar174,auVar174);
                          uVar168 = auVar99._0_4_;
                          pauVar50 = (undefined1 (*) [16])(*pauVar50 + uVar65 * 4 + 4);
                        }
                        if (iVar38 < K) {
                          *(undefined4 *)*pauVar78 = uVar168;
                          *(undefined4 *)(*pauVar78 + 4) = uVar182;
                        }
                        else {
                          *(undefined4 *)*pauVar47 = uVar168;
                          *(undefined4 *)(*pauVar47 + lVar85 * 4) = uVar182;
                          pauVar47 = (undefined1 (*) [16])(*pauVar47 + 4);
                        }
                        pauVar78 = (undefined1 (*) [64])(*pauVar78 + 8);
                        uVar82 = uVar82 + 1;
                      } while (uVar82 != uVar79);
                    }
                    pauVar53 = (undefined1 (*) [64])(*pauVar53 + (long)(iVar56 * 2) * 4);
                    uVar76 = uVar46 + 2;
                    lVar39 = uVar46 + 3;
                    uVar46 = uVar76;
                  } while (lVar39 < local_1f0);
                }
                if ((int)uVar76 < (int)uVar48) {
                  uVar45 = (ulong)(iVar56 - 1);
                  lVar85 = (long)(int)uVar76;
                  uVar65 = (ulong)(iVar56 + 0xfU & 0xfffffff0);
                  auVar126 = vpbroadcastq_avx512f();
                  do {
                    pauVar69 = (undefined1 (*) [64])
                               ((long)local_240->data + lVar85 * 4 + local_200 * 4);
                    if (pauVar40 == (undefined1 (*) [64])0x0) {
                      pauVar69 = pauVar40;
                    }
                    uVar80 = 0;
                    pauVar47 = (undefined1 (*) [16])
                               ((long)local_248->data +
                               local_1a0 * 4 + (lVar85 + local_200) * (long)iVar73 * 4);
                    pauVar50 = pauVar42;
                    if (0xb < (int)uVar79) {
                      uVar82 = 0;
                      do {
                        if (iVar59 == 0) {
                          if (pauVar69 == (undefined1 (*) [64])0x0) {
                            auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            uVar168 = *(undefined4 *)*pauVar69;
                            auVar175._4_4_ = uVar168;
                            auVar175._0_4_ = uVar168;
                            auVar175._8_4_ = uVar168;
                            auVar175._12_4_ = uVar168;
                            auVar127 = ZEXT1664(auVar175);
                            auVar128 = ZEXT1664(auVar175);
                            auVar129 = ZEXT1664(auVar175);
                          }
                        }
                        else {
                          auVar127 = ZEXT1664(*(undefined1 (*) [16])*pauVar78);
                          auVar128 = ZEXT1664(*(undefined1 (*) [16])(*pauVar78 + 0x10));
                          auVar129 = ZEXT1664(*(undefined1 (*) [16])(*pauVar78 + 0x20));
                        }
                        auVar101 = auVar129._0_16_;
                        auVar100 = auVar128._0_16_;
                        auVar99 = auVar127._0_16_;
                        if (0 < iVar56) {
                          lVar39 = 0;
                          pauVar71 = pauVar50;
                          do {
                            uVar168 = *(undefined4 *)(*pauVar53 + lVar39 * 4);
                            auVar197._4_4_ = uVar168;
                            auVar197._0_4_ = uVar168;
                            auVar197._8_4_ = uVar168;
                            auVar197._12_4_ = uVar168;
                            auVar99 = vfmadd231ps_fma(auVar127._0_16_,auVar197,*pauVar71);
                            auVar127 = ZEXT1664(auVar99);
                            auVar100 = vfmadd231ps_fma(auVar128._0_16_,auVar197,pauVar71[1]);
                            auVar128 = ZEXT1664(auVar100);
                            auVar101 = vfmadd231ps_fma(auVar129._0_16_,auVar197,pauVar71[2]);
                            auVar129 = ZEXT1664(auVar101);
                            pauVar71 = pauVar71 + 3;
                            lVar39 = lVar39 + 1;
                          } while (iVar56 != (int)lVar39);
                          pauVar50 = pauVar50 + uVar45 * 3 + 3;
                        }
                        if (iVar38 < K) {
                          *(undefined1 (*) [16])*pauVar78 = auVar99;
                          *(undefined1 (*) [16])(*pauVar78 + 0x10) = auVar100;
                          *(undefined1 (*) [16])(*pauVar78 + 0x20) = auVar101;
                        }
                        else {
                          *pauVar47 = auVar99;
                          pauVar47[1] = auVar100;
                          pauVar47[2] = auVar101;
                          pauVar47 = pauVar47 + 3;
                        }
                        pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x30);
                        uVar80 = uVar82 + 0xc;
                        iVar61 = uVar82 + 0x17;
                        uVar82 = uVar80;
                      } while (iVar61 < (int)uVar79);
                    }
                    iVar61 = uVar80 + 7;
                    while (iVar61 < (int)uVar79) {
                      if (iVar59 == 0) {
                        if (pauVar69 == (undefined1 (*) [64])0x0) {
                          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          uVar168 = *(undefined4 *)*pauVar69;
                          auVar176._4_4_ = uVar168;
                          auVar176._0_4_ = uVar168;
                          auVar176._8_4_ = uVar168;
                          auVar176._12_4_ = uVar168;
                          auVar127 = ZEXT1664(auVar176);
                          auVar128 = ZEXT1664(auVar176);
                        }
                      }
                      else {
                        auVar127 = ZEXT1664(*(undefined1 (*) [16])*pauVar78);
                        auVar128 = ZEXT1664(*(undefined1 (*) [16])(*pauVar78 + 0x10));
                      }
                      auVar100 = auVar128._0_16_;
                      auVar99 = auVar127._0_16_;
                      if (0 < iVar56) {
                        lVar39 = 0;
                        pauVar71 = pauVar50;
                        do {
                          uVar168 = *(undefined4 *)(*pauVar53 + lVar39 * 4);
                          auVar193._4_4_ = uVar168;
                          auVar193._0_4_ = uVar168;
                          auVar193._8_4_ = uVar168;
                          auVar193._12_4_ = uVar168;
                          auVar99 = vfmadd231ps_fma(auVar127._0_16_,auVar193,*pauVar71);
                          auVar127 = ZEXT1664(auVar99);
                          auVar100 = vfmadd231ps_fma(auVar128._0_16_,auVar193,pauVar71[1]);
                          auVar128 = ZEXT1664(auVar100);
                          pauVar71 = pauVar71 + 2;
                          lVar39 = lVar39 + 1;
                        } while (iVar56 != (int)lVar39);
                        pauVar50 = pauVar50 + uVar45 * 2 + 2;
                      }
                      if (iVar38 < K) {
                        *(undefined1 (*) [16])*pauVar78 = auVar99;
                        *(undefined1 (*) [16])(*pauVar78 + 0x10) = auVar100;
                      }
                      else {
                        *pauVar47 = auVar99;
                        pauVar47[1] = auVar100;
                        pauVar47 = pauVar47 + 2;
                      }
                      pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x20);
                      iVar61 = uVar80 + 0xf;
                      uVar80 = uVar80 + 8;
                    }
                    uVar82 = uVar80 | 3;
                    while ((int)uVar82 < (int)uVar79) {
                      if (iVar59 == 0) {
                        if (pauVar69 == (undefined1 (*) [64])0x0) {
                          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          uVar168 = *(undefined4 *)*pauVar69;
                          auVar127 = ZEXT1664(CONCAT412(uVar168,CONCAT48(uVar168,CONCAT44(uVar168,
                                                  uVar168))));
                        }
                      }
                      else {
                        auVar127 = ZEXT1664(*(undefined1 (*) [16])*pauVar78);
                      }
                      auVar99 = auVar127._0_16_;
                      if (0 < iVar56) {
                        lVar39 = 0;
                        pauVar71 = pauVar50;
                        do {
                          uVar168 = *(undefined4 *)(*pauVar53 + lVar39 * 4);
                          auVar187._4_4_ = uVar168;
                          auVar187._0_4_ = uVar168;
                          auVar187._8_4_ = uVar168;
                          auVar187._12_4_ = uVar168;
                          auVar99 = vfmadd231ps_fma(auVar127._0_16_,auVar187,*pauVar71);
                          auVar127 = ZEXT1664(auVar99);
                          pauVar71 = pauVar71 + 1;
                          lVar39 = lVar39 + 1;
                        } while (iVar56 != (int)lVar39);
                        pauVar50 = pauVar50 + uVar45 + 1;
                      }
                      if (iVar38 < K) {
                        *(undefined1 (*) [16])*pauVar78 = auVar99;
                      }
                      else {
                        *pauVar47 = auVar99;
                        pauVar47 = pauVar47 + 1;
                      }
                      pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x10);
                      uVar82 = uVar80 + 7;
                      uVar80 = uVar80 + 4;
                    }
                    uVar82 = uVar80 | 1;
                    while ((int)uVar82 < (int)uVar79) {
                      if (iVar59 == 0) {
                        if (pauVar69 == (undefined1 (*) [64])0x0) {
                          uVar168 = 0;
                          uVar182 = 0;
                        }
                        else {
                          uVar168 = *(undefined4 *)*pauVar69;
                          uVar182 = uVar168;
                        }
                      }
                      else {
                        uVar168 = *(undefined4 *)*pauVar78;
                        uVar182 = *(undefined4 *)(*pauVar78 + 4);
                      }
                      if (0 < iVar56) {
                        uVar76 = 0;
                        auVar129 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                        auVar130 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        pauVar71 = pauVar50;
                        auVar127 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),uVar168));
                        auVar128 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),uVar182));
                        do {
                          auVar132 = auVar128;
                          auVar131 = auVar127;
                          auVar127 = vpbroadcastq_avx512f();
                          auVar128 = vporq_avx512f(auVar127,auVar129);
                          auVar127 = vporq_avx512f(auVar127,auVar130);
                          uVar3 = vpcmpuq_avx512f(auVar127,auVar126,2);
                          bVar34 = (byte)uVar3;
                          uVar3 = vpcmpuq_avx512f(auVar128,auVar126,2);
                          bVar35 = (byte)uVar3;
                          uVar90 = CONCAT11(bVar35,bVar34);
                          piVar36 = (int *)(*pauVar53 + uVar76 * 4);
                          auVar160._4_4_ = (uint)((byte)(uVar90 >> 1) & 1) * piVar36[1];
                          auVar160._0_4_ = (uint)(bVar34 & 1) * *piVar36;
                          auVar160._8_4_ = (uint)((byte)(uVar90 >> 2) & 1) * piVar36[2];
                          auVar160._12_4_ = (uint)((byte)(uVar90 >> 3) & 1) * piVar36[3];
                          auVar160._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * piVar36[4];
                          auVar160._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * piVar36[5];
                          auVar160._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * piVar36[6];
                          auVar160._28_4_ = (uint)((byte)(uVar90 >> 7) & 1) * piVar36[7];
                          auVar160._32_4_ = (uint)(bVar35 & 1) * piVar36[8];
                          auVar160._36_4_ = (uint)(bVar35 >> 1 & 1) * piVar36[9];
                          auVar160._40_4_ = (uint)(bVar35 >> 2 & 1) * piVar36[10];
                          auVar160._44_4_ = (uint)(bVar35 >> 3 & 1) * piVar36[0xb];
                          auVar160._48_4_ = (uint)(bVar35 >> 4 & 1) * piVar36[0xc];
                          auVar160._52_4_ = (uint)(bVar35 >> 5 & 1) * piVar36[0xd];
                          auVar160._56_4_ = (uint)(bVar35 >> 6 & 1) * piVar36[0xe];
                          auVar160._60_4_ = (uint)(bVar35 >> 7) * piVar36[0xf];
                          auVar127 = vgatherdps_avx512f(*(undefined4 *)(*pauVar47 + (long)*pauVar71)
                                                       );
                          auVar161._4_4_ = (uint)((byte)(uVar90 >> 1) & 1) * auVar127._4_4_;
                          auVar161._0_4_ = (uint)(bVar34 & 1) * auVar127._0_4_;
                          auVar161._8_4_ = (uint)((byte)(uVar90 >> 2) & 1) * auVar127._8_4_;
                          auVar161._12_4_ = (uint)((byte)(uVar90 >> 3) & 1) * auVar127._12_4_;
                          auVar161._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * auVar127._16_4_;
                          auVar161._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * auVar127._20_4_;
                          auVar161._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * auVar127._24_4_;
                          auVar161._28_4_ = (uint)((byte)(uVar90 >> 7) & 1) * auVar127._28_4_;
                          auVar161._32_4_ = (uint)(bVar35 & 1) * auVar127._32_4_;
                          auVar161._36_4_ = (uint)(bVar35 >> 1 & 1) * auVar127._36_4_;
                          auVar161._40_4_ = (uint)(bVar35 >> 2 & 1) * auVar127._40_4_;
                          auVar161._44_4_ = (uint)(bVar35 >> 3 & 1) * auVar127._44_4_;
                          auVar161._48_4_ = (uint)(bVar35 >> 4 & 1) * auVar127._48_4_;
                          auVar161._52_4_ = (uint)(bVar35 >> 5 & 1) * auVar127._52_4_;
                          auVar161._56_4_ = (uint)(bVar35 >> 6 & 1) * auVar127._56_4_;
                          auVar161._60_4_ = (uint)(bVar35 >> 7) * auVar127._60_4_;
                          auVar127 = vfmadd213ps_avx512f(auVar161,auVar160,auVar131);
                          auVar128 = vgatherdps_avx512f(*(undefined4 *)
                                                         (*pauVar71 + 4 + (long)pauVar47));
                          auVar162._4_4_ = (uint)((byte)(uVar90 >> 1) & 1) * auVar128._4_4_;
                          auVar162._0_4_ = (uint)(bVar34 & 1) * auVar128._0_4_;
                          auVar162._8_4_ = (uint)((byte)(uVar90 >> 2) & 1) * auVar128._8_4_;
                          auVar162._12_4_ = (uint)((byte)(uVar90 >> 3) & 1) * auVar128._12_4_;
                          auVar162._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * auVar128._16_4_;
                          auVar162._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * auVar128._20_4_;
                          auVar162._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * auVar128._24_4_;
                          auVar162._28_4_ = (uint)((byte)(uVar90 >> 7) & 1) * auVar128._28_4_;
                          auVar162._32_4_ = (uint)(bVar35 & 1) * auVar128._32_4_;
                          auVar162._36_4_ = (uint)(bVar35 >> 1 & 1) * auVar128._36_4_;
                          auVar162._40_4_ = (uint)(bVar35 >> 2 & 1) * auVar128._40_4_;
                          auVar162._44_4_ = (uint)(bVar35 >> 3 & 1) * auVar128._44_4_;
                          auVar162._48_4_ = (uint)(bVar35 >> 4 & 1) * auVar128._48_4_;
                          auVar162._52_4_ = (uint)(bVar35 >> 5 & 1) * auVar128._52_4_;
                          auVar162._56_4_ = (uint)(bVar35 >> 6 & 1) * auVar128._56_4_;
                          auVar162._60_4_ = (uint)(bVar35 >> 7) * auVar128._60_4_;
                          auVar128 = vfmadd213ps_avx512f(auVar162,auVar160,auVar132);
                          uVar76 = uVar76 + 0x10;
                          pauVar71 = pauVar71 + 8;
                        } while (uVar65 != uVar76);
                        auVar163._0_4_ =
                             (uint)(bVar34 & 1) * auVar128._0_4_ |
                             (uint)!(bool)(bVar34 & 1) * auVar132._0_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 1) & 1);
                        auVar163._4_4_ =
                             (uint)bVar57 * auVar128._4_4_ | (uint)!bVar57 * auVar132._4_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 2) & 1);
                        auVar163._8_4_ =
                             (uint)bVar57 * auVar128._8_4_ | (uint)!bVar57 * auVar132._8_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 3) & 1);
                        auVar163._12_4_ =
                             (uint)bVar57 * auVar128._12_4_ | (uint)!bVar57 * auVar132._12_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 4) & 1);
                        auVar163._16_4_ =
                             (uint)bVar57 * auVar128._16_4_ | (uint)!bVar57 * auVar132._16_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 5) & 1);
                        auVar163._20_4_ =
                             (uint)bVar57 * auVar128._20_4_ | (uint)!bVar57 * auVar132._20_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 6) & 1);
                        auVar163._24_4_ =
                             (uint)bVar57 * auVar128._24_4_ | (uint)!bVar57 * auVar132._24_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 7) & 1);
                        auVar163._28_4_ =
                             (uint)bVar57 * auVar128._28_4_ | (uint)!bVar57 * auVar132._28_4_;
                        auVar163._32_4_ =
                             (uint)(bVar35 & 1) * auVar128._32_4_ |
                             (uint)!(bool)(bVar35 & 1) * auVar132._32_4_;
                        bVar57 = (bool)(bVar35 >> 1 & 1);
                        auVar163._36_4_ =
                             (uint)bVar57 * auVar128._36_4_ | (uint)!bVar57 * auVar132._36_4_;
                        bVar57 = (bool)(bVar35 >> 2 & 1);
                        auVar163._40_4_ =
                             (uint)bVar57 * auVar128._40_4_ | (uint)!bVar57 * auVar132._40_4_;
                        bVar57 = (bool)(bVar35 >> 3 & 1);
                        auVar163._44_4_ =
                             (uint)bVar57 * auVar128._44_4_ | (uint)!bVar57 * auVar132._44_4_;
                        bVar57 = (bool)(bVar35 >> 4 & 1);
                        auVar163._48_4_ =
                             (uint)bVar57 * auVar128._48_4_ | (uint)!bVar57 * auVar132._48_4_;
                        bVar57 = (bool)(bVar35 >> 5 & 1);
                        auVar163._52_4_ =
                             (uint)bVar57 * auVar128._52_4_ | (uint)!bVar57 * auVar132._52_4_;
                        bVar57 = (bool)(bVar35 >> 6 & 1);
                        auVar163._56_4_ =
                             (uint)bVar57 * auVar128._56_4_ | (uint)!bVar57 * auVar132._56_4_;
                        auVar163._60_4_ =
                             (uint)(bVar35 >> 7) * auVar128._60_4_ |
                             (uint)!(bool)(bVar35 >> 7) * auVar132._60_4_;
                        auVar113 = vextractf64x4_avx512f(auVar163,1);
                        auVar128 = vaddps_avx512f(auVar163,ZEXT3264(auVar113));
                        auVar188._0_4_ = auVar128._0_4_ + auVar128._16_4_;
                        auVar188._4_4_ = auVar128._4_4_ + auVar128._20_4_;
                        auVar188._8_4_ = auVar128._8_4_ + auVar128._24_4_;
                        auVar188._12_4_ = auVar128._12_4_ + auVar128._28_4_;
                        auVar99 = vshufpd_avx(auVar188,auVar188,1);
                        auVar189._0_4_ = auVar188._0_4_ + auVar99._0_4_;
                        auVar189._4_4_ = auVar188._4_4_ + auVar99._4_4_;
                        auVar189._8_4_ = auVar188._8_4_ + auVar99._8_4_;
                        auVar189._12_4_ = auVar188._12_4_ + auVar99._12_4_;
                        auVar99 = vhaddps_avx(auVar189,auVar189);
                        uVar182 = auVar99._0_4_;
                        auVar164._0_4_ =
                             (uint)(bVar34 & 1) * auVar127._0_4_ |
                             (uint)!(bool)(bVar34 & 1) * auVar131._0_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 1) & 1);
                        auVar164._4_4_ =
                             (uint)bVar57 * auVar127._4_4_ | (uint)!bVar57 * auVar131._4_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 2) & 1);
                        auVar164._8_4_ =
                             (uint)bVar57 * auVar127._8_4_ | (uint)!bVar57 * auVar131._8_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 3) & 1);
                        auVar164._12_4_ =
                             (uint)bVar57 * auVar127._12_4_ | (uint)!bVar57 * auVar131._12_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 4) & 1);
                        auVar164._16_4_ =
                             (uint)bVar57 * auVar127._16_4_ | (uint)!bVar57 * auVar131._16_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 5) & 1);
                        auVar164._20_4_ =
                             (uint)bVar57 * auVar127._20_4_ | (uint)!bVar57 * auVar131._20_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 6) & 1);
                        auVar164._24_4_ =
                             (uint)bVar57 * auVar127._24_4_ | (uint)!bVar57 * auVar131._24_4_;
                        bVar57 = (bool)((byte)(uVar90 >> 7) & 1);
                        auVar164._28_4_ =
                             (uint)bVar57 * auVar127._28_4_ | (uint)!bVar57 * auVar131._28_4_;
                        auVar164._32_4_ =
                             (uint)(bVar35 & 1) * auVar127._32_4_ |
                             (uint)!(bool)(bVar35 & 1) * auVar131._32_4_;
                        bVar57 = (bool)(bVar35 >> 1 & 1);
                        auVar164._36_4_ =
                             (uint)bVar57 * auVar127._36_4_ | (uint)!bVar57 * auVar131._36_4_;
                        bVar57 = (bool)(bVar35 >> 2 & 1);
                        auVar164._40_4_ =
                             (uint)bVar57 * auVar127._40_4_ | (uint)!bVar57 * auVar131._40_4_;
                        bVar57 = (bool)(bVar35 >> 3 & 1);
                        auVar164._44_4_ =
                             (uint)bVar57 * auVar127._44_4_ | (uint)!bVar57 * auVar131._44_4_;
                        bVar57 = (bool)(bVar35 >> 4 & 1);
                        auVar164._48_4_ =
                             (uint)bVar57 * auVar127._48_4_ | (uint)!bVar57 * auVar131._48_4_;
                        bVar57 = (bool)(bVar35 >> 5 & 1);
                        auVar164._52_4_ =
                             (uint)bVar57 * auVar127._52_4_ | (uint)!bVar57 * auVar131._52_4_;
                        bVar57 = (bool)(bVar35 >> 6 & 1);
                        auVar164._56_4_ =
                             (uint)bVar57 * auVar127._56_4_ | (uint)!bVar57 * auVar131._56_4_;
                        auVar164._60_4_ =
                             (uint)(bVar35 >> 7) * auVar127._60_4_ |
                             (uint)!(bool)(bVar35 >> 7) * auVar131._60_4_;
                        auVar113 = vextractf64x4_avx512f(auVar164,1);
                        auVar127 = vaddps_avx512f(auVar164,ZEXT3264(auVar113));
                        auVar177._0_4_ = auVar127._0_4_ + auVar127._16_4_;
                        auVar177._4_4_ = auVar127._4_4_ + auVar127._20_4_;
                        auVar177._8_4_ = auVar127._8_4_ + auVar127._24_4_;
                        auVar177._12_4_ = auVar127._12_4_ + auVar127._28_4_;
                        auVar99 = vshufpd_avx(auVar177,auVar177,1);
                        auVar178._0_4_ = auVar177._0_4_ + auVar99._0_4_;
                        auVar178._4_4_ = auVar177._4_4_ + auVar99._4_4_;
                        auVar178._8_4_ = auVar177._8_4_ + auVar99._8_4_;
                        auVar178._12_4_ = auVar177._12_4_ + auVar99._12_4_;
                        auVar99 = vhaddps_avx(auVar178,auVar178);
                        uVar168 = auVar99._0_4_;
                        pauVar50 = (undefined1 (*) [16])(*pauVar50 + uVar45 * 8 + 8);
                      }
                      if (iVar38 < K) {
                        *(undefined4 *)*pauVar78 = uVar168;
                        *(undefined4 *)(*pauVar78 + 4) = uVar182;
                      }
                      else {
                        *(undefined4 *)*pauVar47 = uVar168;
                        *(undefined4 *)(*pauVar47 + 4) = uVar182;
                        pauVar47 = (undefined1 (*) [16])(*pauVar47 + 8);
                      }
                      pauVar78 = (undefined1 (*) [64])(*pauVar78 + 8);
                      uVar82 = uVar80 + 3;
                      uVar80 = uVar80 + 2;
                    }
                    if ((int)uVar80 < (int)uVar79) {
                      do {
                        uVar168 = 0;
                        if (pauVar69 != (undefined1 (*) [64])0x0 || iVar59 != 0) {
                          pauVar40 = pauVar69;
                          if (iVar59 != 0) {
                            pauVar40 = pauVar78;
                          }
                          uVar168 = *(undefined4 *)*pauVar40;
                        }
                        if (0 < iVar56) {
                          uVar76 = 0;
                          auVar128 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                          auVar129 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                          auVar127 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),uVar168));
                          do {
                            auVar131 = auVar127;
                            auVar127 = vpbroadcastq_avx512f();
                            auVar130 = vporq_avx512f(auVar127,auVar128);
                            auVar127 = vporq_avx512f(auVar127,auVar129);
                            uVar3 = vpcmpuq_avx512f(auVar127,auVar126,2);
                            bVar34 = (byte)uVar3;
                            uVar3 = vpcmpuq_avx512f(auVar130,auVar126,2);
                            bVar35 = (byte)uVar3;
                            uVar90 = CONCAT11(bVar35,bVar34);
                            piVar36 = (int *)(*pauVar53 + uVar76 * 4);
                            auVar165._4_4_ = (uint)((byte)(uVar90 >> 1) & 1) * piVar36[1];
                            auVar165._0_4_ = (uint)(bVar34 & 1) * *piVar36;
                            auVar165._8_4_ = (uint)((byte)(uVar90 >> 2) & 1) * piVar36[2];
                            auVar165._12_4_ = (uint)((byte)(uVar90 >> 3) & 1) * piVar36[3];
                            auVar165._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * piVar36[4];
                            auVar165._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * piVar36[5];
                            auVar165._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * piVar36[6];
                            auVar165._28_4_ = (uint)((byte)(uVar90 >> 7) & 1) * piVar36[7];
                            auVar165._32_4_ = (uint)(bVar35 & 1) * piVar36[8];
                            auVar165._36_4_ = (uint)(bVar35 >> 1 & 1) * piVar36[9];
                            auVar165._40_4_ = (uint)(bVar35 >> 2 & 1) * piVar36[10];
                            auVar165._44_4_ = (uint)(bVar35 >> 3 & 1) * piVar36[0xb];
                            auVar165._48_4_ = (uint)(bVar35 >> 4 & 1) * piVar36[0xc];
                            auVar165._52_4_ = (uint)(bVar35 >> 5 & 1) * piVar36[0xd];
                            auVar165._56_4_ = (uint)(bVar35 >> 6 & 1) * piVar36[0xe];
                            auVar165._60_4_ = (uint)(bVar35 >> 7) * piVar36[0xf];
                            piVar36 = (int *)(*pauVar50 + uVar76 * 4);
                            auVar166._4_4_ = (uint)((byte)(uVar90 >> 1) & 1) * piVar36[1];
                            auVar166._0_4_ = (uint)(bVar34 & 1) * *piVar36;
                            auVar166._8_4_ = (uint)((byte)(uVar90 >> 2) & 1) * piVar36[2];
                            auVar166._12_4_ = (uint)((byte)(uVar90 >> 3) & 1) * piVar36[3];
                            auVar166._16_4_ = (uint)((byte)(uVar90 >> 4) & 1) * piVar36[4];
                            auVar166._20_4_ = (uint)((byte)(uVar90 >> 5) & 1) * piVar36[5];
                            auVar166._24_4_ = (uint)((byte)(uVar90 >> 6) & 1) * piVar36[6];
                            auVar166._28_4_ = (uint)((byte)(uVar90 >> 7) & 1) * piVar36[7];
                            auVar166._32_4_ = (uint)(bVar35 & 1) * piVar36[8];
                            auVar166._36_4_ = (uint)(bVar35 >> 1 & 1) * piVar36[9];
                            auVar166._40_4_ = (uint)(bVar35 >> 2 & 1) * piVar36[10];
                            auVar166._44_4_ = (uint)(bVar35 >> 3 & 1) * piVar36[0xb];
                            auVar166._48_4_ = (uint)(bVar35 >> 4 & 1) * piVar36[0xc];
                            auVar166._52_4_ = (uint)(bVar35 >> 5 & 1) * piVar36[0xd];
                            auVar166._56_4_ = (uint)(bVar35 >> 6 & 1) * piVar36[0xe];
                            auVar166._60_4_ = (uint)(bVar35 >> 7) * piVar36[0xf];
                            auVar127 = vfmadd213ps_avx512f(auVar166,auVar165,auVar131);
                            uVar76 = uVar76 + 0x10;
                          } while (uVar65 != uVar76);
                          auVar167._0_4_ =
                               (uint)(bVar34 & 1) * auVar127._0_4_ |
                               (uint)!(bool)(bVar34 & 1) * auVar131._0_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 1) & 1);
                          auVar167._4_4_ =
                               (uint)bVar57 * auVar127._4_4_ | (uint)!bVar57 * auVar131._4_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 2) & 1);
                          auVar167._8_4_ =
                               (uint)bVar57 * auVar127._8_4_ | (uint)!bVar57 * auVar131._8_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 3) & 1);
                          auVar167._12_4_ =
                               (uint)bVar57 * auVar127._12_4_ | (uint)!bVar57 * auVar131._12_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 4) & 1);
                          auVar167._16_4_ =
                               (uint)bVar57 * auVar127._16_4_ | (uint)!bVar57 * auVar131._16_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 5) & 1);
                          auVar167._20_4_ =
                               (uint)bVar57 * auVar127._20_4_ | (uint)!bVar57 * auVar131._20_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 6) & 1);
                          auVar167._24_4_ =
                               (uint)bVar57 * auVar127._24_4_ | (uint)!bVar57 * auVar131._24_4_;
                          bVar57 = (bool)((byte)(uVar90 >> 7) & 1);
                          auVar167._28_4_ =
                               (uint)bVar57 * auVar127._28_4_ | (uint)!bVar57 * auVar131._28_4_;
                          auVar167._32_4_ =
                               (uint)(bVar35 & 1) * auVar127._32_4_ |
                               (uint)!(bool)(bVar35 & 1) * auVar131._32_4_;
                          bVar57 = (bool)(bVar35 >> 1 & 1);
                          auVar167._36_4_ =
                               (uint)bVar57 * auVar127._36_4_ | (uint)!bVar57 * auVar131._36_4_;
                          bVar57 = (bool)(bVar35 >> 2 & 1);
                          auVar167._40_4_ =
                               (uint)bVar57 * auVar127._40_4_ | (uint)!bVar57 * auVar131._40_4_;
                          bVar57 = (bool)(bVar35 >> 3 & 1);
                          auVar167._44_4_ =
                               (uint)bVar57 * auVar127._44_4_ | (uint)!bVar57 * auVar131._44_4_;
                          bVar57 = (bool)(bVar35 >> 4 & 1);
                          auVar167._48_4_ =
                               (uint)bVar57 * auVar127._48_4_ | (uint)!bVar57 * auVar131._48_4_;
                          bVar57 = (bool)(bVar35 >> 5 & 1);
                          auVar167._52_4_ =
                               (uint)bVar57 * auVar127._52_4_ | (uint)!bVar57 * auVar131._52_4_;
                          bVar57 = (bool)(bVar35 >> 6 & 1);
                          auVar167._56_4_ =
                               (uint)bVar57 * auVar127._56_4_ | (uint)!bVar57 * auVar131._56_4_;
                          auVar167._60_4_ =
                               (uint)(bVar35 >> 7) * auVar127._60_4_ |
                               (uint)!(bool)(bVar35 >> 7) * auVar131._60_4_;
                          auVar113 = vextractf64x4_avx512f(auVar167,1);
                          auVar127 = vaddps_avx512f(auVar167,ZEXT3264(auVar113));
                          auVar179._0_4_ = auVar127._0_4_ + auVar127._16_4_;
                          auVar179._4_4_ = auVar127._4_4_ + auVar127._20_4_;
                          auVar179._8_4_ = auVar127._8_4_ + auVar127._24_4_;
                          auVar179._12_4_ = auVar127._12_4_ + auVar127._28_4_;
                          auVar99 = vshufpd_avx(auVar179,auVar179,1);
                          auVar180._0_4_ = auVar179._0_4_ + auVar99._0_4_;
                          auVar180._4_4_ = auVar179._4_4_ + auVar99._4_4_;
                          auVar180._8_4_ = auVar179._8_4_ + auVar99._8_4_;
                          auVar180._12_4_ = auVar179._12_4_ + auVar99._12_4_;
                          auVar99 = vhaddps_avx(auVar180,auVar180);
                          uVar168 = auVar99._0_4_;
                          pauVar50 = (undefined1 (*) [16])(*pauVar50 + uVar45 * 4 + 4);
                        }
                        if (iVar38 < K) {
                          *(undefined4 *)*pauVar78 = uVar168;
                        }
                        else {
                          *(undefined4 *)*pauVar47 = uVar168;
                          pauVar47 = (undefined1 (*) [16])(*pauVar47 + 4);
                        }
                        pauVar78 = (undefined1 (*) [64])(*pauVar78 + 4);
                        uVar80 = uVar80 + 1;
                      } while (uVar80 != uVar79);
                    }
                    lVar85 = lVar85 + 1;
                    pauVar53 = (undefined1 (*) [64])(*pauVar53 + (long)iVar56 * 4);
                    pauVar40 = pauVar69;
                  } while (lVar85 != local_1f0);
                }
                uVar65 = (ulong)(uint)TILE_K;
                iVar59 = iVar59 + TILE_K;
                local_254 = iVar72;
              } while (iVar59 < K);
            }
            iVar72 = iVar72 + TILE_N;
            local_1a8 = iVar37;
            local_140 = (ulong)uVar48;
          } while (iVar72 < iVar44);
        }
        uVar48 = (int)local_1e8 + 1;
        local_1e8 = (ulong)uVar48;
      } while (uVar48 != local_1f4);
    }
    iVar59 = 0;
  }
  piVar36 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar36 != (int *)0x0) {
    LOCK();
    *piVar36 = *piVar36 + -1;
    UNLOCK();
    if (*piVar36 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00195f0e:
  piVar36 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar36 != (int *)0x0) {
    LOCK();
    *piVar36 = *piVar36 + -1;
    UNLOCK();
    if (*piVar36 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar59;
}

Assistant:

static int convolution_im2col_gemm(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int nT, const Option& opt)
{
    const int maxk = kernel_w * kernel_h;

    const int M = top_blob.c * top_blob.elempack;
    const int N = top_blob.w * top_blob.h;
    const int K = bottom_blob.c * bottom_blob.elempack * maxk;

    int TILE_M, TILE_N, TILE_K;
    convolution_im2col_gemm_get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        // im2col
        convolution_im2col_input_tile(bottom_blob, BT_tile, j, max_jj, k, max_kk, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h);
    }

    Mat topT_tileX;
    if (K > TILE_K)
    {
        topT_tileX.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
        if (topT_tileX.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat topT_tile;
        if (K > TILE_K)
            topT_tile = topT_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

                const Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                bool k_end = k + TILE_K >= K;

                convolution_gemm_transB_packed_tile(AT_tile, BT_tile, bias, topT_tile, top_blob, i, max_ii, j, max_jj, k, max_kk, k_end);
            }
        }
    }

    return 0;
}